

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O2

void __thiscall
Spaghetti<UFPC>::PerformLabelingMem
          (Spaghetti<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  undefined8 uVar4;
  char cVar5;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer piVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  uint uVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int c;
  int iVar19;
  void *__child_stack;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  char cVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  int r;
  long lVar32;
  void *__arg;
  long lVar33;
  long *plVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double dVar43;
  long *local_3c8;
  long local_3c0;
  long local_3b8;
  long *local_3b0;
  long local_3a0;
  long *local_398;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  ulong local_368;
  ulong local_360;
  long local_358;
  long *local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  ulong local_328;
  long *local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  int local_2d0;
  MemMat<int> img_labels;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  MemMat<unsigned_char> img;
  allocator_type local_10d;
  int local_10c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_108;
  value_type_conflict3 local_100;
  Size local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar20 = *(int *)&pMVar6->field_0x8;
  lVar17 = (long)iVar20;
  iVar36 = *(int *)&pMVar6->field_0xc;
  lVar26 = (long)iVar36;
  UFPC::MemAlloc(((iVar20 + 1) / 2) * ((iVar36 + 1) / 2) + 1);
  UFPC::MemSetup();
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar4 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_f8.height = (int)uVar4;
  local_f8.width = (int)((ulong)uVar4 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_f8,0);
  lVar15 = lVar26 + -2;
  local_2d0 = (int)lVar15;
  local_108 = accesses;
  if (iVar20 != 1) {
    local_350 = (long *)0x1;
    uVar22 = 0xfffffffffffffffe;
    while( true ) {
      lVar18 = (long)(int)uVar22;
      uVar10 = (int)uVar22 + 2;
      uVar22 = (ulong)uVar10;
      if (local_2d0 <= (int)uVar10) break;
      piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(img.img_._16_8_ + 2 + lVar18) != '\0') goto LAB_0013b919;
      lVar32 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 8 + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      lVar27 = *(long *)img.img_._72_8_;
      if (*(char *)(lVar18 + 2 + img.img_._16_8_ + lVar27) != '\0') goto LAB_0013b919;
LAB_0013b6e0:
      lVar18 = (long)(int)uVar22;
      piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      if ((*(char *)(img.img_._16_8_ + 1 + lVar18) != '\0') ||
         (piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 4 + lVar18 * 4), *piVar3 = *piVar3 + 1,
         *(char *)(lVar18 + 1 + img.img_._16_8_ + lVar27) != '\0')) {
        uVar10 = UFPC::MemNewLabel();
        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
        local_380 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
LAB_0013b740:
        do {
          lVar18 = (long)(int)uVar22;
          uVar10 = (int)uVar22 + 2;
          uVar22 = (ulong)uVar10;
          if (local_2d0 <= (int)uVar10) {
            piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            cVar28 = *(char *)(img.img_._16_8_ + 2 + lVar18);
            if (local_2d0 < (int)uVar10) {
              if (cVar28 == '\0') {
                piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + 8 +
                                lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar18 + 2 + img.img_._16_8_ + *(long *)img.img_._72_8_) == '\0') {
                  piVar3 = (int *)(local_380 + 8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_2d8 + 8 + lVar18 * 4) = 0;
                }
                else {
                  piVar3 = (int *)(local_380 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)(local_2d8 + lVar18 * 4);
                  piVar3 = (int *)(local_380 + 8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_2d8 + 8 + lVar18 * 4) = uVar12;
                }
              }
              else {
                piVar3 = (int *)(local_380 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                uVar12 = *(undefined4 *)(local_2d8 + lVar18 * 4);
                piVar3 = (int *)(local_380 + 8 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(local_2d8 + 8 + lVar18 * 4) = uVar12;
              }
            }
            else {
              if (cVar28 == '\0') {
                lVar32 = *(long *)img.accesses_._72_8_;
                piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 8 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                lVar27 = *(long *)img.img_._72_8_;
                if (*(char *)(lVar18 + 2 + img.img_._16_8_ + lVar27) == '\0') goto LAB_0013bdbf;
              }
LAB_0013bceb:
              lVar18 = (long)(int)uVar10;
              piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              piVar3 = (int *)(local_380 + -8 + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(local_2d8 + -8 + lVar18 * 4);
              piVar3 = (int *)(local_380 + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(local_2d8 + lVar18 * 4) = uVar12;
            }
            goto LAB_0013be08;
          }
          piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(img.img_._16_8_ + 2 + lVar18) == '\0') {
            lVar32 = *(long *)img.accesses_._72_8_;
            piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 8 + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar18 + 2 + img.img_._16_8_ + lVar27) == '\0') goto LAB_0013b6e0;
          }
          while( true ) {
            lVar32 = (long)(int)uVar22;
            piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = (long)((int)uVar22 + -2);
            if (*(char *)(img.img_._16_8_ + 1 + lVar32) != '\0') break;
            piVar3 = (int *)(local_380 + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            uVar12 = *(undefined4 *)(local_2d8 + lVar18 * 4);
            piVar3 = (int *)(local_380 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(local_2d8 + lVar32 * 4) = uVar12;
            while( true ) {
              iVar11 = (int)uVar22;
              lVar41 = (long)iVar11;
              lVar40 = lVar41 << 0x20;
              lVar18 = lVar41 * 4;
              lVar35 = 0;
              while( true ) {
                lVar25 = lVar40 >> 0x1e;
                if (lVar15 <= lVar35 + lVar41 + 2) {
                  lVar41 = lVar40 + 0x200000000 >> 0x1e;
                  *(int *)(img.accesses_._16_8_ + lVar41) =
                       *(int *)(img.accesses_._16_8_ + lVar41) + 1;
                  uVar10 = iVar11 + 2 + (int)lVar35;
                  lVar18 = lVar40 + 0x200000000 >> 0x20;
                  if (local_2d0 < (int)uVar10) {
                    if (*(char *)(img.img_._16_8_ + lVar18) == '\0') {
                      lVar32 = *(long *)img.accesses_._72_8_;
                      piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + lVar18 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar27 = *(long *)img.img_._72_8_;
                      if (*(char *)(lVar18 + img.img_._16_8_ + lVar27) == '\0') {
                        piVar3 = (int *)(local_380 + lVar18 * 4);
                        *piVar3 = *piVar3 + 1;
                        *(undefined4 *)(local_2d8 + lVar18 * 4) = 0;
                        goto LAB_0013be08;
                      }
                    }
                    else {
                      lVar32 = *(long *)img.accesses_._72_8_;
                      lVar27 = *(long *)img.img_._72_8_;
                    }
                  }
                  else {
                    lVar32 = *(long *)img.accesses_._72_8_;
                    if (*(char *)(img.img_._16_8_ + lVar18) != '\0') {
                      piVar3 = (int *)(img.accesses_._16_8_ + lVar32 +
                                      (lVar40 + 0x100000000 >> 0x1e));
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)((lVar40 + 0x100000000 >> 0x20) +
                                   img.img_._16_8_ + *(long *)img.img_._72_8_) != '\0')
                      goto LAB_0013bceb;
                      goto LAB_0013bb49;
                    }
                    piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + lVar18 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar27 = *(long *)img.img_._72_8_;
                    if (*(char *)(lVar18 + img.img_._16_8_ + lVar27) == '\0') goto LAB_0013bdbf;
                    piVar3 = (int *)(img.accesses_._16_8_ + 0xc + lVar25);
                    *piVar3 = *piVar3 + 1;
                  }
                  piVar3 = (int *)((lVar40 + 0x100000000 >> 0x1e) + img.accesses_._16_8_ + lVar32);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)((lVar40 + 0x100000000 >> 0x20) + img.img_._16_8_ + lVar27) == '\0')
                  {
                    uVar10 = UFPC::MemNewLabel();
                    *(int *)(img_labels.accesses_._16_8_ + lVar41) =
                         *(int *)(img_labels.accesses_._16_8_ + lVar41) + 1;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                  }
                  else {
                    *(int *)(local_380 + lVar25) = *(int *)(local_380 + lVar25) + 1;
                    uVar10 = *(uint *)(local_2d8 + lVar25);
                    *(int *)(local_380 + lVar41) = *(int *)(local_380 + lVar41) + 1;
                  }
                  *(uint *)(local_2d8 + lVar41) = uVar10;
                  goto LAB_0013be08;
                }
                piVar3 = (int *)(img.accesses_._16_8_ + lVar18 + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + 2 + img.img_._16_8_ + lVar41) != '\0') break;
                lVar32 = *(long *)img.accesses_._72_8_;
                lVar42 = img.accesses_._16_8_ + lVar32 + lVar18;
                piVar3 = (int *)(lVar42 + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                lVar27 = *(long *)img.img_._72_8_;
                lVar39 = img.img_._16_8_ + lVar27 + lVar41;
                if (*(char *)(lVar35 + 2 + lVar39) == '\0') {
                  uVar22 = (ulong)(iVar11 + (int)lVar35 + 2);
                  goto LAB_0013b6e0;
                }
                piVar3 = (int *)(img.accesses_._16_8_ + lVar18 + 0xc + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + 3 + img.img_._16_8_ + lVar41) != '\0') {
                  piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + (lVar40 + 0x100000000 >> 0x1e));
                  *piVar3 = *piVar3 + 1;
                  uVar22 = (ulong)(iVar11 + 2) + lVar35;
                  if (*(char *)(img.img_._16_8_ + lVar27 + (lVar40 + 0x100000000 >> 0x20)) == '\0')
                  {
                    uVar10 = UFPC::MemNewLabel();
                    piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 + 8 + lVar35 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(uint *)(img_labels.img_._16_8_ + lVar41 * 4 + 8 + lVar35 * 4) = uVar10;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                  }
                  else {
                    *(int *)(img_labels.accesses_._16_8_ + lVar25) =
                         *(int *)(img_labels.accesses_._16_8_ + lVar25) + 1;
                    uVar12 = *(undefined4 *)(img_labels.img_._16_8_ + lVar25);
                    piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 + 8 + lVar35 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(img_labels.img_._16_8_ + lVar41 * 4 + 8 + lVar35 * 4) = uVar12;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                  }
                  goto LAB_0013b740;
                }
                piVar3 = (int *)(lVar42 + 4 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + 1 + lVar39) == '\0') {
                  uVar10 = UFPC::MemNewLabel();
                  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + 8 + lVar35 * 4);
                  *piVar3 = *piVar3 + 1;
                }
                else {
                  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + lVar35 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)(img_labels.img_._16_8_ + lVar18 + lVar35 * 4);
                  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + 8 + lVar35 * 4);
                  *piVar3 = *piVar3 + 1;
                }
                *(uint *)(img_labels.img_._16_8_ + lVar18 + 8 + lVar35 * 4) = uVar10;
                lVar40 = lVar40 + 0x200000000;
                lVar35 = lVar35 + 2;
                local_380 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
              }
              uVar22 = (ulong)(iVar11 + 2) + lVar35;
              piVar3 = (int *)((lVar40 + 0x100000000 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
              *piVar3 = *piVar3 + 1;
              if (*(char *)((lVar40 + 0x100000000 >> 0x20) +
                           *(long *)img.img_._72_8_ + img.img_._16_8_) != '\0') break;
LAB_0013b919:
              lVar18 = (long)(int)uVar22;
              piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              cVar28 = *(char *)(img.img_._16_8_ + 1 + lVar18);
              uVar10 = UFPC::MemNewLabel();
              piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
              local_380 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              if (cVar28 != '\0') goto LAB_0013b740;
            }
          }
          piVar3 = (int *)(local_380 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          uVar12 = *(undefined4 *)(local_2d8 + lVar18 * 4);
          piVar3 = (int *)(local_380 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(local_2d8 + lVar32 * 4) = uVar12;
        } while( true );
      }
      piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + lVar18 * 4) = 0;
    }
    piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar18 * 4);
    *piVar3 = *piVar3 + 1;
    cVar28 = *(char *)(img.img_._16_8_ + 2 + lVar18);
    if (local_2d0 < (int)uVar10) {
      if (cVar28 == '\0') {
        piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + 8 + lVar18 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar18 + 2 + img.img_._16_8_ + *(long *)img.img_._72_8_) == '\0') {
          piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(img_labels.img_._16_8_ + 8 + lVar18 * 4) = 0;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
        else {
          uVar10 = UFPC::MemNewLabel();
          piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(img_labels.img_._16_8_ + 8 + lVar18 * 4) = uVar10;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
      }
      else {
        uVar10 = UFPC::MemNewLabel();
        piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar18 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(img_labels.img_._16_8_ + 8 + lVar18 * 4) = uVar10;
        local_380 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
      }
    }
    else {
      if (cVar28 == '\0') {
        lVar32 = *(long *)img.accesses_._72_8_;
        piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 8 + lVar18 * 4);
        *piVar3 = *piVar3 + 1;
        lVar27 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar18 + 2 + img.img_._16_8_ + lVar27) == '\0') {
LAB_0013bdbf:
          lVar18 = (long)(int)uVar10;
          piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          if ((*(char *)(img.img_._16_8_ + 1 + lVar18) == '\0') &&
             (piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 4 + lVar18 * 4),
             *piVar3 = *piVar3 + 1, *(char *)(lVar18 + 1 + img.img_._16_8_ + lVar27) == '\0')) {
            piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + lVar18 * 4) = 0;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
          }
          else {
            uVar10 = UFPC::MemNewLabel();
            piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            *(uint *)(img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
          }
          goto LAB_0013be08;
        }
      }
LAB_0013bb49:
      lVar18 = (long)(int)uVar10;
      piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      uVar10 = UFPC::MemNewLabel();
      piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      *(uint *)(img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
      local_380 = img_labels.accesses_._16_8_;
      local_2d8 = img_labels.img_._16_8_;
    }
LAB_0013be08:
    local_10c = iVar20 % 2;
    iVar11 = iVar20 - local_10c;
    local_318 = 3;
    local_308 = 0;
    for (uVar22 = 2; (long)uVar22 < (long)iVar11; uVar22 = uVar22 + 2) {
      local_338 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(img.accesses_._16_8_ + local_338 * uVar22);
      *piVar3 = *piVar3 + 1;
      lVar18 = *(long *)img.img_._72_8_;
      cVar28 = *(char *)(img.img_._16_8_ + lVar18 * uVar22);
      if (2 < iVar36) {
        local_3c8 = (long *)img.img_._16_8_;
        uVar21 = 0;
        uVar23 = uVar21;
        lVar32 = img.accesses_._16_8_;
        if (cVar28 == '\0') goto LAB_0013c2fe;
LAB_0013bf40:
        lVar27 = uVar22 - 1;
        iVar19 = (int)uVar23;
        uVar29 = (ulong)iVar19;
        piVar3 = (int *)(local_338 * lVar27 + img.accesses_._16_8_ + 4 + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        lVar35 = lVar18 * lVar27 + img.img_._16_8_;
        uVar21 = uVar23;
        if (*(char *)(uVar29 + 1 + lVar35) == '\0') {
          local_338 = *(long *)img.accesses_._72_8_;
          piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          local_3c8 = (long *)img.img_._16_8_;
          lVar32 = img.accesses_._16_8_;
          if (*(char *)(uVar29 + 1 + lVar18 * uVar22 + img.img_._16_8_) != '\0') goto LAB_0013c4de;
          uVar16 = (ulong)iVar19;
          piVar3 = (int *)(lVar27 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                          uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar35 + uVar16) == '\0') {
            uVar10 = UFPC::MemNewLabel();
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_328 = *(ulong *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
            *piVar3 = *piVar3 + 1;
            local_320 = (long *)img_labels.img_._72_8_;
            local_2e0 = *(long *)img_labels.img_._72_8_;
            *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + uVar16 * 4) = uVar10;
            local_388 = img_labels.img_._16_8_;
            local_380 = img_labels.accesses_._16_8_;
            local_370 = img_labels.img_._16_8_;
            local_378 = img_labels.accesses_._16_8_;
            local_398 = (long *)img_labels.img_._16_8_;
            local_3c0 = img_labels.accesses_._16_8_;
            local_358 = img_labels.img_._16_8_;
            local_3b8 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
            local_348 = img_labels.accesses_._16_8_;
            local_2e8 = img_labels.img_._16_8_;
            local_2f8 = img_labels.accesses_._16_8_;
            local_390 = img_labels.img_._16_8_;
            local_1e8 = img_labels.img_._16_8_;
            local_3a0 = img_labels.accesses_._16_8_;
            local_300 = img_labels.accesses_._16_8_;
            local_340 = local_328;
            local_2f0 = local_328;
            local_1f8 = local_2e0;
            local_1f0 = local_2e0;
            goto LAB_0013e51e;
          }
          local_328 = *(ulong *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_328 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + img_labels.img_._16_8_ + uVar16 * 4);
          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          goto LAB_0013fb30;
        }
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f0 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + img_labels.img_._16_8_ + uVar29 * 4);
        do {
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          local_2d8 = img_labels.img_._16_8_;
LAB_00144027:
          *(uint *)(local_1f0 * uVar22 + local_2d8 + uVar29 * 4) = uVar10;
          uVar29 = uVar22 | 1;
          lVar35 = uVar22 - 1;
          lVar41 = uVar22 - 2;
          iVar19 = (int)uVar21;
          lVar39 = (long)iVar19;
          local_360 = lVar39 << 0x20;
          local_3c8 = (long *)img.img_._16_8_;
          lVar27 = img.img_._16_8_ + lVar39;
          lVar32 = img.accesses_._16_8_ + lVar39 * 4;
          lVar42 = img_labels.img_._16_8_ + lVar39 * 4 + 8;
          lVar40 = img_labels.accesses_._16_8_ + lVar39 * 4 + 8;
          lVar25 = 0;
LAB_001440cd:
          uVar16 = lVar39 + lVar25 + 2;
          lVar37 = (long)local_360 >> 0x1e;
          if (lVar15 <= (long)uVar16) {
            uVar21 = (ulong)(iVar19 + 2) + lVar25;
            uVar23 = (long)(local_360 + 0x200000000) >> 0x20;
            lVar32 = (long)(local_360 + 0x200000000) >> 0x1e;
            piVar3 = (int *)(lVar32 + *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_)
            ;
            *piVar3 = *piVar3 + 1;
            uVar10 = (uint)uVar21;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
            if (local_2d0 < (int)uVar10) {
              lVar18 = *(long *)img.img_._72_8_;
              lVar27 = lVar18 * uVar22 + img.img_._16_8_;
              if (*(char *)(uVar23 + lVar27) != '\0') {
                piVar3 = (int *)(((long)(local_360 + 0x100000000) >> 0x1e) +
                                img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22);
                *piVar3 = *piVar3 + 1;
                lVar32 = (long)(local_360 + 0x100000000) >> 0x20;
                if ((*(char *)(lVar27 + lVar32) == '\0') &&
                   (piVar3 = (int *)(uVar29 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                    lVar32 * 4), *piVar3 = *piVar3 + 1,
                   *(char *)(lVar32 + lVar18 * uVar29 + img.img_._16_8_) == '\0')) {
                  lVar18 = lVar18 * lVar35;
                  goto LAB_00145225;
                }
                lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                ;
                *(int *)(lVar37 + lVar18) = *(int *)(lVar37 + lVar18) + 1;
                lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                uVar12 = *(undefined4 *)(lVar37 + lVar32);
LAB_0014433e:
                piVar3 = (int *)(lVar18 + uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                goto LAB_00144341;
              }
              piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar29 +
                              uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = lVar18 * uVar29;
              if (*(char *)(uVar23 + img.img_._16_8_ + lVar27) != '\0') goto LAB_00144cd4;
LAB_00144b8c:
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                               img_labels.accesses_._16_8_ + uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)
               (*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = 0;
              local_380 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
            }
            else {
              lVar18 = *(long *)img.img_._72_8_;
              lVar40 = lVar18 * uVar22 + img.img_._16_8_;
              if (*(char *)(uVar23 + lVar40) == '\0') {
                piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar29 +
                                uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                lVar27 = lVar18 * uVar29;
                if (*(char *)(uVar23 + img.img_._16_8_ + lVar27) == '\0') {
                  uVar23 = uVar21 & 0xffffffff;
                  goto LAB_0013c08b;
                }
                piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                                *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_);
                *piVar3 = *piVar3 + 1;
                lVar25 = (long)(local_360 + 0x300000000) >> 0x20;
                if (*(char *)(lVar40 + lVar25) == '\0') {
LAB_00144cd4:
                  piVar3 = (int *)(((long)(local_360 + 0x100000000) >> 0x1e) +
                                  uVar29 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
                  *piVar3 = *piVar3 + 1;
                  lVar35 = (long)(local_360 + 0x100000000) >> 0x20;
                  if ((*(char *)(lVar35 + lVar27 + img.img_._16_8_) == '\0') &&
                     (piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_
                                      + lVar35 * 4), *piVar3 = *piVar3 + 1,
                     *(char *)(lVar35 + img.img_._16_8_ + lVar18 * uVar22) == '\0')) {
                    uVar10 = UFPC::MemNewLabel();
                    piVar3 = (int *)(lVar32 + *(long *)img_labels.accesses_._72_8_ * uVar22 +
                                              img_labels.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    *(uint *)(lVar32 + *(long *)img_labels.img_._72_8_ * uVar22 +
                                       img_labels.img_._16_8_) = uVar10;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                  }
                  else {
                    lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar37 + lVar18);
                    *piVar3 = *piVar3 + 1;
                    lVar27 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar37 + lVar27);
                    piVar3 = (int *)(lVar32 + lVar18);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar32 + lVar27) = uVar12;
                  }
                }
                else {
                  piVar3 = (int *)(((long)(local_360 + 0x100000000) >> 0x1e) +
                                  *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = (long)(local_360 + 0x100000000) >> 0x20;
                  if (*(char *)(lVar40 + lVar32) != '\0') goto LAB_0014212a;
                  piVar3 = (int *)(uVar29 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                  lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(img.img_._16_8_ + lVar27 + lVar32) == '\0') {
                    uVar21 = uVar21 & 0xffffffff;
                    goto LAB_0013c0c0;
                  }
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_ +
                                  lVar25 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = lVar18 * lVar35;
                  if (*(char *)(lVar25 + img.img_._16_8_ + lVar32) != '\0') goto LAB_00142931;
                  piVar3 = (int *)(lVar35 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                  uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.accesses_._72_8_;
                  if (*(char *)(img.img_._16_8_ + lVar32 + uVar23) == '\0') {
                    lVar18 = lVar18 * uVar22 + img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar37 + lVar18);
                    *piVar3 = *piVar3 + 1;
                    lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar37 + lVar32);
                    piVar3 = (int *)(lVar18 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                  }
                  else {
                    piVar3 = (int *)(lVar18 * lVar41 + img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar32 = *(long *)img_labels.img_._72_8_;
                    uVar12 = *(undefined4 *)(lVar41 * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
                    piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar32 = lVar32 * uVar22 + img_labels.img_._16_8_;
                  }
                  *(undefined4 *)(lVar32 + uVar23 * 4) = uVar12;
                }
              }
              else {
                piVar3 = (int *)(((long)(local_360 + 0x100000000) >> 0x1e) +
                                img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22);
                *piVar3 = *piVar3 + 1;
                lVar32 = (long)(local_360 + 0x100000000) >> 0x20;
                if (*(char *)(lVar40 + lVar32) != '\0') goto LAB_0014212a;
                piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar29 + img.accesses_._16_8_ +
                                lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                if (*(char *)(lVar32 + uVar29 * lVar18 + img.img_._16_8_) != '\0')
                goto LAB_0014212a;
                piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                                *(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_);
                *piVar3 = *piVar3 + 1;
                lVar18 = lVar18 * lVar35;
                if (*(char *)(((long)(local_360 + 0x300000000) >> 0x20) + img.img_._16_8_ + lVar18)
                    != '\0') {
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_ +
                                  uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img.img_._72_8_;
                  if (*(char *)(uVar23 + lVar35 * lVar18 + img.img_._16_8_) == '\0')
                  goto LAB_0013efd3;
                  goto LAB_001451cf;
                }
LAB_00145225:
                piVar3 = (int *)(lVar35 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                lVar32 = *(long *)img_labels.accesses_._72_8_;
                lVar27 = lVar32 * lVar41 + img_labels.accesses_._16_8_;
                if (*(char *)(uVar23 + lVar18 + img.img_._16_8_) == '\0') {
                  piVar3 = (int *)(lVar27 + lVar37);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  uVar12 = *(undefined4 *)(lVar37 + lVar41 * lVar18 + img_labels.img_._16_8_);
                }
                else {
                  piVar3 = (int *)(lVar27 + uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  uVar12 = *(undefined4 *)(lVar41 * lVar18 + img_labels.img_._16_8_ + uVar23 * 4);
                }
                piVar3 = (int *)(lVar32 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar18 * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = uVar12;
              }
            }
            goto LAB_0014434a;
          }
          local_338 = *(long *)img.accesses_._72_8_;
          lVar30 = uVar22 * local_338 + lVar32;
          piVar3 = (int *)(lVar30 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          lVar38 = lVar27 + lVar18 * uVar22;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1e8 = img_labels.img_._16_8_;
          local_300 = img_labels.accesses_._16_8_;
          local_390 = img_labels.img_._16_8_;
          if (*(char *)(lVar25 + 2 + lVar38) == '\0') {
            uVar21 = (ulong)(iVar19 + 2) + lVar25;
            local_338 = *(long *)img.accesses_._72_8_;
            piVar3 = (int *)(local_338 * local_318 + img.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = img.accesses_._16_8_;
            if (*(char *)(lVar25 + 2 + local_318 * lVar18 + lVar27) == '\0') goto LAB_0013c441;
            lVar42 = lVar18 * uVar22 + img.img_._16_8_;
            lVar41 = lVar18 * uVar29 + img.img_._16_8_;
            lVar38 = (long)(local_360 + 0x300000000) >> 0x20;
            piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_);
            *piVar3 = *piVar3 + 1;
            lVar40 = (long)(local_360 + 0x100000000) >> 0x20;
            if (*(char *)(lVar42 + lVar38) == '\0') {
              piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar29 +
                              lVar40 * 4);
              *piVar3 = *piVar3 + 1;
              if ((*(char *)(lVar41 + lVar40) == '\0') &&
                 (piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ +
                                  lVar40 * 4), *piVar3 = *piVar3 + 1,
                 *(char *)(lVar42 + lVar40) == '\0')) {
                uVar10 = UFPC::MemNewLabel();
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                                lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *(long *)img_labels.img_._72_8_;
                *(uint *)(local_1f8 * uVar22 + img_labels.img_._16_8_ + lVar39 * 4 + 8 + lVar25 * 4)
                     = uVar10;
                local_300 = img_labels.accesses_._16_8_;
                local_1f0 = local_1f8;
                local_320 = (long *)img_labels.img_._72_8_;
                local_1e8 = img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_340 = local_328;
                local_2f8 = img_labels.accesses_._16_8_;
                local_2f0 = local_328;
                local_2e8 = img_labels.img_._16_8_;
                local_2e0 = local_1f8;
                local_2d8 = img_labels.img_._16_8_;
                goto LAB_0013eb15;
              }
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
              piVar3 = (int *)(lVar37 + lVar18);
              *piVar3 = *piVar3 + 1;
              local_1f8 = *(long *)img_labels.img_._72_8_;
              lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
              uVar12 = *(undefined4 *)(lVar37 + lVar32);
              piVar3 = (int *)(lVar18 + lVar39 * 4 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar32 + lVar39 * 4 + 8 + lVar25 * 4) = uVar12;
              local_3a0 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_2e8 = img_labels.img_._16_8_;
              local_2f8 = img_labels.accesses_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_1f0 = local_1f8;
              local_340 = local_328;
              local_2f0 = local_328;
              local_2e0 = local_1f8;
              goto LAB_0013eb15;
            }
            piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22 +
                            lVar40 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar42 + lVar40) != '\0') goto LAB_0014446b;
            local_338 = *(long *)img.accesses_._72_8_;
            piVar3 = (int *)(uVar29 * local_338 + img.accesses_._16_8_ + lVar40 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar41 + lVar40) == '\0') goto LAB_0013c469;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_ +
                            lVar38 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = lVar18 * lVar35;
            if (*(char *)(lVar38 + img.img_._16_8_ + lVar32) != '\0') goto LAB_0014449f;
            piVar3 = (int *)(((long)(local_360 + 0x400000000) >> 0x1e) +
                            lVar35 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(img.img_._16_8_ + lVar32 + ((long)(local_360 + 0x400000000) >> 0x20)) !=
                '\0') goto LAB_0014244d;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (long)local_350 + img.accesses_._16_8_
                             + lVar39 * 4 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_328 = *(ulong *)img_labels.accesses_._72_8_;
            local_3a0 = img_labels.accesses_._16_8_;
            if (*(char *)(lVar25 + 2 + lVar27 + lVar18 * (long)local_350) == '\0') {
              lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
              piVar3 = (int *)(lVar37 + lVar18);
              *piVar3 = *piVar3 + 1;
              local_2e0 = *(long *)img_labels.img_._72_8_;
              lVar32 = local_2e0 * uVar22 + img_labels.img_._16_8_;
              uVar12 = *(undefined4 *)(lVar37 + lVar32);
              piVar3 = (int *)(lVar18 + lVar39 * 4 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar32 + lVar39 * 4 + 8 + lVar25 * 4) = uVar12;
              local_380 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_2e8 = img_labels.img_._16_8_;
              local_2f8 = img_labels.accesses_._16_8_;
              local_2f0 = local_328;
              local_1f8 = local_2e0;
              goto LAB_00140595;
            }
            piVar3 = (int *)(local_328 * local_308 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_1f0 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(local_1f0 * local_308 + img_labels.img_._16_8_ + lVar39 * 4 + 8 +
                              lVar25 * 4);
            piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
LAB_00144b60:
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_3c0 = img_labels.accesses_._16_8_;
            local_398 = (long *)img_labels.img_._16_8_;
            local_3b8 = local_3c0;
            local_3a0 = local_3c0;
            local_390 = (long)local_398;
            local_388 = (long)local_398;
            local_380 = local_3c0;
            local_378 = local_3c0;
            local_370 = (long)local_398;
            local_358 = (long)local_398;
            local_348 = local_3c0;
            local_2d8 = (long)local_398;
LAB_0013c62f:
            *(uint *)(local_1f0 * uVar22 + local_1e8 + uVar16 * 4) = uVar10;
            lVar32 = (long)(int)uVar21;
            local_360 = lVar32 + 2;
            uVar10 = (uint)local_360;
            if (local_2d0 <= (int)uVar10) {
              if (local_2d0 < (int)uVar10) {
LAB_001406d2:
                uVar10 = (uint)local_360;
LAB_00142001:
                local_338 = *(long *)img.accesses_._72_8_;
                uVar21 = (ulong)(int)uVar10;
                piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + uVar21 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                if (*(char *)(uVar21 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
                  iVar19 = uVar10 - 2;
LAB_00142094:
                  piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  if (*(char *)(uVar21 + lVar18 * (uVar22 | 1) + img.img_._16_8_) == '\0') {
                    piVar3 = (int *)(lVar32 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)
                     (*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + uVar21 * 4
                     ) = 0;
                  }
                  else {
                    piVar3 = (int *)(lVar32 + (long)iVar19 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar18 + (long)iVar19 * 4);
                    piVar3 = (int *)(lVar32 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar18 + uVar21 * 4) = uVar12;
                  }
                }
                else {
                  lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_;
                  piVar3 = (int *)(lVar18 + -8 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                  uVar12 = *(undefined4 *)(lVar32 + -8 + uVar21 * 4);
                  piVar3 = (int *)(lVar18 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar32 + uVar21 * 4) = uVar12;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                }
                goto LAB_0014434a;
              }
              local_338 = *(long *)img.accesses_._72_8_;
              lVar27 = local_338 * uVar22 + img.accesses_._16_8_;
              piVar3 = (int *)(lVar27 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar18 = *(long *)img.img_._72_8_;
              lVar35 = lVar18 * uVar22 + img.img_._16_8_;
              if (*(char *)(lVar32 + 2 + lVar35) == '\0') {
                piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar32 + 2 + (uVar22 | 1) * lVar18 + img.img_._16_8_) != '\0') {
                  piVar3 = (int *)(lVar27 + 0xc + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar35 + 3 + lVar32) != '\0') {
                    lVar27 = lVar32 + 3;
                    goto LAB_0013c751;
                  }
                  goto LAB_0013d1ed;
                }
LAB_00141da9:
                lVar25 = (long)(int)uVar10;
                piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ + 4 +
                                lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                local_3c8 = (long *)img.img_._16_8_;
                if (*(char *)(lVar25 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0')
                goto LAB_00141e84;
                piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_
                                 + 4 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar25 + 1 + img.img_._16_8_ + lVar18 * (uVar22 - 1)) != '\0') {
                  lVar18 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + lVar25 * 4)
                  ;
                  *piVar3 = *piVar3 + 1;
                  lVar32 = *(long *)img_labels.img_._72_8_;
                  uVar12 = *(undefined4 *)
                            ((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + lVar25 * 4);
                  piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar25 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar32 * uVar22 + img_labels.img_._16_8_ + lVar25 * 4) = uVar12;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  goto LAB_0014434a;
                }
                goto LAB_0013c004;
              }
              lVar27 = (long)((int)uVar21 + 3);
LAB_0013c751:
              piVar3 = (int *)(local_338 * (uVar22 - 1) + img.accesses_._16_8_ + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + (uVar22 - 1) * lVar18 + img.img_._16_8_) != '\0') {
                lVar27 = uVar22 - 2;
                piVar3 = (int *)(local_338 * lVar27 + img.accesses_._16_8_ + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar32 + 2 + lVar18 * lVar27 + img.img_._16_8_) == '\0') {
                  lVar18 = *local_3b0;
                  piVar3 = (int *)(lVar18 * lVar27 + local_380 + 8 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar35 = *local_320;
                  uVar10 = *(uint *)(lVar27 * lVar35 + local_388 + 8 + lVar32 * 4);
                  piVar3 = (int *)(lVar18 * uVar22 + local_380 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar35 * uVar22 + local_388 + lVar32 * 4)
                                         );
                  piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                   img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + 8 +
                           lVar32 * 4) = uVar10;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  goto LAB_0014434a;
                }
LAB_00142bf7:
                lVar32 = uVar22 - 2;
                lVar27 = (long)(int)uVar10;
                piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + -4 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                cVar28 = *(char *)(lVar27 + -1 + lVar18 * lVar32 + img.img_._16_8_);
                lVar18 = *(long *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar35 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(uint *)(lVar32 * lVar35 + img_labels.img_._16_8_ + lVar27 * 4);
                lVar18 = lVar18 * uVar22;
                if (cVar28 != '\0') {
                  piVar3 = (int *)(lVar18 + img_labels.accesses_._16_8_ + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(uint *)(lVar35 * uVar22 + img_labels.img_._16_8_ + lVar27 * 4) = uVar10;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  goto LAB_0014434a;
                }
                piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + -8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                local_1e8 = img_labels.img_._16_8_ + lVar35 * uVar22;
LAB_00142c85:
                uVar14 = *(uint *)(local_1e8 + -8 + lVar27 * 4);
LAB_00143146:
                uVar10 = UFPC::MemMerge(uVar10,uVar14);
                goto LAB_0014314b;
              }
LAB_0013d1ed:
              lVar18 = *local_3b0 * uVar22 + local_380;
              piVar3 = (int *)(lVar18 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = *local_320 * uVar22 + local_388;
              uVar12 = *(undefined4 *)(lVar27 + lVar32 * 4);
              piVar3 = (int *)(lVar18 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar27 + 8 + lVar32 * 4) = uVar12;
              local_380 = local_380;
              local_2d8 = local_388;
              goto LAB_0014434a;
            }
            local_338 = *(long *)img.accesses_._72_8_;
            lVar35 = local_338 * uVar22 + img.accesses_._16_8_;
            piVar3 = (int *)(lVar35 + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = *(long *)img.img_._72_8_;
            lVar27 = lVar18 * uVar22 + img.img_._16_8_;
            if (*(char *)(lVar32 + 2 + lVar27) == '\0') {
              piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar21 = local_360;
              if (*(char *)(lVar32 + 2 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
              goto LAB_00140c32;
              piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + 3 + lVar32) == '\0') {
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
                piVar3 = (int *)(lVar18 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *(long *)img_labels.img_._72_8_;
                lVar27 = local_1f8 * uVar22 + img_labels.img_._16_8_;
                uVar12 = *(undefined4 *)(lVar27 + lVar32 * 4);
                piVar3 = (int *)(lVar18 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar27 + 8 + lVar32 * 4) = uVar12;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                uVar21 = local_360 & 0xffffffff;
                local_2d8 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_300 = img_labels.accesses_._16_8_;
                local_1f0 = local_1f8;
                local_320 = (long *)img_labels.img_._72_8_;
                local_1e8 = img_labels.img_._16_8_;
                local_340 = local_328;
                local_2f0 = local_328;
                local_2e0 = local_1f8;
                goto LAB_0013eb15;
              }
              lVar40 = local_338 * (uVar22 - 1);
              piVar3 = (int *)(lVar40 + img.accesses_._16_8_ + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar41 = (uVar22 - 1) * lVar18;
              if (*(char *)(lVar32 + 3 + img.img_._16_8_ + lVar41) != '\0') {
                lVar27 = uVar22 - 2;
                piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar27 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar32 + 2 + img.img_._16_8_ + lVar18 * lVar27) == '\0') {
                  lVar18 = *local_3b0;
                  piVar3 = (int *)(lVar18 * lVar27 + local_3a0 + 8 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar35 = *local_320;
                  uVar10 = *(uint *)(lVar27 * lVar35 + local_390 + 8 + lVar32 * 4);
                  piVar3 = (int *)(lVar18 * uVar22 + local_3a0 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar35 * uVar22 + local_390 + lVar32 * 4)
                                         );
                  piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                   img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  local_368 = local_360 & 0xffffffff;
                  local_358 = img_labels.img_._16_8_;
                  goto LAB_00141f07;
                }
                uVar21 = local_360 & 0xffffffff;
LAB_001416de:
                uVar23 = (ulong)(int)uVar21;
                piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 2) + img.accesses_._16_8_
                                 + -4 + uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                cVar28 = *(char *)((uVar23 - 1) +
                                  *(long *)img.img_._72_8_ * (uVar22 - 2) + img.img_._16_8_);
                do {
                  lVar32 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(lVar32 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4)
                  ;
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(uint *)((uVar22 - 2) * lVar18 + img_labels.img_._16_8_ + uVar23 * 4);
                  lVar32 = img_labels.accesses_._16_8_ + lVar32 * uVar22;
                  local_368 = uVar21;
                  if (cVar28 == '\0') {
                    piVar3 = (int *)(lVar32 + -8 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = UFPC::MemMerge(uVar10,*(uint *)(img_labels.img_._16_8_ +
                                                             lVar18 * uVar22 + -8 + uVar23 * 4));
                    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                     img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img_labels.img_._72_8_;
                    uVar21 = uVar23;
                    local_358 = img_labels.img_._16_8_;
                  }
                  else {
                    piVar3 = (int *)(lVar32 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar21 = uVar23;
                    local_358 = img_labels.img_._16_8_;
                  }
LAB_00141f07:
                  *(uint *)(lVar18 * uVar22 + local_358 + uVar21 * 4) = uVar10;
                  lVar27 = (long)(int)local_368;
                  uVar10 = (int)local_368 + 2;
                  uVar21 = (ulong)uVar10;
                  local_3c8 = (long *)img.img_._16_8_;
                  if (local_2d0 <= (int)uVar10) {
                    if (local_2d0 < (int)uVar10) goto LAB_00142001;
                    piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22 +
                                     8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img.img_._72_8_;
                    if (*(char *)(lVar27 + 2 + lVar18 * uVar22 + img.img_._16_8_) != '\0')
                    goto LAB_0014212a;
                    piVar3 = (int *)((uVar22 | 1) * *(long *)img.accesses_._72_8_ +
                                     img.accesses_._16_8_ + 8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar27 + 2 + lVar18 * (uVar22 | 1) + img.img_._16_8_) == '\0') {
                      uVar23 = (ulong)uVar10;
                      goto LAB_0013c08b;
                    }
                    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ +
                                     0xc + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img.img_._72_8_;
                    if (*(char *)(lVar27 + 3 + lVar18 * uVar22 + img.img_._16_8_) != '\0')
                    goto LAB_0014212a;
                    lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar18 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                    piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                    goto LAB_0014434a;
                  }
                  local_338 = *(long *)img.accesses_._72_8_;
                  piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img.img_._72_8_;
                  lVar35 = lVar18 * uVar22 + img.img_._16_8_;
                  if (*(char *)(lVar27 + 2 + lVar35) != '\0') goto LAB_00142363;
                  local_338 = *(long *)img.accesses_._72_8_;
                  piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar27 * 4)
                  ;
                  *piVar3 = *piVar3 + 1;
                  lVar32 = img.accesses_._16_8_;
                  if (*(char *)(lVar27 + 2 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                  goto LAB_0013c441;
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ +
                                   0xc + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar35 + 3 + lVar27) == '\0') {
                    local_3c0 = img_labels.accesses_._16_8_;
                    local_3b0 = (long *)img_labels.accesses_._72_8_;
                    local_328 = *(ulong *)img_labels.accesses_._72_8_;
                    lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar18 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_398 = (long *)img_labels.img_._16_8_;
                    local_1f8 = *(long *)img_labels.img_._72_8_;
                    lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                    piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
                    local_300 = img_labels.accesses_._16_8_;
                    local_1f0 = local_1f8;
                    local_320 = (long *)img_labels.img_._72_8_;
                    local_1e8 = img_labels.img_._16_8_;
                    local_3b8 = local_3c0;
                    local_3a0 = local_3c0;
                    local_390 = (long)local_398;
                    local_388 = (long)local_398;
                    local_380 = local_3c0;
                    local_378 = local_3c0;
                    local_370 = (long)local_398;
                    local_358 = (long)local_398;
                    local_348 = local_3c0;
                    local_340 = local_328;
                    local_2f8 = local_3c0;
                    local_2f0 = local_328;
                    local_2e8 = (long)local_398;
                    local_2e0 = local_1f8;
                    local_2d8 = (long)local_398;
LAB_0013eb15:
                    lVar27 = (long)(int)uVar21;
                    uVar21 = lVar27 + 2;
                    uVar10 = (uint)uVar21;
                    lVar32 = img.accesses_._16_8_;
                    if ((int)uVar10 < local_2d0) {
                      local_338 = *(long *)img.accesses_._72_8_;
                      piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_3c8 = (long *)img.img_._16_8_;
                      lVar18 = *(long *)img.img_._72_8_;
                      if (*(char *)(lVar27 + 2 + lVar18 * uVar22 + img.img_._16_8_) == '\0')
                      goto LAB_0013e837;
                      piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                      lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                      goto LAB_0013e02e;
LAB_0013ebdd:
                      iVar19 = (int)uVar21;
                      uVar29 = (ulong)iVar19;
                      lVar41 = local_338 * (uVar22 - 1);
                      lVar32 = lVar41 + img.accesses_._16_8_;
                      piVar3 = (int *)(lVar32 + 4 + uVar29 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar35 = (uVar22 - 1) * lVar18;
                      lVar27 = img.img_._16_8_ + lVar35;
                      if (*(char *)(uVar29 + 1 + lVar27) == '\0') {
                        piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 + uVar29 * 4)
                        ;
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)(uVar29 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
                          uVar16 = (ulong)iVar19;
                          piVar3 = (int *)(lVar32 + -4 + uVar16 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar27 + -1 + uVar16) == '\0') goto LAB_0013fa87;
                          piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + uVar16 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + -8 + uVar16 * 4)
                          ;
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar16 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 +
                                                                   -8 + uVar16 * 4));
                          local_3b0 = (long *)img_labels.accesses_._72_8_;
                          local_328 = *(ulong *)img_labels.accesses_._72_8_;
                          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ +
                                          uVar16 * 4);
                          *piVar3 = *piVar3 + 1;
                          local_1f8 = *(long *)img_labels.img_._72_8_;
                          *(uint *)(local_1f8 * uVar22 + img_labels.img_._16_8_ + uVar16 * 4) =
                               uVar10;
                          local_388 = img_labels.img_._16_8_;
                          local_380 = img_labels.accesses_._16_8_;
                          local_370 = img_labels.img_._16_8_;
                          local_378 = img_labels.accesses_._16_8_;
                          local_3c0 = img_labels.accesses_._16_8_;
                          local_358 = img_labels.img_._16_8_;
                          local_2d8 = img_labels.img_._16_8_;
                          local_2e8 = img_labels.img_._16_8_;
                          local_3a0 = img_labels.accesses_._16_8_;
                          local_2f8 = img_labels.accesses_._16_8_;
                          local_398 = (long *)img_labels.img_._16_8_;
                          local_348 = img_labels.accesses_._16_8_;
                          local_390 = img_labels.img_._16_8_;
                          local_320 = (long *)img_labels.img_._72_8_;
                          local_3b8 = img_labels.accesses_._16_8_;
                          local_2f0 = local_328;
                          local_2e0 = local_1f8;
                          goto LAB_001426ab;
                        }
                        uVar23 = (ulong)iVar19;
                        piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)(lVar27 + 2 + uVar23) == '\0') {
                          lVar18 = (long)iVar19;
                          piVar3 = (int *)(lVar32 + -4 + lVar18 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar27 + -1 + lVar18) == '\0') goto LAB_0013f449;
                          piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + lVar18 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + -8 + lVar18 * 4)
                          ;
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar18 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 +
                                                                   -8 + lVar18 * 4));
                          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                           img_labels.accesses_._16_8_ + lVar18 * 4);
                          *piVar3 = *piVar3 + 1;
                          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                    img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
                          goto LAB_00140dee;
                        }
                        piVar3 = (int *)(lVar32 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)(lVar27 + uVar23) != '\0') {
                          lVar32 = uVar22 - 2;
                          piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 + 4 +
                                          uVar29 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar27 = local_340 * lVar32 + local_300;
                          lVar35 = lVar32 * local_1f0 + local_1e8;
                          if (*(char *)(uVar29 + 1 + img.img_._16_8_ + lVar18 * lVar32) == '\0') {
                            piVar3 = (int *)(lVar27 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = *(uint *)(lVar35 + uVar23 * 4);
                            piVar3 = (int *)(lVar27 + 8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar35 + 8 + uVar23 * 4));
                            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                             img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                               img_labels.img_._16_8_ + -8 + uVar23 * 4);
                          }
                          else {
                            piVar3 = (int *)(lVar27 + 8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = *(uint *)(lVar35 + 8 + uVar23 * 4);
                            piVar3 = (int *)(local_300 + local_340 * uVar22 + -8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(local_1e8 + local_1f0 * uVar22 + -8 + uVar23 * 4);
                          }
LAB_0013c8bd:
                          uVar10 = UFPC::MemMerge(uVar10,uVar14);
                          local_328 = *(ulong *)img_labels.accesses_._72_8_;
                          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ +
                                          uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          local_1f8 = *(long *)img_labels.img_._72_8_;
                          lVar32 = img_labels.accesses_._16_8_;
                          local_1f0 = local_1f8;
                          local_320 = (long *)img_labels.img_._72_8_;
                          local_1e8 = img_labels.img_._16_8_;
                          local_2d8 = img_labels.img_._16_8_;
                          local_3c0 = img_labels.accesses_._16_8_;
                          local_3b8 = img_labels.accesses_._16_8_;
                          local_3b0 = (long *)img_labels.accesses_._72_8_;
                          local_3a0 = img_labels.accesses_._16_8_;
                          local_398 = (long *)img_labels.img_._16_8_;
                          local_390 = img_labels.img_._16_8_;
                          local_388 = img_labels.img_._16_8_;
                          local_380 = img_labels.accesses_._16_8_;
                          local_378 = img_labels.accesses_._16_8_;
                          local_370 = img_labels.img_._16_8_;
                          local_358 = img_labels.img_._16_8_;
LAB_0013c935:
                          *(uint *)(local_1f0 * uVar22 + local_1e8 + uVar23 * 4) = uVar10;
                          lVar35 = uVar22 - 1;
                          lVar41 = uVar22 - 2;
                          iVar19 = (int)uVar21;
                          lVar40 = (long)iVar19;
                          lVar25 = lVar40 << 0x20;
                          lVar27 = lVar40 * 4;
                          lVar42 = 0;
                          local_1f0 = local_1f8;
LAB_0013c9a1:
                          uVar29 = lVar40 + lVar42 + 2;
                          lVar39 = lVar25 >> 0x1e;
                          iVar13 = (int)lVar42;
                          local_3c8 = (long *)img.img_._16_8_;
                          if (lVar15 <= (long)uVar29) {
                            uVar10 = iVar19 + 2 + iVar13;
                            if (local_2d0 < (int)uVar10) goto LAB_00142001;
                            lVar27 = *(long *)img.accesses_._72_8_;
                            lVar42 = lVar27 * uVar22 + img.accesses_._16_8_;
                            piVar3 = (int *)((lVar25 + 0x200000000 >> 0x1e) + lVar42);
                            *piVar3 = *piVar3 + 1;
                            lVar40 = lVar25 + 0x200000000 >> 0x20;
                            lVar18 = *(long *)img.img_._72_8_;
                            lVar37 = lVar18 * uVar22 + img.img_._16_8_;
                            local_380 = lVar32;
                            if (*(char *)(lVar40 + lVar37) == '\0') {
                              piVar3 = (int *)(lVar27 * (uVar22 | 1) + img.accesses_._16_8_ +
                                              lVar40 * 4);
                              *piVar3 = *piVar3 + 1;
                              cVar28 = *(char *)(lVar40 + (uVar22 | 1) * lVar18 + img.img_._16_8_);
                              piVar3 = (int *)(lVar42 + (lVar25 + 0x300000000 >> 0x1e));
                              *piVar3 = *piVar3 + 1;
                              lVar25 = lVar25 + 0x300000000 >> 0x20;
                              cVar5 = *(char *)(lVar37 + lVar25);
                              if (cVar28 == '\0') {
                                if (cVar5 == '\0') goto LAB_00141e87;
                                piVar3 = (int *)(local_328 * lVar41 + lVar32 + lVar40 * 4);
                                *piVar3 = *piVar3 + 1;
                                uVar12 = *(undefined4 *)
                                          (lVar41 * local_1f0 + local_2d8 + lVar40 * 4);
                                piVar3 = (int *)(local_328 * uVar22 + lVar32 + lVar40 * 4);
                                *piVar3 = *piVar3 + 1;
                                *(undefined4 *)(local_1f0 * uVar22 + local_2d8 + lVar40 * 4) =
                                     uVar12;
                                goto LAB_0014434a;
                              }
                              if (cVar5 != '\0') goto LAB_0013d0dc;
LAB_0013d565:
                              lVar32 = local_328 * uVar22 + lVar32;
                              piVar3 = (int *)(lVar39 + lVar32);
                              *piVar3 = *piVar3 + 1;
                              lVar18 = local_1f0 * uVar22 + local_2d8;
                              uVar12 = *(undefined4 *)(lVar39 + lVar18);
                              piVar3 = (int *)(lVar32 + lVar40 * 4);
                              *piVar3 = *piVar3 + 1;
                            }
                            else {
                              lVar25 = lVar25 + 0x300000000 >> 0x20;
LAB_0013d0dc:
                              piVar3 = (int *)(img.accesses_._16_8_ + lVar27 * lVar35 + lVar25 * 4);
                              *piVar3 = *piVar3 + 1;
                              if (*(char *)(lVar25 + img.img_._16_8_ + lVar18 * lVar35) == '\0')
                              goto LAB_0013d565;
                              piVar3 = (int *)(local_328 * lVar41 + lVar32 + lVar40 * 4);
                              *piVar3 = *piVar3 + 1;
                              uVar12 = *(undefined4 *)(lVar41 * local_1f0 + local_2d8 + lVar40 * 4);
                              piVar3 = (int *)(local_328 * uVar22 + lVar32 + lVar40 * 4);
                              *piVar3 = *piVar3 + 1;
                              lVar18 = local_1f0 * uVar22 + local_2d8;
                            }
                            *(undefined4 *)(lVar18 + lVar40 * 4) = uVar12;
                            goto LAB_0014434a;
                          }
                          local_338 = *(long *)img.accesses_._72_8_;
                          lVar37 = local_338 * uVar22;
                          piVar3 = (int *)(lVar37 + img.accesses_._16_8_ + lVar27 + 8 + lVar42 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar18 = *(long *)img.img_._72_8_;
                          lVar38 = lVar18 * uVar22;
                          if (*(char *)(lVar42 + 2 + lVar40 + img.img_._16_8_ + lVar38) == '\0') {
                            lVar32 = lVar27 + img.accesses_._16_8_;
                            piVar3 = (int *)(local_318 * local_338 + lVar32 + 8 + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            lVar30 = img.img_._16_8_ + lVar40;
                            if (*(char *)(lVar42 + 2 + local_318 * lVar18 + lVar30) == '\0') {
                              piVar3 = (int *)(lVar37 + img.accesses_._16_8_ +
                                              (lVar25 + 0x300000000 >> 0x1e));
                              *piVar3 = *piVar3 + 1;
                              uVar21 = (ulong)(iVar19 + 2) + lVar42;
                              lVar32 = lVar25 + 0x300000000 >> 0x20;
                              if (*(char *)(img.img_._16_8_ + lVar38 + lVar32) == '\0') {
                                uVar23 = uVar21 & 0xffffffff;
                                lVar32 = img.accesses_._16_8_;
                                goto LAB_0013da0f;
                              }
                              uVar16 = lVar40 + lVar42 + 2;
                              lVar41 = img.accesses_._16_8_ + local_338 * lVar35;
                              piVar3 = (int *)(lVar41 + lVar32 * 4);
                              *piVar3 = *piVar3 + 1;
                              lVar27 = lVar35 * lVar18 + img.img_._16_8_;
                              if (*(char *)(lVar32 + lVar27) != '\0') {
                                lVar32 = *local_3b0;
                                piVar3 = (int *)(lVar32 * local_308 + local_378 + lVar40 * 4 + 8 +
                                                lVar42 * 4);
                                *piVar3 = *piVar3 + 1;
                                lVar18 = *local_320;
                                uVar10 = *(uint *)(lVar18 * local_308 + local_370 + lVar40 * 4 + 8 +
                                                  lVar42 * 4);
                                piVar3 = (int *)(lVar32 * uVar22 + local_378 + lVar40 * 4 + 8 +
                                                lVar42 * 4);
                                *piVar3 = *piVar3 + 1;
                                local_368 = uVar21;
                                uVar21 = uVar16;
                                local_358 = local_370;
                                goto LAB_00141f07;
                              }
                              piVar3 = (int *)(lVar41 + (lVar25 + 0x400000000 >> 0x1e));
                              *piVar3 = *piVar3 + 1;
                              if (*(char *)(lVar27 + (lVar25 + 0x400000000 >> 0x20)) != '\0')
                              goto LAB_0013c513;
                              piVar3 = (int *)(local_378 + *local_3b0 * local_308 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              uVar10 = *(uint *)(local_370 + *local_320 * local_308 + lVar40 * 4 + 8
                                                + lVar42 * 4);
                              piVar3 = (int *)(*local_3b0 * uVar22 + local_380 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              local_1f0 = *local_320;
                              local_370 = local_388;
                              local_378 = local_380;
                              local_398 = (long *)local_388;
                              local_3c0 = local_380;
                              local_358 = local_388;
                              local_3b8 = local_380;
                              local_2d8 = local_388;
                              local_348 = local_380;
                              local_1e8 = local_388;
                              goto LAB_0013c62f;
                            }
                            piVar3 = (int *)(lVar37 + lVar32 + 0xc + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar42 + 3 + lVar38 + lVar30) == '\0') {
                              iVar19 = iVar19 + iVar13;
                              piVar3 = (int *)(lVar39 + local_3c0 + *local_3b0 * uVar22);
                              *piVar3 = *piVar3 + 1;
                              uVar12 = *(undefined4 *)
                                        (lVar39 + (long)local_398 + *local_320 * uVar22);
                              local_328 = *local_3b0;
                              piVar3 = (int *)(local_328 * uVar22 + local_378 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              local_1f8 = *local_320;
                              *(undefined4 *)
                               (local_1f8 * uVar22 + local_370 + lVar40 * 4 + 8 + lVar42 * 4) =
                                   uVar12;
LAB_00141616:
                              uVar21 = (ulong)(iVar19 + 2);
                              local_300 = local_378;
                              local_1f0 = local_1f8;
                              local_1e8 = local_370;
                              local_3c0 = local_378;
                              local_3b8 = local_378;
                              local_398 = (long *)local_370;
                              local_358 = local_370;
                              local_348 = local_378;
                              local_340 = local_328;
                              local_2f8 = local_378;
                              local_2f0 = local_328;
                              local_2e8 = local_370;
                              local_2e0 = local_1f8;
                              local_2d8 = local_370;
                              goto LAB_0013eb15;
                            }
                            piVar3 = (int *)(lVar32 + (long)local_350 * local_338 + 0xc + lVar42 * 4
                                            );
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar42 + 3 + lVar30 + (long)local_350 * lVar18) != '\0') {
                              lVar32 = *local_3b0;
                              piVar3 = (int *)(lVar32 * local_308 + local_3b8 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              lVar18 = *local_320;
                              uVar10 = *(uint *)(lVar18 * local_308 + local_358 + lVar40 * 4 + 8 +
                                                lVar42 * 4);
                              piVar3 = (int *)(lVar32 * uVar22 + local_3b8 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              local_368 = (ulong)(iVar19 + iVar13 + 2);
                              uVar21 = lVar40 + lVar42 + 2;
                              goto LAB_00141f07;
                            }
                          }
                          else {
                            piVar3 = (int *)((long)local_350 * local_338 +
                                             lVar27 + img.accesses_._16_8_ + 0xc + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar42 + 3 +
                                         (long)local_350 * lVar18 + img.img_._16_8_ + lVar40) !=
                                '\0') {
                              piVar3 = (int *)(local_308 * local_328 + lVar32 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              uVar21 = (ulong)(iVar19 + iVar13 + 2);
                              uVar10 = *(uint *)(local_308 * local_1f0 + local_2d8 + lVar40 * 4 + 8
                                                + lVar42 * 4);
                              piVar3 = (int *)(local_328 * uVar22 + lVar32 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              goto LAB_00144027;
                            }
                            piVar3 = (int *)(lVar27 + img.accesses_._16_8_ + lVar37 + 0xc +
                                            lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar42 + 3 + img.img_._16_8_ + lVar40 + lVar38) == '\0') {
                              uVar21 = (ulong)(iVar19 + iVar13 + 2);
                              piVar3 = (int *)(lVar39 + lVar32 + local_328 * uVar22);
                              *piVar3 = *piVar3 + 1;
                              uVar12 = *(undefined4 *)(lVar39 + local_2d8 + local_1f0 * uVar22);
                              local_328 = *local_3b0;
                              piVar3 = (int *)(local_328 * uVar22 + local_3b8 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              local_1f8 = *local_320;
                              *(undefined4 *)
                               (local_1f8 * uVar22 + local_358 + lVar40 * 4 + 8 + lVar42 * 4) =
                                   uVar12;
                              local_2d8 = local_358;
                              local_2e8 = local_358;
                              local_2f8 = local_3b8;
                              local_348 = local_3b8;
                              local_2f0 = local_328;
                              local_2e0 = local_1f8;
                              goto LAB_001426ab;
                            }
                          }
                          piVar3 = (int *)(local_338 * lVar35 + img.accesses_._16_8_ + lVar27 + 0x10
                                          + lVar42 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar42 + 4 + lVar18 * lVar35 + img.img_._16_8_ + lVar40) ==
                              '\0') goto LAB_0013cd61;
                          piVar3 = (int *)(img.accesses_._16_8_ + lVar27 + local_338 * local_308 +
                                           0xc + lVar42 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar42 + 3 + img.img_._16_8_ + lVar40 + lVar18 * local_308)
                              == '\0') {
                            lVar18 = *local_3b0;
                            piVar3 = (int *)(local_308 * lVar18 + local_3c0 + lVar27 + 0x10 +
                                            lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            lVar32 = *local_320;
                            uVar10 = *(uint *)(local_308 * lVar32 + (long)local_398 + lVar27 + 0x10
                                              + lVar42 * 4);
                            piVar3 = (int *)(lVar18 * uVar22 + local_3c0 + lVar27 + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 +
                                                                     (long)local_398 + lVar27 +
                                                                    lVar42 * 4));
                            local_3b0 = (long *)img_labels.accesses_._72_8_;
                            local_328 = *(ulong *)img_labels.accesses_._72_8_;
                            piVar3 = (int *)(uVar22 * local_328 + img_labels.accesses_._16_8_ +
                                             lVar27 + 8 + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            local_390 = img_labels.img_._16_8_;
                            local_388 = img_labels.img_._16_8_;
                            local_380 = img_labels.accesses_._16_8_;
                            local_370 = img_labels.img_._16_8_;
                            local_378 = img_labels.accesses_._16_8_;
                            local_3a0 = img_labels.accesses_._16_8_;
                            lVar32 = img_labels.accesses_._16_8_;
                            local_320 = (long *)img_labels.img_._72_8_;
                            local_398 = (long *)img_labels.img_._16_8_;
                          }
                          else {
                            piVar3 = (int *)(local_3b8 + lVar27 + *local_3b0 * local_308 + 0x10 +
                                            lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = *(uint *)(local_358 + lVar27 + *local_320 * local_308 + 0x10 +
                                              lVar42 * 4);
                            local_328 = *local_3b0;
                            piVar3 = (int *)(uVar22 * local_328 + local_3c0 + lVar27 + 8 +
                                            lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            lVar32 = local_3c0;
                          }
                          local_1f0 = *local_320;
                          *(uint *)(uVar22 * local_1f0 + (long)local_398 + lVar27 + 8 + lVar42 * 4)
                               = uVar10;
                          lVar25 = lVar25 + 0x200000000;
                          lVar42 = lVar42 + 2;
                          local_3c0 = lVar32;
                          local_2d8 = (long)local_398;
                          local_3b8 = lVar32;
                          local_358 = (long)local_398;
                          goto LAB_0013c9a1;
                        }
                        lVar35 = (long)iVar19;
                        piVar3 = (int *)(lVar32 + -4 + lVar35 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar32 = uVar22 - 2;
                        if (*(char *)(lVar27 + -1 + lVar35) == '\0') {
                          piVar3 = (int *)(local_340 * lVar32 + local_300 + 8 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)(lVar32 * local_1f0 + local_1e8 + 8 + uVar23 * 4);
LAB_0013fe46:
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar14 = *(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + lVar35 * 4);
                        }
                        else {
                          lVar27 = img.accesses_._16_8_ + local_338 * lVar32;
                          piVar3 = (int *)(lVar27 + 4 + uVar29 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar18 = img.img_._16_8_ + lVar18 * lVar32;
                          if (*(char *)(uVar29 + 1 + lVar18) == '\0') {
                            local_300 = local_300 + local_340 * lVar32;
                            piVar3 = (int *)(local_300 + -8 + lVar35 * 4);
                            *piVar3 = *piVar3 + 1;
                            local_1e8 = local_1e8 + local_1f0 * lVar32;
                            uVar10 = *(uint *)(local_1e8 + -8 + lVar35 * 4);
                            piVar3 = (int *)(local_300 + 8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(local_1e8 + 8 + uVar23 * 4);
                          }
                          else {
                            piVar3 = (int *)(lVar27 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar18 + uVar23) != '\0') {
                              piVar3 = (int *)(local_340 * lVar32 + local_300 + 8 + uVar23 * 4);
                              *piVar3 = *piVar3 + 1;
                              uVar10 = *(uint *)(lVar32 * local_1f0 + local_1e8 + 8 + uVar23 * 4);
                              goto LAB_0013fe46;
                            }
                            local_300 = local_300 + local_340 * lVar32;
                            piVar3 = (int *)(local_300 + -8 + lVar35 * 4);
                            *piVar3 = *piVar3 + 1;
                            local_1e8 = local_1e8 + local_1f0 * lVar32;
                            uVar10 = *(uint *)(local_1e8 + -8 + lVar35 * 4);
                            piVar3 = (int *)(local_300 + 8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(local_1e8 + 8 + uVar23 * 4);
                          }
                          uVar10 = UFPC::MemMerge(uVar10,uVar14);
                          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                           img_labels.accesses_._16_8_ + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                             img_labels.img_._16_8_ + -8 + lVar35 * 4);
                        }
                        uVar10 = UFPC::MemMerge(uVar10,uVar14);
                        local_3b0 = (long *)img_labels.accesses_._72_8_;
                        local_328 = *(ulong *)img_labels.accesses_._72_8_;
                        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ +
                                        uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        local_1f8 = *(long *)img_labels.img_._72_8_;
                        local_390 = img_labels.img_._16_8_;
                        local_388 = img_labels.img_._16_8_;
                        local_380 = img_labels.accesses_._16_8_;
                        local_370 = img_labels.img_._16_8_;
                        local_378 = img_labels.accesses_._16_8_;
                        local_398 = (long *)img_labels.img_._16_8_;
                        local_3c0 = img_labels.accesses_._16_8_;
                        local_358 = img_labels.img_._16_8_;
                        local_3b8 = img_labels.accesses_._16_8_;
                        local_3a0 = img_labels.accesses_._16_8_;
                        lVar32 = img_labels.accesses_._16_8_;
                        local_1f0 = local_1f8;
                        local_320 = (long *)img_labels.img_._72_8_;
                        local_1e8 = img_labels.img_._16_8_;
                        local_2d8 = img_labels.img_._16_8_;
                        goto LAB_0013c935;
                      }
                      piVar3 = (int *)(lVar32 + uVar29 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar27 + uVar29) == '\0') {
                        lVar35 = (long)iVar19;
                        piVar3 = (int *)(lVar32 + -4 + lVar35 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar32 = uVar22 - 2;
                        if ((*(char *)(lVar27 + -1 + lVar35) == '\0') ||
                           (piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 + uVar29 * 4)
                           , *piVar3 = *piVar3 + 1,
                           *(char *)(uVar29 + img.img_._16_8_ + lVar18 * lVar32) != '\0')) {
                          piVar3 = (int *)(local_340 * lVar32 + local_300 + uVar29 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)(lVar32 * local_1f0 + local_1e8 + uVar29 * 4);
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar14 = *(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + lVar35 * 4);
                        }
                        else {
                          local_300 = local_300 + local_340 * lVar32;
                          piVar3 = (int *)(local_300 + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          local_1e8 = local_1e8 + local_1f0 * lVar32;
                          uVar10 = *(uint *)(local_1e8 + -8 + lVar35 * 4);
                          piVar3 = (int *)(local_300 + uVar29 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1e8 + uVar29 * 4));
                          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                           img_labels.accesses_._16_8_ + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                             img_labels.img_._16_8_ + -8 + lVar35 * 4);
                        }
                        uVar10 = UFPC::MemMerge(uVar10,uVar14);
                        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                         img_labels.accesses_._16_8_ + uVar29 * 4);
                        *piVar3 = *piVar3 + 1;
                      }
                      else {
                        piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar29 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar29 * 4);
                        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar29 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 + -8
                                                                + uVar29 * 4));
                        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                         img_labels.accesses_._16_8_ + uVar29 * 4);
                        *piVar3 = *piVar3 + 1;
                      }
                      local_1f0 = *(long *)img_labels.img_._72_8_;
                      local_2d8 = img_labels.img_._16_8_;
                      goto LAB_00144027;
                    }
                    local_338 = *(long *)img.accesses_._72_8_;
                    piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img.img_._72_8_;
                    cVar28 = *(char *)(lVar27 + 2 + lVar18 * uVar22 + img.img_._16_8_);
                    local_3a0 = local_300;
                    local_1f8 = local_1f0;
                    if (local_2d0 < (int)uVar10) {
                      uVar23 = uVar21;
                      if (cVar28 == '\0') {
                        uVar21 = uVar21 & 0xffffffff;
LAB_00142d63:
                        iVar19 = (int)uVar21;
                        lVar41 = local_338 * (uVar22 | 1);
                        piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar40 = (uVar22 | 1) * lVar18;
                        if (*(char *)(uVar23 + img.img_._16_8_ + lVar40) == '\0') goto LAB_00144b8c;
LAB_00142d8d:
                        uVar23 = (ulong)iVar19;
                        piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + -4 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)((uVar23 - 1) + lVar40 + img.img_._16_8_) == '\0')
                        goto LAB_001430a3;
                        lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                                 img_labels.accesses_._16_8_;
                        piVar3 = (int *)(lVar18 + -8 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                        uVar12 = *(undefined4 *)(lVar32 + -8 + uVar23 * 4);
                        goto LAB_0014433e;
                      }
                      piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                      lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_3c8 = (long *)img.img_._16_8_;
                      local_328 = local_340;
                      if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0') {
LAB_0013f6f7:
                        lVar32 = local_338 * (uVar22 - 1) + lVar32;
                        piVar3 = (int *)(lVar32 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar18 = lVar18 * (uVar22 - 1) + (long)local_3c8;
                        if (*(char *)(uVar23 + lVar18) == '\0') {
                          lVar27 = (long)(int)uVar10;
                          piVar3 = (int *)(lVar32 + -4 + lVar27 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar18 + -1 + lVar27) == '\0') goto LAB_001430a3;
                          piVar3 = (int *)(local_328 * (uVar22 - 2) + local_3a0 + -8 + lVar27 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar12 = *(undefined4 *)
                                    ((uVar22 - 2) * local_1f8 + local_1e8 + -8 + lVar27 * 4);
                          piVar3 = (int *)(local_328 * uVar22 + local_3a0 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          *(undefined4 *)(local_1f8 * uVar22 + local_1e8 + uVar23 * 4) = uVar12;
                          local_380 = local_3a0;
                          local_2d8 = local_1e8;
                        }
                        else {
LAB_0013f720:
                          piVar3 = (int *)(local_328 * (uVar22 - 2) + local_3a0 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar18 = (uVar22 - 2) * local_1f8;
LAB_0013f74e:
                          uVar12 = *(undefined4 *)(lVar18 + local_1e8 + uVar23 * 4);
                          piVar3 = (int *)(local_328 * uVar22 + local_3a0 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          *(undefined4 *)(local_1f8 * uVar22 + local_1e8 + uVar23 * 4) = uVar12;
                          local_380 = local_3a0;
                          local_2d8 = local_1e8;
                        }
                        goto LAB_0014434a;
                      }
LAB_0013f30c:
                      iVar13 = (int)uVar21;
                      uVar23 = (ulong)iVar13;
                      local_338 = local_338 * (uVar22 - 1);
                      piVar3 = (int *)(local_338 + img.accesses_._16_8_ + -4 + uVar23 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar18 = lVar18 * (uVar22 - 1);
                      local_1f0 = local_1f8;
                      if (*(char *)((uVar23 - 1) + img.img_._16_8_ + lVar18) != '\0') {
                        piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = *(uint *)((uVar22 - 2) * local_1f8 + local_1e8 + -8 + uVar23 * 4);
                        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar14 = *(uint *)(local_1f8 * uVar22 + local_1e8 + -8 + uVar23 * 4);
                        goto LAB_0013f6e2;
                      }
                    }
                    else {
                      if (cVar28 != '\0') {
                        piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                        lVar27 * 4);
                        *piVar3 = *piVar3 + 1;
                        local_3c8 = (long *)img.img_._16_8_;
                        local_328 = local_340;
                        if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                        {
LAB_0013ef72:
                          uVar10 = (uint)uVar21;
                          uVar23 = (ulong)(int)uVar10;
                          lVar35 = local_338 * (uVar22 - 1) + lVar32;
                          piVar3 = (int *)(lVar35 + 4 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar27 = (uVar22 - 1) * lVar18 + (long)local_3c8;
                          if (*(char *)(uVar23 + 1 + lVar27) == '\0') goto LAB_0013f6f7;
                          piVar3 = (int *)(lVar35 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar27 + uVar23) != '\0') goto LAB_0013f720;
                          piVar3 = (int *)(lVar35 + -4 + (long)(int)uVar10 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar27 + -1 + (long)(int)uVar10) == '\0') {
                            piVar3 = (int *)(local_328 * (uVar22 - 2) + local_3a0 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            lVar18 = (uVar22 - 2) * local_1f8;
                            goto LAB_0013f74e;
                          }
                          lVar18 = *(long *)img.img_._72_8_;
                          goto LAB_0013efd3;
                        }
LAB_0013edd5:
                        uVar23 = (ulong)(int)uVar21;
                        lVar32 = local_338 * (uVar22 - 1) + img.accesses_._16_8_;
                        piVar3 = (int *)(lVar32 + 4 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar27 = (uVar22 - 1) * lVar18 + img.img_._16_8_;
                        if (*(char *)(uVar23 + 1 + lVar27) == '\0') goto LAB_0013f30c;
                        piVar3 = (int *)(lVar32 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)(lVar27 + uVar23) == '\0') {
                          piVar3 = (int *)(lVar32 + -4 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar32 = uVar22 - 2;
                          if ((*(char *)(lVar27 + -1 + uVar23) != '\0') &&
                             (piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 +
                                              uVar23 * 4), *piVar3 = *piVar3 + 1,
                             *(char *)(uVar23 + img.img_._16_8_ + lVar18 * lVar32) == '\0')) {
                            local_300 = local_300 + local_340 * lVar32;
                            piVar3 = (int *)(local_300 + -8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            local_1e8 = local_1e8 + local_1f8 * lVar32;
                            uVar10 = *(uint *)(local_1e8 + -8 + uVar23 * 4);
                            piVar3 = (int *)(local_300 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1e8 + uVar23 * 4));
                            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                             img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                               img_labels.img_._16_8_ + -8 + uVar23 * 4);
                            goto LAB_0013f6e2;
                          }
                          piVar3 = (int *)(local_340 * lVar32 + local_300 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)(lVar32 * local_1f8 + local_1e8 + uVar23 * 4);
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                        }
                        else {
                          piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)((uVar22 - 2) * local_1f8 + local_1e8 + uVar23 * 4);
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                        }
                        uVar14 = *(uint *)(local_1f8 * uVar22 + local_1e8 + -8 + uVar23 * 4);
                        goto LAB_0013f6e2;
                      }
                      uVar23 = uVar21 & 0xffffffff;
LAB_0013f189:
                      iVar19 = (int)uVar23;
                      lVar41 = local_338 * (uVar22 | 1);
                      piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + uVar21 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar40 = (uVar22 | 1) * lVar18;
                      local_3c8 = (long *)img.img_._16_8_;
                      if (*(char *)(uVar21 + img.img_._16_8_ + lVar40) == '\0') goto LAB_0013c08b;
                      piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 +
                                      (long)iVar19 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)((long)iVar19 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0')
                      goto LAB_00142d8d;
LAB_0013f1e0:
                      iVar13 = (int)uVar23;
                      piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + -4 + (long)iVar13 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar21 = uVar23 & 0xffffffff;
                      local_3c8 = (long *)img.img_._16_8_;
                      if (*(char *)((long)iVar13 + -1 + lVar40 + img.img_._16_8_) == '\0')
                      goto LAB_0013c0c0;
LAB_0013f20e:
                      lVar27 = (long)iVar13;
                      local_338 = local_338 * (uVar22 - 1);
                      piVar3 = (int *)(local_338 + img.accesses_._16_8_ + 4 + lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar18 = lVar18 * (uVar22 - 1);
                      if (*(char *)(lVar27 + 1 + img.img_._16_8_ + lVar18) != '\0') {
                        piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + lVar27 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + lVar27 * 4);
                        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar27 * 4);
                        *piVar3 = *piVar3 + 1;
                        local_1e8 = local_1f0 * uVar22 + local_1e8;
                        goto LAB_00142c85;
                      }
                    }
LAB_0013f3b3:
                    uVar23 = (ulong)iVar13;
                    piVar3 = (int *)(local_338 + img.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(uVar23 + lVar18 + img.img_._16_8_) == '\0') {
                      lVar32 = local_340 * uVar22 + local_300;
                      piVar3 = (int *)(lVar32 + -8 + uVar23 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar18 = local_1f0 * uVar22 + local_1e8;
                      uVar12 = *(undefined4 *)(lVar18 + -8 + uVar23 * 4);
                      piVar3 = (int *)(lVar32 + uVar23 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)(lVar18 + uVar23 * 4) = uVar12;
                      local_380 = local_300;
                      local_2d8 = local_1e8;
                      goto LAB_0014434a;
                    }
                    piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar23 * 4);
                    piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_1e8 = local_1f0 * uVar22 + local_1e8;
                    goto LAB_0013f403;
                  }
LAB_0014446b:
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 1) +
                                   img.accesses_._16_8_ + 4 + (long)(int)uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = lVar18 * (uVar22 - 1);
                  if (*(char *)((long)(int)uVar21 + 1 + img.img_._16_8_ + lVar32) == '\0')
                  goto LAB_0014241e;
LAB_0014449f:
                  uVar23 = (ulong)(int)uVar21;
                  piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ +
                                   img.accesses_._16_8_ + uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar27 = uVar22 - 2;
                  if (*(char *)(uVar23 + lVar32 + img.img_._16_8_) != '\0') {
                    lVar32 = *(long *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(lVar32 * lVar27 + img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(uint *)(lVar27 * lVar18 + img_labels.img_._16_8_ + uVar23 * 4);
                    piVar3 = (int *)(lVar32 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_368 = uVar21;
                    uVar21 = uVar23;
                    local_358 = img_labels.img_._16_8_;
                    goto LAB_00141f07;
                  }
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ +
                                  uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  cVar28 = *(char *)(uVar23 + img.img_._16_8_ + lVar18 * lVar27);
                } while( true );
              }
              goto LAB_0013d159;
            }
            lVar40 = local_338 * (uVar22 - 1);
            piVar3 = (int *)(lVar40 + img.accesses_._16_8_ + 0xc + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = (uVar22 - 1) * lVar18;
            if (*(char *)(lVar32 + 3 + img.img_._16_8_ + lVar41) == '\0') {
              piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + 3 + lVar32) == '\0') {
                piVar3 = (int *)(local_380 + *local_3b0 * uVar22 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                uVar12 = *(undefined4 *)(local_388 + *local_320 * uVar22 + lVar32 * 4);
                local_328 = *local_3b0;
                piVar3 = (int *)(local_328 * uVar22 + local_3a0 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *local_320;
                *(undefined4 *)(local_1f8 * uVar22 + local_390 + 8 + lVar32 * 4) = uVar12;
                local_388 = local_390;
                local_380 = local_3a0;
                local_370 = local_390;
                local_378 = local_3a0;
                local_3c0 = local_3a0;
                local_358 = local_390;
                local_2d8 = local_390;
                local_2e8 = local_390;
                uVar21 = local_360 & 0xffffffff;
                local_2f8 = local_3a0;
                local_398 = (long *)local_390;
                local_348 = local_3a0;
                local_390 = local_390;
                local_3b8 = local_3a0;
                local_2f0 = local_328;
                local_2e0 = local_1f8;
                goto LAB_001426ab;
              }
LAB_0013d159:
              piVar3 = (int *)(lVar40 + img.accesses_._16_8_ + 0x10 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar32 + 4 + lVar41 + img.img_._16_8_) == '\0') {
                local_3a0 = local_3a0 + *local_3b0 * uVar22;
                piVar3 = (int *)(local_3a0 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                local_390 = local_390 + *local_320 * uVar22;
                uVar12 = *(undefined4 *)(local_390 + lVar32 * 4);
                piVar3 = (int *)(local_3a0 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(local_390 + 8 + lVar32 * 4) = uVar12;
                uVar21 = local_360 & 0xffffffff;
                goto LAB_00140dee;
              }
              lVar27 = uVar22 - 2;
              lVar41 = img.accesses_._16_8_ + local_338 * lVar27;
              piVar3 = (int *)(lVar41 + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = lVar18 * lVar27;
              if ((*(char *)(lVar32 + 3 + img.img_._16_8_ + lVar35) != '\0') &&
                 (piVar3 = (int *)(lVar41 + 8 + lVar32 * 4), *piVar3 = *piVar3 + 1,
                 *(char *)(img.img_._16_8_ + lVar35 + 2 + lVar32) != '\0')) {
                uVar21 = local_360 & 0xffffffff;
                goto LAB_00141130;
              }
              lVar18 = *local_3b0;
              piVar3 = (int *)(lVar18 * lVar27 + local_3a0 + 0x10 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = *local_320;
              uVar10 = *(uint *)(lVar27 * lVar35 + local_390 + 0x10 + lVar32 * 4);
              piVar3 = (int *)(lVar18 * uVar22 + local_3a0 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar35 * uVar22 + local_390 + lVar32 * 4));
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f8 = *(long *)img_labels.img_._72_8_;
              uVar21 = local_360 & 0xffffffff;
              lVar32 = img_labels.accesses_._16_8_;
              uVar23 = local_360;
              local_1f0 = local_1f8;
              local_320 = (long *)img_labels.img_._72_8_;
              local_1e8 = img_labels.img_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_3a0 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_390 = img_labels.img_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_358 = img_labels.img_._16_8_;
              goto LAB_0013c935;
            }
            lVar27 = uVar22 - 2;
            piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar27 + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar32 + 2 + img.img_._16_8_ + lVar18 * lVar27) == '\0') {
              lVar18 = *local_3b0;
              piVar3 = (int *)(lVar18 * lVar27 + local_380 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = *local_320;
              uVar10 = *(uint *)(lVar27 * lVar35 + local_388 + 8 + lVar32 * 4);
              piVar3 = (int *)(lVar18 * uVar22 + local_380 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar35 * uVar22 + local_388 + lVar32 * 4));
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                               img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f0 = *(long *)img_labels.img_._72_8_;
              uVar29 = local_360;
LAB_001406a9:
              uVar21 = uVar29 & 0xffffffff;
              local_2d8 = img_labels.img_._16_8_;
            }
            else {
              uVar21 = local_360 & 0xffffffff;
LAB_001412a0:
              uVar29 = (ulong)(int)uVar21;
              piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 2) + img.accesses_._16_8_ +
                               -4 + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              cVar28 = *(char *)((uVar29 - 1) +
                                *(long *)img.img_._72_8_ * (uVar22 - 2) + img.img_._16_8_);
LAB_0014255f:
              lVar18 = *(long *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f0 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + img_labels.img_._16_8_ + uVar29 * 4);
              lVar18 = img_labels.accesses_._16_8_ + lVar18 * uVar22;
              if (cVar28 == '\0') {
                piVar3 = (int *)(lVar18 + -8 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = UFPC::MemMerge(uVar10,*(uint *)(img_labels.img_._16_8_ + local_1f0 * uVar22
                                                         + -8 + uVar29 * 4));
                piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                 img_labels.accesses_._16_8_ + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f0 = *(long *)img_labels.img_._72_8_;
                local_2d8 = img_labels.img_._16_8_;
              }
              else {
                piVar3 = (int *)(lVar18 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                local_2d8 = img_labels.img_._16_8_;
              }
            }
            goto LAB_00144027;
          }
          piVar3 = (int *)(lVar30 + 4 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          if ((*(char *)(lVar25 + 1 + lVar38) != '\0') ||
             (piVar3 = (int *)(local_318 * local_338 + lVar32 + 4 + lVar25 * 4),
             *piVar3 = *piVar3 + 1, *(char *)(lVar25 + 1 + local_318 * lVar18 + lVar27) != '\0')) {
            uVar21 = (ulong)(iVar19 + (int)lVar25 + 2);
LAB_00142363:
            lVar27 = (long)(int)uVar21;
            lVar35 = local_338 * (uVar22 - 1);
            piVar3 = (int *)(lVar35 + img.accesses_._16_8_ + 4 + lVar27 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = lVar18 * (uVar22 - 1);
            if (*(char *)(lVar27 + 1 + img.img_._16_8_ + lVar32) == '\0') {
              piVar3 = (int *)(img.accesses_._16_8_ + local_338 * uVar22 + 4 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
                piVar3 = (int *)(lVar18 + -8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *(long *)img_labels.img_._72_8_;
                lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
                uVar12 = *(undefined4 *)(lVar32 + -8 + lVar27 * 4);
                piVar3 = (int *)(lVar18 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar32 + lVar27 * 4) = uVar12;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_320 = (long *)img_labels.img_._72_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_2f0 = local_328;
                local_2e0 = local_1f8;
                goto LAB_001426ab;
              }
LAB_0014241e:
              lVar27 = (long)(int)uVar21;
              piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                               8 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + 2 + lVar32 + img.img_._16_8_) == '\0') {
                lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                ;
                piVar3 = (int *)(lVar18 + -8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                uVar12 = *(undefined4 *)(lVar32 + -8 + lVar27 * 4);
                piVar3 = (int *)(lVar18 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar32 + lVar27 * 4) = uVar12;
                goto LAB_00140dee;
              }
LAB_0014244d:
              lVar32 = uVar22 - 2;
              uVar23 = (ulong)(int)uVar21;
              piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 4 +
                              uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(uVar23 + 1 + lVar18 * lVar32 + img.img_._16_8_) != '\0')
              goto LAB_00142480;
              lVar18 = *(long *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
              piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              uVar14 = *(uint *)(lVar27 * uVar22 + img_labels.img_._16_8_ + -8 + uVar23 * 4);
              goto LAB_001432f8;
            }
LAB_0014238c:
            uVar29 = (ulong)(int)uVar21;
            piVar3 = (int *)(lVar35 + img.accesses_._16_8_ + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = uVar22 - 2;
            if (*(char *)(uVar29 + lVar32 + img.img_._16_8_) == '\0') {
              piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar27 + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              cVar28 = *(char *)(uVar29 + img.img_._16_8_ + lVar18 * lVar27);
              goto LAB_0014255f;
            }
            lVar18 = *(long *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(lVar18 * lVar27 + img_labels.accesses_._16_8_ + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
            local_1f0 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(lVar27 * local_1f0 + img_labels.img_._16_8_ + uVar29 * 4);
            piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
            local_2d8 = img_labels.img_._16_8_;
            goto LAB_00144027;
          }
          lVar30 = local_338 * (long)local_350 + lVar32;
          piVar3 = (int *)(lVar30 + 0xc + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar33 = (long)local_350 * lVar18 + lVar27;
          if (*(char *)(lVar25 + 3 + lVar33) == '\0') {
            uVar21 = (ulong)(iVar19 + 2) + lVar25;
            iVar19 = (int)uVar21;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ +
                             lVar39 * 4 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar25 + 3 + lVar38) == '\0') {
              piVar3 = (int *)(img.accesses_._16_8_ +
                               *(long *)img.accesses_._72_8_ * (long)local_350 + lVar39 * 4 + 8 +
                              lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              local_3a0 = img_labels.accesses_._16_8_;
              local_340 = local_328;
              local_2f0 = local_328;
              if (*(char *)(lVar25 + 2 + lVar33) == '\0') {
                piVar3 = (int *)(local_328 * lVar41 + img_labels.accesses_._16_8_ + lVar37);
                *piVar3 = *piVar3 + 1;
                local_2e0 = *(long *)img_labels.img_._72_8_;
                uVar12 = *(undefined4 *)(lVar37 + lVar41 * local_2e0 + img_labels.img_._16_8_);
                piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                                lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)
                 (local_2e0 * uVar22 + img_labels.img_._16_8_ + lVar39 * 4 + 8 + lVar25 * 4) =
                     uVar12;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_1f8 = local_2e0;
                local_1f0 = local_2e0;
                goto LAB_0013e51e;
              }
              piVar3 = (int *)(local_328 * local_308 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8
                              + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f0 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)(local_1f0 * local_308 + img_labels.img_._16_8_ + lVar39 * 4 + 8 +
                                lVar25 * 4);
              piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                              lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_2e8 = img_labels.img_._16_8_;
              local_2f8 = img_labels.accesses_._16_8_;
              local_2e0 = local_1f0;
              local_1f8 = local_1f0;
              goto LAB_0013ff7f;
            }
            piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar35 +
                            ((long)(local_360 + 0x400000000) >> 0x1e));
            *piVar3 = *piVar3 + 1;
            cVar28 = *(char *)(lVar18 * lVar35 + img.img_._16_8_ +
                              ((long)(local_360 + 0x400000000) >> 0x20));
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (long)local_350 + img.accesses_._16_8_
                             + lVar39 * 4 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            cVar5 = *(char *)(lVar25 + 2 + lVar33);
            if (cVar28 != '\0') {
              if (cVar5 != '\0') goto LAB_0013c513;
              lVar32 = (long)(local_360 + 0x300000000) >> 0x20;
              goto LAB_00144e11;
            }
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_328 = *(ulong *)img_labels.accesses_._72_8_;
            local_3a0 = img_labels.accesses_._16_8_;
            if (cVar5 == '\0') {
              piVar3 = (int *)(local_328 * lVar41 + img_labels.accesses_._16_8_ + lVar37);
              *piVar3 = *piVar3 + 1;
              local_2e0 = *(long *)img_labels.img_._72_8_;
              uVar12 = *(undefined4 *)(lVar37 + lVar41 * local_2e0 + img_labels.img_._16_8_);
              piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                              lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)
               (local_2e0 * uVar22 + img_labels.img_._16_8_ + lVar39 * 4 + 8 + lVar25 * 4) = uVar12;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_2e8 = img_labels.img_._16_8_;
              local_2f8 = img_labels.accesses_._16_8_;
              local_2f0 = local_328;
              local_1f8 = local_2e0;
              goto LAB_00140595;
            }
            piVar3 = (int *)(local_328 * local_308 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_1f0 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(local_1f0 * local_308 + img_labels.img_._16_8_ + lVar39 * 4 + 8 +
                              lVar25 * 4);
            piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            goto LAB_00144b60;
          }
          piVar3 = (int *)(lVar30 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar25 + 2 + lVar33) != '\0') goto code_r0x0014418a;
          uVar21 = (ulong)(iVar19 + (int)lVar25 + 2);
          uVar29 = (long)(local_360 + 0x200000000) >> 0x20;
LAB_0014461f:
          lVar32 = uVar22 - 2;
          piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ +
                          uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(uVar29 + lVar18 * lVar32 + (long)local_3c8) == '\0') {
            lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar32 + img_labels.accesses_._16_8_;
            piVar3 = (int *)(lVar18 + -8 + (long)(int)uVar21 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = lVar32 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
            uVar10 = *(uint *)(lVar32 + -8 + (long)(int)uVar21 * 4);
            piVar3 = (int *)(lVar18 + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
            uVar14 = *(uint *)(lVar32 + uVar29 * 4);
LAB_001446cb:
            uVar10 = UFPC::MemMerge(uVar10,uVar14);
            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_ + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
LAB_00144008:
            local_1f0 = *(long *)img_labels.img_._72_8_;
            local_2d8 = img_labels.img_._16_8_;
            goto LAB_00144027;
          }
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * local_1f0 + img_labels.img_._16_8_ + uVar29 * 4);
        } while( true );
      }
      local_3c8 = (long *)img.img_._16_8_;
      if (iVar36 == 2) {
        uVar21 = 0;
        if (cVar28 == '\0') {
          lVar27 = lVar18 * (uVar22 | 1);
          uVar21 = 0;
LAB_0013bec9:
          lVar32 = *(long *)img.accesses_._72_8_;
          lVar25 = (long)(int)uVar21;
          piVar3 = (int *)((uVar22 | 1) * lVar32 + img.accesses_._16_8_ + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          uVar23 = uVar21;
          if (*(char *)(lVar25 + lVar27 + (long)local_3c8) == '\0') {
LAB_0013c08b:
            uVar10 = (uint)uVar23;
            lVar25 = (long)(int)uVar10;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ + 4 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            uVar21 = uVar23;
            if (*(char *)(lVar25 + 1 + lVar18 * uVar22 + (long)local_3c8) == '\0') {
LAB_00141e84:
              lVar25 = lVar25 + 1;
LAB_00141e87:
              piVar3 = (int *)((uVar22 | 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = (long)(int)uVar10;
              if (*(char *)(lVar25 + lVar18 * (uVar22 | 1) + (long)local_3c8) == '\0') {
                piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                 img_labels.accesses_._16_8_ + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)
                 (*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + lVar27 * 4) =
                     0;
                local_380 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
              }
              else {
                uVar10 = UFPC::MemNewLabel();
LAB_0014314b:
                piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                 img_labels.accesses_._16_8_ + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ +
                         lVar27 * 4) = uVar10;
                local_380 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
              }
              goto LAB_0014434a;
            }
          }
          else {
            piVar3 = (int *)(img.accesses_._16_8_ + lVar32 * uVar22 + 4 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_3c8 = local_3c8;
            if (*(char *)(lVar25 + 1 + lVar18 * uVar22 + (long)local_3c8) == '\0')
            goto LAB_0013c004;
          }
        }
LAB_0013c0c0:
        lVar32 = (long)(int)uVar21;
        piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 4 +
                        lVar32 * 4);
        *piVar3 = *piVar3 + 1;
        uVar23 = uVar21;
        if (*(char *)(lVar32 + 1 + lVar18 * (uVar22 - 1) + (long)local_3c8) == '\0') {
LAB_0014301c:
          uVar23 = (ulong)(int)uVar23;
          piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                          uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(uVar23 + lVar18 * (uVar22 - 1) + (long)local_3c8) == '\0') {
LAB_001430a3:
            uVar10 = UFPC::MemNewLabel();
LAB_001430a8:
            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_ + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + uVar23 * 4
                     ) = uVar10;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
          }
          else {
            lVar18 = *(long *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = *(long *)img_labels.img_._72_8_;
            uVar12 = *(undefined4 *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
            piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(lVar32 * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = uVar12;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
          }
        }
        else {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          lVar27 = *(long *)img_labels.img_._72_8_;
          uVar12 = *(undefined4 *)((uVar22 - 2) * lVar27 + img_labels.img_._16_8_ + lVar32 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar27 * uVar22 + img_labels.img_._16_8_ + lVar32 * 4) = uVar12;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
      }
      else {
        uVar23 = 0;
        if (cVar28 != '\0') goto LAB_0014301c;
        lVar27 = lVar18 * (uVar22 | 1);
        uVar21 = 0;
LAB_0013bfd9:
        lVar25 = (long)(int)uVar21;
        piVar3 = (int *)((uVar22 | 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar25 + lVar27 + (long)local_3c8) == '\0') {
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + lVar25 * 4) = 0;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
        else {
LAB_0013c004:
          uVar10 = UFPC::MemNewLabel();
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + lVar25 * 4)
               = uVar10;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
      }
LAB_0014434a:
      local_308 = local_308 + 2;
      local_350 = (long *)((long)local_350 + 2);
      local_318 = local_318 + 2;
    }
    if (local_10c == 1) {
      lVar18 = (long)(iVar20 + -1);
      lVar27 = (long)(iVar20 + -2);
      lVar32 = (long)(iVar20 + -3);
      local_328 = 0xfffffffffffffffe;
      local_308 = local_2d8;
LAB_001456fd:
      iVar20 = (int)local_328;
      lVar35 = (long)iVar20;
      local_328 = lVar35 + 2;
      if ((int)local_328 < local_2d0) {
        local_338 = *(long *)img.accesses_._72_8_;
        lVar40 = local_338 * lVar18 + img.accesses_._16_8_;
        piVar3 = (int *)(lVar40 + 8 + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        local_398 = (long *)img.img_._72_8_;
        local_360 = *(ulong *)img.img_._72_8_;
        lVar25 = local_360 * lVar18 + img.img_._16_8_;
        local_348 = img.accesses_._16_8_;
        plVar34 = (long *)img.img_._16_8_;
        lVar41 = img.accesses_._16_8_;
        if (*(char *)(lVar35 + 2 + lVar25) == '\0') {
          local_320 = (long *)img.img_._16_8_;
          local_328 = local_328 & 0xffffffff;
          goto LAB_0014590d;
        }
        lVar39 = local_338 * lVar27;
        piVar3 = (int *)(img.accesses_._16_8_ + lVar39 + 0xc + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        lVar42 = local_360 * lVar27;
        if (*(char *)(lVar35 + 3 + img.img_._16_8_ + lVar42) != '\0') {
          lVar41 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar41 * lVar32 + local_380 + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          lVar40 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + 8 + lVar35 * 4);
          piVar3 = (int *)(lVar41 * lVar18 + local_380 + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          local_3a0 = local_308;
          uVar22 = local_328;
          goto LAB_00146c3a;
        }
        piVar3 = (int *)(lVar40 + 0xc + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar25 + 3 + lVar35) != '\0') {
          local_320 = (long *)img.img_._16_8_;
LAB_00145a5c:
          uVar10 = (uint)local_328;
          uVar22 = (ulong)(int)uVar10;
          piVar3 = (int *)(lVar39 + lVar41 + 8 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          cVar28 = *(char *)(uVar22 + 2 + lVar42 + (long)plVar34);
          piVar3 = (int *)(lVar39 + lVar41 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          cVar5 = *(char *)(uVar22 + lVar42 + (long)plVar34);
          if (cVar28 != '\0') {
            if (cVar5 != '\0') goto LAB_00145a9b;
            goto LAB_00145ac5;
          }
          if (cVar5 == '\0') {
            uVar14 = UFPC::MemNewLabel();
            local_3b8 = *(long *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
            *piVar3 = *piVar3 + 1;
            goto LAB_00147006;
          }
          local_3c8 = (long *)img_labels.accesses_._72_8_;
          local_3b8 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_3b8 * lVar32 + img_labels.accesses_._16_8_ + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          local_350 = (long *)img_labels.img_._72_8_;
          lVar40 = *(long *)img_labels.img_._72_8_;
          local_330 = img_labels.img_._16_8_;
          local_318 = img_labels.accesses_._16_8_;
          local_370 = img_labels.img_._16_8_;
          local_340 = img_labels.accesses_._16_8_;
          local_388 = img_labels.img_._16_8_;
          local_380 = img_labels.accesses_._16_8_;
          local_3a0 = img_labels.img_._16_8_;
          local_390 = img_labels.accesses_._16_8_;
          local_378 = img_labels.accesses_._16_8_;
          local_368 = img_labels.accesses_._16_8_;
          local_308 = img_labels.img_._16_8_;
LAB_00145bb7:
          lVar42 = lVar40 * lVar32;
          uVar12 = *(undefined4 *)(local_308 + lVar42 + uVar22 * 4);
          lVar35 = local_3b8 * lVar18 + local_368;
          piVar3 = (int *)(lVar35 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          lVar41 = lVar40 * lVar18 + local_308;
          *(undefined4 *)(lVar41 + uVar22 * 4) = uVar12;
          lVar25 = (long)(int)uVar10;
          uVar22 = lVar25 + 2;
          if ((int)uVar22 < local_2d0) {
            lVar40 = local_338 * lVar18 + local_348;
            piVar3 = (int *)(lVar40 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar39 = local_360 * lVar18 + (long)local_320;
            if (*(char *)(lVar25 + 2 + lVar39) == '\0') {
              local_328 = uVar22 & 0xffffffff;
              local_348 = local_348;
              local_320 = local_320;
              goto LAB_00146dd0;
            }
            lVar37 = local_338 * lVar27 + local_348;
            piVar3 = (int *)(lVar37 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar38 = local_360 * lVar27 + (long)local_320;
            if (*(char *)(lVar25 + 3 + lVar38) != '\0') {
              piVar3 = (int *)(local_348 + local_338 * lVar32 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = local_360 * lVar32;
              if (*(char *)(lVar25 + 2 + (long)local_320 + lVar40) != '\0') {
                local_328 = uVar22 & 0xffffffff;
                goto LAB_001472eb;
              }
              piVar3 = (int *)(local_368 + local_3b8 * lVar32 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)(local_308 + lVar42 + 8 + lVar25 * 4);
              piVar3 = (int *)(lVar35 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar41 + lVar25 * 4));
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                               img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = *(long *)img_labels.img_._72_8_;
              local_3a0 = img_labels.img_._16_8_;
              goto LAB_00146c3a;
            }
            piVar3 = (int *)(lVar40 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar39 + 3 + lVar25) != '\0') {
              piVar3 = (int *)(lVar37 + 0x10 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar38 + 4 + lVar25) == '\0') {
                piVar3 = (int *)(lVar35 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar12 = *(undefined4 *)(lVar41 + lVar25 * 4);
                piVar3 = (int *)(lVar35 + 8 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar41 + 8 + lVar25 * 4) = uVar12;
                local_328 = uVar22;
                goto LAB_0014703b;
              }
              lVar39 = local_338 * lVar32;
              piVar3 = (int *)(local_348 + lVar39 + 0xc + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = local_360 * lVar32;
              if (*(char *)(lVar25 + 3 + (long)local_320 + lVar40) == '\0') {
                piVar3 = (int *)(local_368 + local_3b8 * lVar32 + 0x10 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)(local_308 + lVar42 + 0x10 + lVar25 * 4);
                piVar3 = (int *)(lVar35 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar41 + lVar25 * 4));
                local_3c8 = (long *)img_labels.accesses_._72_8_;
                local_3b8 = *(long *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                local_350 = (long *)img_labels.img_._72_8_;
                lVar40 = *(long *)img_labels.img_._72_8_;
                local_330 = img_labels.img_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_3a0 = img_labels.img_._16_8_;
                local_390 = img_labels.accesses_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_328 = uVar22 & 0xffffffff;
                local_368 = img_labels.accesses_._16_8_;
                local_340 = img_labels.accesses_._16_8_;
                local_308 = img_labels.img_._16_8_;
                local_310 = img_labels.accesses_._16_8_;
                goto LAB_00145e3e;
              }
              piVar3 = (int *)(local_348 + lVar39 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)((long)local_320 + lVar40 + 2 + lVar25) == '\0') {
                piVar3 = (int *)(local_368 + local_3b8 * lVar32 + 0x10 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)(local_308 + lVar42 + 0x10 + lVar25 * 4);
                piVar3 = (int *)(lVar35 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar41 + lVar25 * 4));
                local_3b8 = *(long *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                lVar40 = *(long *)img_labels.img_._72_8_;
                goto LAB_00146d65;
              }
              local_328 = uVar22 & 0xffffffff;
LAB_00147489:
              iVar20 = (int)local_328;
              uVar22 = (ulong)iVar20;
              piVar3 = (int *)(lVar39 + local_348 + -4 + uVar22 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = (long)(iVar20 + 2);
              if (*(char *)((uVar22 - 1) + lVar40 + (long)local_320) != '\0') {
                piVar3 = (int *)(local_390 + *local_3c8 * lVar32 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)(local_3a0 + *local_350 * lVar32 + lVar35 * 4);
                local_3b8 = *local_3c8;
                piVar3 = (int *)(local_3b8 * lVar18 + local_380 + uVar22 * 4);
                *piVar3 = *piVar3 + 1;
                lVar40 = *local_350;
                local_368 = local_380;
                local_308 = local_388;
                local_310 = local_318;
                local_3a0 = local_388;
                local_390 = local_380;
                local_378 = local_380;
                goto LAB_00145e3e;
              }
              lVar41 = *local_3c8;
              piVar3 = (int *)(lVar41 * lVar32 + local_380 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = *local_350;
              uVar10 = *(uint *)(lVar40 * lVar32 + local_388 + lVar35 * 4);
              uVar22 = (ulong)iVar20;
              piVar3 = (int *)(lVar41 * lVar18 + local_380 + -8 + uVar22 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar40 * lVar18 + local_388 + -8 + uVar22 * 4
                                                      ));
              local_3b8 = *(long *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = *(long *)img_labels.img_._72_8_;
LAB_001485b7:
              local_330 = img_labels.img_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_3a0 = img_labels.img_._16_8_;
              local_390 = img_labels.accesses_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_368 = img_labels.accesses_._16_8_;
              local_340 = img_labels.accesses_._16_8_;
              local_308 = img_labels.img_._16_8_;
              local_310 = img_labels.accesses_._16_8_;
              local_3c8 = (long *)img_labels.accesses_._72_8_;
              local_350 = (long *)img_labels.img_._72_8_;
LAB_00145e3e:
              *(uint *)(lVar40 * lVar18 + local_308 + uVar22 * 4) = uVar10;
              iVar20 = (int)local_328;
              lVar39 = (long)iVar20;
              lVar25 = lVar39 << 0x20;
              lVar35 = lVar39 * 4;
              lVar42 = 0;
              local_318 = local_368;
              while( true ) {
                lVar37 = local_318;
                uVar21 = lVar39 + lVar42 + 2;
                lVar41 = lVar25 >> 0x1e;
                local_398 = (long *)img.img_._72_8_;
                local_320 = (long *)img.img_._16_8_;
                if (lVar15 <= (long)uVar21) {
                  uVar22 = (ulong)(iVar20 + 2) + lVar42;
                  if (local_2d0 < (int)uVar22) goto LAB_0014866e;
                  lVar15 = *(long *)img.accesses_._72_8_;
                  lVar39 = lVar15 * lVar18 + img.accesses_._16_8_;
                  piVar3 = (int *)((lVar25 + 0x200000000 >> 0x1e) + lVar39);
                  *piVar3 = *piVar3 + 1;
                  lVar42 = lVar25 + 0x200000000 >> 0x20;
                  lVar35 = *(long *)img.img_._72_8_;
                  lVar37 = lVar35 * lVar18 + img.img_._16_8_;
                  if (*(char *)(lVar42 + lVar37) == '\0') {
                    piVar3 = (int *)(lVar39 + (lVar25 + 0x300000000 >> 0x1e));
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar37 + (lVar25 + 0x300000000 >> 0x20)) == '\0') {
                      piVar3 = (int *)(local_318 + local_3b8 * lVar18 + lVar42 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)(local_308 + lVar40 * lVar18 + lVar42 * 4) = 0;
                      goto LAB_001499b8;
                    }
                  }
                  else {
                    piVar3 = (int *)((lVar25 + 0x300000000 >> 0x1e) +
                                    img.accesses_._16_8_ + lVar15 * lVar27);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)((lVar25 + 0x300000000 >> 0x20) + img.img_._16_8_ + lVar35 * lVar27
                                 ) == '\0') {
                      local_318 = local_318 + local_3b8 * lVar18;
                      piVar3 = (int *)(lVar41 + local_318);
                      *piVar3 = *piVar3 + 1;
                      local_308 = local_308 + lVar40 * lVar18;
                      uVar12 = *(undefined4 *)(lVar41 + local_308);
                      piVar3 = (int *)(local_318 + lVar42 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)(local_308 + lVar42 * 4) = uVar12;
                      goto LAB_001499b8;
                    }
                  }
                  piVar3 = (int *)(local_3b8 * lVar32 + local_318 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)(lVar32 * lVar40 + local_308 + lVar42 * 4);
                  piVar3 = (int *)(local_3b8 * lVar18 + local_318 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar40 * lVar18 + local_308 + lVar42 * 4) = uVar12;
                  goto LAB_001499b8;
                }
                local_338 = *(long *)img.accesses_._72_8_;
                lVar33 = local_338 * lVar18 + img.accesses_._16_8_;
                lVar38 = lVar33 + lVar35;
                piVar3 = (int *)(lVar38 + 8 + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                local_360 = *(ulong *)img.img_._72_8_;
                lVar24 = local_360 * lVar18 + img.img_._16_8_;
                lVar30 = lVar24 + lVar39;
                if (*(char *)(lVar42 + 2 + lVar30) == '\0') {
                  local_348 = img.accesses_._16_8_;
                  local_328 = (ulong)(iVar20 + 2) + lVar42;
                  uVar10 = (uint)local_328;
                  piVar3 = (int *)(lVar33 + (lVar25 + 0x300000000 >> 0x1e));
                  *piVar3 = *piVar3 + 1;
                  lVar35 = lVar25 + 0x300000000 >> 0x20;
                  uVar22 = lVar39 + 2 + lVar42;
                  plVar34 = (long *)img.img_._16_8_;
                  lVar41 = img.accesses_._16_8_;
                  if (*(char *)(lVar24 + lVar35) == '\0') {
                    local_3b8 = *local_3c8;
                    piVar3 = (int *)(local_3b8 * lVar18 + local_340 + lVar39 * 4 + 8 + lVar42 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_318 = local_310;
                    local_368 = local_340;
                    local_3a0 = local_370;
                    goto LAB_001466a5;
                  }
                  lVar38 = local_338 * lVar27 + img.accesses_._16_8_;
                  piVar3 = (int *)(lVar38 + lVar35 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar30 = local_360 * lVar27 + img.img_._16_8_;
                  if (*(char *)(lVar35 + lVar30) != '\0') {
                    piVar3 = (int *)(local_3b8 * lVar32 + local_318 + lVar39 * 4 + 8 + lVar42 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_318 = local_310;
                    goto LAB_00146e87;
                  }
                  piVar3 = (int *)(lVar38 + (lVar25 + 0x400000000 >> 0x1e));
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar30 + (lVar25 + 0x400000000 >> 0x20)) != '\0') goto LAB_00145a9b;
                  piVar3 = (int *)(local_318 + local_3b8 * lVar32 + lVar39 * 4 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_318 = local_310;
                  local_368 = local_368;
                  goto LAB_00145bb7;
                }
                lVar37 = local_338 * lVar27 + img.accesses_._16_8_ + lVar35;
                piVar3 = (int *)(lVar37 + 0xc + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                lVar33 = local_360 * lVar27 + img.img_._16_8_ + lVar39;
                iVar36 = (int)lVar42;
                if (*(char *)(lVar42 + 3 + lVar33) != '\0') {
                  piVar3 = (int *)(local_3b8 * lVar32 + local_318 + lVar39 * 4 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_328 = (ulong)(iVar20 + iVar36 + 2);
                  uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + lVar39 * 4 + 8 + lVar42 * 4);
                  piVar3 = (int *)(local_3b8 * lVar18 + local_318 + lVar39 * 4 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  goto LAB_001479b1;
                }
                piVar3 = (int *)(lVar38 + 0xc + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar42 + 3 + lVar30) == '\0') {
                  lVar35 = local_3b8 * lVar18 + local_318;
                  piVar3 = (int *)(lVar41 + lVar35);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = lVar40 * lVar18 + local_308;
                  uVar12 = *(undefined4 *)(lVar41 + lVar40);
                  piVar3 = (int *)(lVar35 + lVar39 * 4 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_328 = (ulong)(iVar20 + iVar36 + 2);
                  *(undefined4 *)(lVar40 + lVar39 * 4 + 8 + lVar42 * 4) = uVar12;
                  local_380 = local_318;
                  goto LAB_001456fd;
                }
                piVar3 = (int *)(lVar37 + 0x10 + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar42 + 4 + lVar33) == '\0') break;
                piVar3 = (int *)(img.accesses_._16_8_ + lVar35 + local_338 * lVar32 + 0xc +
                                lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                cVar28 = *(char *)(lVar42 + 3 + img.img_._16_8_ + lVar39 + local_360 * lVar32);
                piVar3 = (int *)(local_3b8 * lVar32 + local_318 + lVar35 + 0x10 + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                lVar37 = local_3b8 * lVar18 + local_318;
                lVar41 = lVar40 * lVar18 + local_308;
                uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + lVar35 + 0x10 + lVar42 * 4);
                if (cVar28 == '\0') {
                  piVar3 = (int *)(lVar37 + lVar35 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar41 + lVar35 + lVar42 * 4));
                  local_3c8 = (long *)img_labels.accesses_._72_8_;
                  local_3b8 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + lVar35 + 8 +
                                  lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_350 = (long *)img_labels.img_._72_8_;
                  lVar40 = *(long *)img_labels.img_._72_8_;
                  lVar41 = lVar40 * lVar18 + img_labels.img_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_340 = img_labels.accesses_._16_8_;
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_3a0 = img_labels.img_._16_8_;
                  local_390 = img_labels.accesses_._16_8_;
                  local_330 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_368 = img_labels.accesses_._16_8_;
                  local_310 = img_labels.accesses_._16_8_;
                  local_318 = img_labels.accesses_._16_8_;
                  local_308 = img_labels.img_._16_8_;
                }
                else {
                  piVar3 = (int *)(lVar37 + lVar35 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                }
                *(uint *)(lVar41 + lVar35 + 8 + lVar42 * 4) = uVar10;
                lVar25 = lVar25 + 0x200000000;
                lVar42 = lVar42 + 2;
              }
              local_318 = local_318 + local_3b8 * lVar18;
              piVar3 = (int *)(lVar41 + local_318);
              *piVar3 = *piVar3 + 1;
              local_308 = local_308 + lVar40 * lVar18;
              uVar12 = *(undefined4 *)(lVar41 + local_308);
              piVar3 = (int *)(local_318 + lVar39 * 4 + 8 + lVar42 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar39 * 4 + local_308 + 8 + lVar42 * 4) = uVar12;
              local_328 = (ulong)(iVar20 + iVar36 + 2);
LAB_0014703b:
              do {
                local_398 = (long *)img.img_._72_8_;
                local_3c8 = (long *)img_labels.accesses_._72_8_;
                local_330 = img_labels.img_._16_8_;
                local_350 = (long *)img_labels.img_._72_8_;
                iVar20 = (int)local_328;
                lVar37 = (long)iVar20;
                local_360 = lVar37 << 0x20;
                local_348 = img.accesses_._16_8_;
                lVar35 = img.accesses_._16_8_ + lVar37 * 4;
                local_320 = (long *)img.img_._16_8_;
                lVar41 = img.img_._16_8_ + lVar37;
                lVar25 = img_labels.img_._16_8_ + lVar37 * 4;
                lVar42 = img_labels.accesses_._16_8_ + lVar37 * 4;
                lVar38 = 0;
                while( true ) {
                  uVar21 = lVar37 + lVar38 + 2;
                  lVar33 = (long)local_360 >> 0x1e;
                  lVar30 = (long)local_360 >> 0x20;
                  local_368 = img_labels.accesses_._16_8_;
                  local_308 = img_labels.img_._16_8_;
                  if (lVar15 <= (long)uVar21) {
                    uVar22 = (ulong)(iVar20 + 2) + lVar38;
                    if (local_2d0 < (int)uVar22) goto LAB_0014866e;
                    lVar35 = (long)(local_360 + 0x200000000) >> 0x20;
                    piVar3 = (int *)(((long)(local_360 + 0x200000000) >> 0x1e) +
                                    *(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    uVar21 = *(ulong *)img.img_._72_8_;
                    lVar15 = uVar21 * lVar18;
                    if (*(char *)(lVar35 + img.img_._16_8_ + lVar15) == '\0') {
                      goto LAB_00148d28;
                    }
                    piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                                    *(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(((long)(local_360 + 0x300000000) >> 0x20) +
                                 img.img_._16_8_ + uVar21 * lVar27) == '\0') {
                      lVar32 = img_labels.accesses_._16_8_ +
                               *(long *)img_labels.accesses_._72_8_ * lVar18;
                      piVar3 = (int *)(lVar33 + lVar32);
                      *piVar3 = *piVar3 + 1;
                      lVar15 = img_labels.img_._16_8_ + lVar18 * *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar33 + lVar15);
                      piVar3 = (int *)(lVar32 + lVar35 * 4);
                      *piVar3 = *piVar3 + 1;
                      goto LAB_00148e42;
                    }
                    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ +
                                    lVar35 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar15 = *(long *)img.img_._72_8_;
                    if (*(char *)(lVar35 + lVar15 * lVar32 + img.img_._16_8_) == '\0') {
                      lVar15 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar15 * lVar32 + img_labels.accesses_._16_8_ + lVar35 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar27 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + lVar35 * 4);
                      piVar3 = (int *)(lVar33 + lVar15 * lVar18 + img_labels.accesses_._16_8_);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(lVar33 + lVar27 * lVar18 + img_labels.img_._16_8_);
                    }
                    else {
                      piVar3 = (int *)(lVar33 + lVar27 * *(long *)img.accesses_._72_8_ +
                                                img.accesses_._16_8_);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar30 + img.img_._16_8_ + lVar15 * lVar27) != '\0')
                      goto LAB_001489c7;
                      lVar15 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar15 * lVar32 + img_labels.accesses_._16_8_ + lVar35 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar27 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + lVar35 * 4);
                      piVar3 = (int *)(lVar15 * lVar18 + img_labels.accesses_._16_8_ + lVar30 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(lVar27 * lVar18 + img_labels.img_._16_8_ + lVar30 * 4);
                    }
                    goto LAB_00149866;
                  }
                  local_338 = *(long *)img.accesses_._72_8_;
                  lVar39 = local_338 * lVar18 + lVar35;
                  piVar3 = (int *)(lVar39 + 8 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = *(long *)img.img_._72_8_;
                  lVar24 = lVar40 * lVar18 + lVar41;
                  local_318 = img_labels.accesses_._16_8_;
                  if (*(char *)(lVar38 + 2 + lVar24) == '\0') {
                    local_328 = (ulong)(iVar20 + (int)lVar38 + 2);
                    local_3a0 = img_labels.img_._16_8_;
                    local_390 = img_labels.accesses_._16_8_;
                    local_388 = local_3a0;
                    local_380 = local_390;
                    local_378 = local_390;
                    local_370 = local_3a0;
                    local_360 = lVar40;
                    local_340 = local_390;
                    local_308 = local_3a0;
                    goto LAB_00146dd0;
                  }
                  lVar1 = local_338 * lVar27 + lVar35;
                  piVar3 = (int *)(lVar1 + 0xc + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar2 = img.img_._16_8_ + lVar40 * lVar27;
                  lVar31 = lVar40 * lVar27 + lVar41;
                  if (*(char *)(lVar38 + 3 + lVar31) != '\0') break;
                  piVar3 = (int *)(lVar39 + 0xc + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_380 = img_labels.accesses_._16_8_;
                  if (*(char *)(lVar38 + 3 + lVar24) == '\0') {
                    lVar35 = *(long *)img_labels.accesses_._72_8_ * lVar18 +
                             img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar33 + lVar35);
                    *piVar3 = *piVar3 + 1;
                    lVar41 = *(long *)img_labels.img_._72_8_ * lVar18 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar33 + lVar41);
                    piVar3 = (int *)(lVar35 + lVar37 * 4 + 8 + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_328 = (ulong)(iVar20 + (int)lVar38 + 2);
                    *(undefined4 *)(lVar41 + lVar37 * 4 + 8 + lVar38 * 4) = uVar12;
                    goto LAB_001456fd;
                  }
                  piVar3 = (int *)(lVar1 + 0x10 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar38 + 4 + lVar31) != '\0') {
                    local_328 = (ulong)(iVar20 + 2) + lVar38;
                    lVar39 = local_338 * lVar32;
                    piVar3 = (int *)(lVar35 + lVar39 + 0xc + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = lVar40 * lVar32;
                    uVar22 = lVar37 + 2 + lVar38;
                    if (*(char *)(lVar38 + 3 + lVar41 + lVar40) == '\0') {
                      lVar35 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 0x10 + lVar38 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar41 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 0x10 + lVar38 * 4);
                      piVar3 = (int *)(lVar33 + img_labels.accesses_._16_8_ + lVar35 * lVar18);
                      *piVar3 = *piVar3 + 1;
                      uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar33 + img_labels.img_._16_8_ +
                                                                        lVar41 * lVar18));
                      local_3b8 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + lVar37 * 4
                                       + 8 + lVar38 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar40 = *(long *)img_labels.img_._72_8_;
                      local_368 = img_labels.accesses_._16_8_;
                      local_340 = img_labels.accesses_._16_8_;
                      local_308 = img_labels.img_._16_8_;
                      local_310 = img_labels.accesses_._16_8_;
                      local_3c8 = (long *)img_labels.accesses_._72_8_;
                      local_3a0 = img_labels.img_._16_8_;
                      local_390 = img_labels.accesses_._16_8_;
                      local_388 = img_labels.img_._16_8_;
                      local_380 = img_labels.accesses_._16_8_;
                      local_378 = img_labels.accesses_._16_8_;
                      local_370 = img_labels.img_._16_8_;
                      local_350 = (long *)img_labels.img_._72_8_;
                      local_330 = img_labels.img_._16_8_;
                      goto LAB_00145e3e;
                    }
                    piVar3 = (int *)(lVar35 + lVar39 + 8 + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar38 + 2 + lVar41 + lVar40) == '\0') {
                      lVar35 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 0x10 + lVar38 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar41 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 0x10 + lVar38 * 4);
                      piVar3 = (int *)(lVar33 + img_labels.accesses_._16_8_ + lVar35 * lVar18);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(lVar33 + img_labels.img_._16_8_ + lVar41 * lVar18);
                    }
                    else {
                      piVar3 = (int *)(local_338 * lVar27 + img.accesses_._16_8_ + lVar33);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar2 + lVar30) != '\0') {
                        local_370 = img_labels.img_._16_8_;
                        local_3a0 = img_labels.img_._16_8_;
                        local_390 = img_labels.accesses_._16_8_;
                        local_388 = img_labels.img_._16_8_;
                        local_340 = img_labels.accesses_._16_8_;
                        goto LAB_00147489;
                      }
                      lVar35 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 0x10 + lVar38 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar41 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 0x10 + lVar38 * 4);
                      piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar35 * lVar18 + lVar30 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(img_labels.img_._16_8_ + lVar41 * lVar18 + lVar30 * 4);
                    }
                    uVar10 = UFPC::MemMerge(uVar10,uVar14);
                    local_3b8 = *(long *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + lVar37 * 4 +
                                     8 + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *(long *)img_labels.img_._72_8_;
                    local_368 = img_labels.accesses_._16_8_;
                    local_340 = img_labels.accesses_._16_8_;
                    local_308 = img_labels.img_._16_8_;
                    local_310 = img_labels.accesses_._16_8_;
                    local_3c8 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.img_._16_8_;
                    local_390 = img_labels.accesses_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_350 = (long *)img_labels.img_._72_8_;
                    local_330 = img_labels.img_._16_8_;
                    goto LAB_00145e3e;
                  }
                  lVar40 = *(long *)img_labels.accesses_._72_8_ * lVar18 + lVar42;
                  piVar3 = (int *)(lVar40 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar39 = *(long *)img_labels.img_._72_8_ * lVar18 + lVar25;
                  uVar12 = *(undefined4 *)(lVar39 + lVar38 * 4);
                  piVar3 = (int *)(lVar40 + 8 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar39 + 8 + lVar38 * 4) = uVar12;
                  local_360 = local_360 + 0x200000000;
                  lVar38 = lVar38 + 2;
                }
                local_328 = (ulong)(iVar20 + 2) + lVar38;
                piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ +
                                 lVar37 * 4 + 8 + lVar38 * 4);
                *piVar3 = *piVar3 + 1;
                lVar40 = lVar40 * lVar32;
                if (*(char *)(lVar38 + 2 + lVar41 + lVar40) == '\0') {
                  lVar35 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 8 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar41 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 8 + lVar38 * 4);
                  piVar3 = (int *)(lVar33 + img_labels.accesses_._16_8_ + lVar35 * lVar18);
                  *piVar3 = *piVar3 + 1;
                  uVar14 = *(uint *)(lVar33 + img_labels.img_._16_8_ + lVar41 * lVar18);
LAB_00147761:
                  uVar10 = UFPC::MemMerge(uVar10,uVar14);
                  piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                                   img_labels.accesses_._16_8_ + lVar37 * 4 + 8 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = *(long *)img_labels.img_._72_8_;
                  local_328 = local_328 & 0xffffffff;
                  local_308 = img_labels.img_._16_8_;
                }
                else {
                  piVar3 = (int *)(lVar33 + *(long *)img.accesses_._72_8_ * lVar27 +
                                            img.accesses_._16_8_);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar2 + lVar30) == '\0') {
                    lVar35 = *(long *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 8 + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar41 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 8 + lVar38 * 4);
                    piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar35 * lVar18 + lVar30 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar14 = *(uint *)(img_labels.img_._16_8_ + lVar41 * lVar18 + lVar30 * 4);
                    goto LAB_00147761;
                  }
LAB_001472eb:
                  uVar21 = (ulong)(int)local_328;
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ +
                                   -4 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)((uVar21 - 1) + lVar40 + (long)local_320) == '\0') {
                    lVar35 = local_368 + *local_3c8 * lVar32;
                    uVar21 = (ulong)(int)local_328;
                    piVar3 = (int *)(lVar35 + -8 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_308 = local_308 + *local_350 * lVar32;
                    uVar10 = *(uint *)(local_308 + -8 + uVar21 * 4);
                    piVar3 = (int *)(lVar35 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_308 + uVar21 * 4));
                    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                                     img_labels.accesses_._16_8_ + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *(long *)img_labels.img_._72_8_;
                    local_308 = img_labels.img_._16_8_;
                  }
                  else {
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + uVar21 * 4);
                    piVar3 = (int *)(lVar35 * lVar18 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                  }
                }
LAB_001479b1:
                *(uint *)(lVar40 * lVar18 + local_308 + uVar21 * 4) = uVar10;
                local_320 = (long *)img.img_._16_8_;
                local_398 = (long *)img.img_._72_8_;
                local_3c8 = (long *)img_labels.accesses_._72_8_;
                local_350 = (long *)img_labels.img_._72_8_;
                iVar20 = (int)local_328;
                lVar41 = (long)iVar20;
                lVar35 = lVar41 << 0x20;
                local_348 = img.accesses_._16_8_;
                lVar39 = img.accesses_._16_8_ + lVar41 * 4 + 8;
                local_318 = img_labels.accesses_._16_8_;
                lVar40 = img_labels.accesses_._16_8_ + lVar41 * 4 + 8;
                lVar42 = img_labels.img_._16_8_ + lVar41 * 4 + 8;
                lVar25 = 0;
LAB_00147a5f:
                uVar22 = lVar41 + lVar25 + 2;
                lVar37 = lVar35 >> 0x1e;
                local_368 = img_labels.accesses_._16_8_;
                local_308 = img_labels.img_._16_8_;
                local_3a0 = img_labels.img_._16_8_;
                if (lVar15 <= (long)uVar22) {
                  local_328 = (ulong)(iVar20 + 2) + lVar25;
                  uVar10 = (uint)local_328;
                  if (local_2d0 < (int)uVar10) {
                    lVar15 = *(long *)img.accesses_._72_8_;
                    lVar40 = lVar15 * lVar18 + img.accesses_._16_8_;
                    piVar3 = (int *)((lVar35 + 0x200000000 >> 0x1e) + lVar40);
                    *piVar3 = *piVar3 + 1;
                    uVar22 = lVar35 + 0x200000000 >> 0x20;
                    lVar41 = *(long *)img.img_._72_8_;
                    lVar25 = lVar41 * lVar18 + img.img_._16_8_;
                    if (*(char *)(uVar22 + lVar25) == '\0') {
                      piVar3 = (int *)(img_labels.accesses_._16_8_ +
                                       *(long *)img_labels.accesses_._72_8_ * lVar18 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)
                       (img_labels.img_._16_8_ + lVar18 * *(long *)img_labels.img_._72_8_ +
                       uVar22 * 4) = 0;
                      goto LAB_001499b8;
                    }
                    piVar3 = (int *)(lVar40 + (lVar35 + 0x100000000 >> 0x1e));
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar25 + (lVar35 + 0x100000000 >> 0x20)) != '\0') {
                      lVar32 = img_labels.accesses_._16_8_ +
                               *(long *)img_labels.accesses_._72_8_ * lVar18;
                      piVar3 = (int *)(lVar37 + lVar32);
                      *piVar3 = *piVar3 + 1;
                      lVar15 = img_labels.img_._16_8_ + lVar18 * *(long *)img_labels.img_._72_8_;
                      uVar12 = *(undefined4 *)(lVar37 + lVar15);
                      piVar3 = (int *)(lVar32 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)(lVar15 + uVar22 * 4) = uVar12;
                      goto LAB_001499b8;
                    }
                    lVar15 = lVar15 * lVar27;
                    lVar41 = lVar41 * lVar27;
                  }
                  else {
                    local_338 = *(long *)img.accesses_._72_8_;
                    uVar22 = lVar35 + 0x200000000 >> 0x20;
                    piVar3 = (int *)((lVar35 + 0x200000000 >> 0x1e) +
                                    local_338 * lVar18 + img.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    local_360 = *(ulong *)img.img_._72_8_;
                    lVar15 = local_360 * lVar18 + img.img_._16_8_;
                    if (*(char *)(uVar22 + lVar15) == '\0') {
                      local_348 = img.accesses_._16_8_;
                      goto LAB_0014968f;
                    }
                    piVar3 = (int *)((lVar35 + 0x100000000 >> 0x1e) +
                                    *(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar15 + (lVar35 + 0x100000000 >> 0x20)) != '\0')
                    goto LAB_00148b1e;
                    lVar15 = *(long *)img.accesses_._72_8_ * lVar27;
                    piVar3 = (int *)((lVar35 + 0x300000000 >> 0x1e) + img.accesses_._16_8_ + lVar15)
                    ;
                    *piVar3 = *piVar3 + 1;
                    lVar41 = *(long *)img.img_._72_8_ * lVar27;
                    if (*(char *)((lVar35 + 0x300000000 >> 0x20) + img.img_._16_8_ + lVar41) != '\0'
                       ) {
                      piVar3 = (int *)(lVar27 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_
                                      + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(img.img_._16_8_ + lVar41 + uVar22) != '\0') goto LAB_00149064;
LAB_00149027:
                      piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_
                                      + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(uVar22 + *(long *)img.img_._72_8_ * lVar32 + img.img_._16_8_) ==
                          '\0') {
                        lVar15 = local_368 + *local_3c8 * lVar32;
                        piVar3 = (int *)(lVar15 + -8 + (long)(int)uVar10 * 4);
                        *piVar3 = *piVar3 + 1;
                        local_3a0 = local_3a0 + lVar32 * *local_350;
                        uVar10 = *(uint *)(local_3a0 + -8 + (long)(int)uVar10 * 4);
                        piVar3 = (int *)(lVar15 + uVar22 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_3a0 + uVar22 * 4));
                        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                                         img_labels.accesses_._16_8_ + uVar22 * 4);
                        *piVar3 = *piVar3 + 1;
                        *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_
                                 + uVar22 * 4) = uVar10;
                      }
                      else {
LAB_00149064:
                        lVar15 = *local_3c8;
                        piVar3 = (int *)(lVar15 * lVar32 + local_368 + uVar22 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar27 = *local_350;
                        uVar12 = *(undefined4 *)(lVar32 * lVar27 + local_3a0 + uVar22 * 4);
                        piVar3 = (int *)(lVar15 * lVar18 + local_368 + uVar22 * 4);
                        *piVar3 = *piVar3 + 1;
LAB_001495da:
                        *(undefined4 *)(lVar27 * lVar18 + local_3a0 + uVar22 * 4) = uVar12;
                      }
                      goto LAB_001499b8;
                    }
                  }
                  piVar3 = (int *)(lVar15 + img.accesses_._16_8_ + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar15 = *(long *)img_labels.accesses_._72_8_;
                  lVar27 = lVar15 * lVar32 + img_labels.accesses_._16_8_;
                  if (*(char *)(uVar22 + lVar41 + img.img_._16_8_) == '\0') {
                    piVar3 = (int *)(lVar27 + lVar37);
                    *piVar3 = *piVar3 + 1;
                    lVar27 = *(long *)img_labels.img_._72_8_;
                    uVar12 = *(undefined4 *)(lVar37 + lVar32 * lVar27 + img_labels.img_._16_8_);
                  }
                  else {
                    piVar3 = (int *)(lVar27 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar27 = *(long *)img_labels.img_._72_8_;
                    uVar12 = *(undefined4 *)(lVar32 * lVar27 + img_labels.img_._16_8_ + uVar22 * 4);
                  }
                  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar15 * lVar18 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  goto LAB_001495da;
                }
                local_338 = *(long *)img.accesses_._72_8_;
                lVar38 = lVar39 + local_338 * lVar18;
                piVar3 = (int *)(lVar38 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                local_360 = *(ulong *)img.img_._72_8_;
                lVar30 = local_360 * lVar18 + img.img_._16_8_ + lVar41;
                iVar36 = (int)lVar25;
                if (*(char *)(lVar25 + 2 + lVar30) == '\0') {
                  local_328 = (ulong)(iVar20 + iVar36 + 2);
                  plVar34 = (long *)img.img_._16_8_;
                  lVar41 = img.accesses_._16_8_;
                  goto LAB_0014590d;
                }
                piVar3 = (int *)(lVar38 + -4 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar25 + 1 + lVar30) == '\0') {
                  lVar24 = local_338 * lVar27;
                  lVar38 = lVar39 + lVar24;
                  piVar3 = (int *)(lVar38 + 4 + lVar25 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar33 = img.img_._16_8_ + lVar41 + local_360 * lVar27;
                  if (*(char *)(lVar25 + 3 + lVar33) == '\0') {
                    lVar40 = img.accesses_._16_8_ + lVar41 * 4;
                    piVar3 = (int *)(local_338 * lVar18 + lVar40 + 0xc + lVar25 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_328 = (ulong)(iVar20 + 2) + lVar25;
                    uVar10 = (uint)local_328;
                    if (*(char *)(lVar25 + 3 + lVar30) == '\0') {
                      piVar3 = (int *)(lVar40 + lVar24 + 8 + lVar25 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar35 = *(long *)img_labels.accesses_._72_8_;
                      local_380 = img_labels.accesses_._16_8_;
                      if (*(char *)(lVar25 + 2 + lVar33) == '\0') {
                        piVar3 = (int *)(lVar35 * lVar32 + img_labels.accesses_._16_8_ + lVar37);
                        *piVar3 = *piVar3 + 1;
                        lVar40 = *(long *)img_labels.img_._72_8_;
                        uVar12 = *(undefined4 *)(lVar37 + lVar40 * lVar32 + img_labels.img_._16_8_);
                        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 + lVar35 * lVar18
                                         + 8 + lVar25 * 4);
                        *piVar3 = *piVar3 + 1;
                        *(undefined4 *)
                         (img_labels.img_._16_8_ + lVar41 * 4 + lVar40 * lVar18 + 8 + lVar25 * 4) =
                             uVar12;
                      }
                      else {
                        lVar40 = img_labels.accesses_._16_8_ + lVar41 * 4;
                        piVar3 = (int *)(lVar35 * lVar32 + lVar40 + 8 + lVar25 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar42 = *(long *)img_labels.img_._72_8_;
                        lVar41 = img_labels.img_._16_8_ + lVar41 * 4;
                        uVar12 = *(undefined4 *)(lVar42 * lVar32 + lVar41 + 8 + lVar25 * 4);
                        piVar3 = (int *)(lVar35 * lVar18 + lVar40 + 8 + lVar25 * 4);
                        *piVar3 = *piVar3 + 1;
                        *(undefined4 *)(lVar42 * lVar18 + lVar41 + 8 + lVar25 * 4) = uVar12;
                      }
                      goto LAB_001456fd;
                    }
                    piVar3 = (int *)(img.accesses_._16_8_ + lVar24 + (lVar35 + 0x400000000 >> 0x1e))
                    ;
                    *piVar3 = *piVar3 + 1;
                    cVar28 = *(char *)(local_360 * lVar27 + img.img_._16_8_ +
                                      (lVar35 + 0x400000000 >> 0x20));
                    piVar3 = (int *)(lVar40 + lVar24 + 8 + lVar25 * 4);
                    *piVar3 = *piVar3 + 1;
                    cVar5 = *(char *)(lVar25 + 2 + lVar33);
                    if (cVar28 == '\0') {
                      local_3b8 = *(long *)img_labels.accesses_._72_8_;
                      local_330 = img_labels.img_._16_8_;
                      if (cVar5 == '\0') {
                        piVar3 = (int *)(local_3b8 * lVar32 + img_labels.accesses_._16_8_ + lVar37);
                        *piVar3 = *piVar3 + 1;
                        lVar40 = *(long *)img_labels.img_._72_8_;
                        uVar14 = *(uint *)(lVar37 + lVar40 * lVar32 + img_labels.img_._16_8_);
                        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 +
                                         local_3b8 * lVar18 + 8 + lVar25 * 4);
                        *piVar3 = *piVar3 + 1;
                        goto LAB_00146b24;
                      }
                      piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 + local_3b8 * lVar32
                                       + 8 + lVar25 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar40 = *(long *)img_labels.img_._72_8_;
                      local_370 = img_labels.img_._16_8_;
                      local_340 = img_labels.accesses_._16_8_;
                      local_388 = img_labels.img_._16_8_;
                      local_380 = img_labels.accesses_._16_8_;
                      local_390 = img_labels.accesses_._16_8_;
                      local_378 = img_labels.accesses_._16_8_;
                      goto LAB_00145bb7;
                    }
                    if (cVar5 != '\0') goto LAB_00145a9b;
                    local_330 = img_labels.img_._16_8_;
                    local_388 = img_labels.img_._16_8_;
LAB_001482a6:
                    uVar22 = (ulong)(int)local_328;
                    local_348 = local_338 * lVar32 + local_348;
                    piVar3 = (int *)(local_348 + 4 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar35 = local_360 * lVar32 + (long)local_320;
                    if (*(char *)(uVar22 + 1 + lVar35) == '\0') {
                      lVar35 = local_368 + *local_3c8 * lVar32;
                      uVar22 = (ulong)(int)local_328;
                      piVar3 = (int *)(lVar35 + -8 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_388 = local_388 + *local_350 * lVar32;
                      uVar10 = *(uint *)(local_388 + -8 + uVar22 * 4);
                      piVar3 = (int *)(lVar35 + 8 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(local_388 + 8 + uVar22 * 4);
                      goto LAB_00145dc0;
                    }
                    piVar3 = (int *)(local_348 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_3b8 = *local_3c8;
                    lVar41 = local_3b8 * lVar32 + local_368;
                    if (*(char *)(lVar35 + uVar22) == '\0') {
                      piVar3 = (int *)(lVar41 + -8 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_388 = local_388 + *local_350 * lVar32;
                      uVar10 = *(uint *)(local_388 + -8 + uVar22 * 4);
                      piVar3 = (int *)(lVar41 + 8 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(local_388 + 8 + uVar22 * 4);
                      goto LAB_00145dc0;
                    }
                    piVar3 = (int *)(lVar41 + 8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_388 + 8 + uVar22 * 4);
                    piVar3 = (int *)(local_3b8 * lVar18 + local_368 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_340 = local_368;
                    local_308 = local_388;
                    local_310 = local_318;
                    local_3a0 = local_388;
                    local_390 = local_368;
                    local_380 = local_368;
                    local_378 = local_368;
                    local_370 = local_388;
                    goto LAB_00145e3e;
                  }
                  piVar3 = (int *)(lVar38 + lVar25 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar25 + 2 + lVar33) != '\0') goto code_r0x00147b01;
                  local_328 = (ulong)(iVar20 + iVar36 + 2);
                  uVar22 = lVar35 + 0x200000000 >> 0x20;
LAB_00147e84:
                  piVar3 = (int *)(local_338 * lVar32 + local_348 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar21 = uVar22;
                  if (*(char *)(uVar22 + local_360 * lVar32 + (long)local_320) == '\0') {
                    lVar35 = local_368 + *local_3c8 * lVar32;
                    piVar3 = (int *)(lVar35 + -8 + (long)(int)local_328 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_3a0 = local_3a0 + *local_350 * lVar32;
                    uVar10 = *(uint *)(local_3a0 + -8 + (long)(int)local_328 * 4);
                    piVar3 = (int *)(lVar35 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar14 = *(uint *)(local_3a0 + uVar22 * 4);
LAB_0014810a:
                    uVar10 = UFPC::MemMerge(uVar10,uVar14);
                    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                                     img_labels.accesses_._16_8_ + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *(long *)img_labels.img_._72_8_;
                    local_308 = img_labels.img_._16_8_;
                  }
                  else {
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_368 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_3a0 + uVar22 * 4);
                    piVar3 = (int *)(lVar35 * lVar18 + local_368 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_308 = local_3a0;
                  }
                  goto LAB_001479b1;
                }
                local_328 = (ulong)(iVar20 + iVar36 + 2);
                local_330 = img_labels.img_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_340 = img_labels.accesses_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_390 = img_labels.accesses_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
LAB_00147c01:
                iVar20 = (int)local_328;
                uVar21 = (ulong)iVar20;
                lVar35 = local_338 * lVar27 + local_348;
                piVar3 = (int *)(lVar35 + 4 + uVar21 * 4);
                *piVar3 = *piVar3 + 1;
                lVar41 = local_360 * lVar27 + (long)local_320;
                if (*(char *)(uVar21 + 1 + lVar41) != '\0') {
                  piVar3 = (int *)(lVar35 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar41 + uVar21) == '\0') {
                    piVar3 = (int *)(local_348 + local_338 * lVar32 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    cVar28 = *(char *)(uVar21 + (long)local_320 + local_360 * lVar32);
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + uVar21 * 4);
                    if (cVar28 == '\0') {
                      piVar3 = (int *)(local_368 + lVar35 * lVar18 + -8 + uVar21 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(local_308 + lVar40 * lVar18 + -8 + uVar21 * 4);
                      goto LAB_0014810a;
                    }
                    piVar3 = (int *)(local_368 + lVar35 * lVar18 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                  }
                  else {
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + uVar21 * 4);
                    piVar3 = (int *)(lVar35 * lVar18 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                  }
                  goto LAB_001479b1;
                }
                piVar3 = (int *)(local_338 * lVar18 + local_348 + 4 + uVar21 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(uVar21 + 1 + local_360 * lVar18 + (long)local_320) == '\0') {
                  lVar35 = *local_3c8 * lVar18 + local_390;
                  lVar41 = (long)iVar20;
                  piVar3 = (int *)(lVar35 + -8 + lVar41 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = *local_350 * lVar18 + local_3a0;
                  uVar12 = *(undefined4 *)(lVar40 + -8 + lVar41 * 4);
                  piVar3 = (int *)(lVar35 + lVar41 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar40 + lVar41 * 4) = uVar12;
                  local_380 = local_390;
                  local_308 = local_3a0;
                  goto LAB_001456fd;
                }
                uVar22 = (ulong)iVar20;
                piVar3 = (int *)(lVar35 + 8 + uVar22 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar41 + 2 + uVar22) != '\0') {
                  local_348 = local_348 + local_338 * lVar32;
                  piVar3 = (int *)(local_348 + 4 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = (long)local_320 + local_360 * lVar32;
                  if (*(char *)(uVar21 + 1 + lVar40) == '\0') {
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_390 + 8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar41 = *local_350;
                    uVar10 = *(uint *)(lVar41 * lVar32 + local_3a0 + 8 + uVar22 * 4);
                    piVar3 = (int *)(lVar35 * lVar18 + local_390 + -8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar41 * lVar18 + local_3a0 + -8 +
                                                            uVar22 * 4));
                    local_3b8 = *(long *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *(long *)img_labels.img_._72_8_;
                    local_368 = img_labels.accesses_._16_8_;
                    local_340 = img_labels.accesses_._16_8_;
                    local_308 = img_labels.img_._16_8_;
                    local_310 = img_labels.accesses_._16_8_;
                    local_3c8 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.img_._16_8_;
                    local_390 = img_labels.accesses_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_350 = (long *)img_labels.img_._72_8_;
                    local_330 = img_labels.img_._16_8_;
                    goto LAB_00145e3e;
                  }
                  piVar3 = (int *)(lVar35 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar41 + uVar22) != '\0') {
                    piVar3 = (int *)(local_368 + *local_3c8 * lVar32 + 8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = *(uint *)(local_308 + *local_350 * lVar32 + 8 + uVar22 * 4);
                    local_3b8 = *local_3c8;
                    piVar3 = (int *)(local_3b8 * lVar18 + local_378 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    local_368 = local_378;
                    local_340 = local_340;
                    local_310 = local_318;
                    goto LAB_00145e3e;
                  }
                  piVar3 = (int *)(local_348 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar40 + uVar22) != '\0') {
                    piVar3 = (int *)(local_378 + *local_3c8 * lVar32 + 8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = *(uint *)(local_308 + *local_350 * lVar32 + 8 + uVar22 * 4);
                    local_3b8 = *local_3c8;
                    piVar3 = (int *)(local_3b8 * lVar18 + local_390 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    local_378 = local_390;
                    local_368 = local_390;
                    local_340 = local_340;
                    local_308 = local_3a0;
                    local_310 = local_318;
                    goto LAB_00145e3e;
                  }
                  lVar35 = *local_3c8;
                  piVar3 = (int *)(lVar35 * lVar32 + local_390 + 8 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar41 = *local_350;
                  uVar10 = *(uint *)(lVar41 * lVar32 + local_3a0 + 8 + uVar22 * 4);
                  piVar3 = (int *)(lVar35 * lVar18 + local_390 + -8 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar41 * lVar18 + local_3a0 + -8 +
                                                          uVar22 * 4));
                  local_3b8 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = *(long *)img_labels.img_._72_8_;
                  goto LAB_001485b7;
                }
                local_390 = local_390 + *local_3c8 * lVar18;
                lVar35 = (long)iVar20;
                piVar3 = (int *)(local_390 + -8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                local_3a0 = local_3a0 + *local_350 * lVar18;
                uVar12 = *(undefined4 *)(local_3a0 + -8 + lVar35 * 4);
                piVar3 = (int *)(local_390 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(local_3a0 + lVar35 * 4) = uVar12;
              } while( true );
            }
            lVar35 = *local_3c8 * lVar18 + local_380;
            piVar3 = (int *)(lVar35 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = *local_350 * lVar18 + local_388;
            uVar12 = *(undefined4 *)(lVar41 + lVar25 * 4);
            piVar3 = (int *)(lVar35 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(lVar41 + 8 + lVar25 * 4) = uVar12;
            local_328 = uVar22 & 0xffffffff;
            local_308 = local_388;
            goto LAB_001456fd;
          }
          if (local_2d0 < (int)uVar22) {
LAB_0014866e:
            lVar15 = (long)(int)uVar22;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_ +
                            lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar15 + *local_398 * lVar18 + (long)local_320) == '\0') {
              piVar3 = (int *)(local_368 + *local_3c8 * lVar18 + lVar15 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(local_308 + lVar18 * *local_350 + lVar15 * 4) = 0;
            }
            else {
              lVar32 = local_368 + *local_3c8 * lVar18;
              piVar3 = (int *)(lVar32 + -8 + lVar15 * 4);
              *piVar3 = *piVar3 + 1;
              local_308 = local_308 + lVar18 * *local_350;
              uVar12 = *(undefined4 *)(local_308 + -8 + lVar15 * 4);
              piVar3 = (int *)(lVar32 + lVar15 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(local_308 + lVar15 * 4) = uVar12;
            }
            goto LAB_001499b8;
          }
          piVar3 = (int *)(local_338 * lVar18 + local_348 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar25 + 2 + local_360 * lVar18 + (long)local_320) == '\0') {
            lVar15 = local_360 * lVar18;
            uVar21 = local_360;
LAB_00148d28:
            lVar35 = (long)(int)uVar22;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_ + 4 +
                            lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + 1 + lVar15 + (long)local_320) == '\0') {
              piVar3 = (int *)(local_368 + *local_3c8 * lVar18 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(local_308 + lVar18 * *local_350 + lVar35 * 4) = 0;
              goto LAB_001499b8;
            }
            piVar3 = (int *)(lVar27 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 4 +
                            lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + 1 + (long)local_320 + uVar21 * lVar27) != '\0') {
              lVar15 = *local_3c8;
              piVar3 = (int *)(lVar15 * lVar32 + local_368 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = *local_350;
              uVar12 = *(undefined4 *)(lVar32 * lVar27 + local_308 + lVar35 * 4);
              piVar3 = (int *)(lVar15 * lVar18 + local_368 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
LAB_00148dbe:
              local_330 = lVar27 * lVar18 + local_308;
              goto LAB_00148dc1;
            }
            uVar10 = UFPC::MemNewLabel();
          }
          else {
            piVar3 = (int *)(local_338 * lVar27 + local_348 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar25 + 3 + lVar27 * local_360 + (long)local_320) == '\0') {
              piVar3 = (int *)(lVar35 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(lVar41 + lVar25 * 4);
              piVar3 = (int *)(lVar35 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar41 + 8 + lVar25 * 4) = uVar12;
              goto LAB_001499b8;
            }
            piVar3 = (int *)(local_348 + local_338 * lVar32 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_330 = local_308;
            if (*(char *)(lVar25 + 2 + (long)local_320 + local_360 * lVar32) == '\0') {
              piVar3 = (int *)(local_368 + local_3b8 * lVar32 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar14 = *(uint *)(local_308 + lVar42 + 8 + lVar25 * 4);
              piVar3 = (int *)(lVar35 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)(lVar41 + lVar25 * 4);
LAB_00149977:
              uVar10 = UFPC::MemMerge(uVar14,uVar10);
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                               img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + 8 +
                       lVar25 * 4) = uVar10;
              goto LAB_001499b8;
            }
LAB_001489c7:
            lVar35 = (long)(int)uVar22;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + -4 +
                            lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + -1 + *(long *)img.img_._72_8_ * lVar32 + img.img_._16_8_) != '\0'
               ) {
              lVar15 = *local_3c8;
              piVar3 = (int *)(lVar15 * lVar32 + local_368 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = *local_350;
              uVar12 = *(undefined4 *)(lVar32 * lVar27 + local_330 + lVar35 * 4);
              piVar3 = (int *)(lVar15 * lVar18 + local_368 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              local_330 = lVar27 * lVar18 + local_330;
LAB_00148dc1:
              *(undefined4 *)(local_330 + lVar35 * 4) = uVar12;
              goto LAB_001499b8;
            }
            lVar15 = local_368 + *local_3c8 * lVar32;
            piVar3 = (int *)(lVar15 + -8 + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            local_330 = local_330 + lVar32 * *local_350;
            uVar10 = *(uint *)(local_330 + -8 + lVar35 * 4);
            piVar3 = (int *)(lVar15 + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            uVar14 = *(uint *)(local_330 + lVar35 * 4);
LAB_00149866:
            uVar10 = UFPC::MemMerge(uVar10,uVar14);
          }
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                           img_labels.accesses_._16_8_ + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + lVar35 * 4)
               = uVar10;
          goto LAB_001499b8;
        }
        piVar3 = (int *)(img.accesses_._16_8_ + lVar39 + 8 + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(img.img_._16_8_ + lVar42 + 2 + lVar35) == '\0') {
          uVar10 = UFPC::MemNewLabel();
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                           img_labels.accesses_._16_8_ + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * lVar18 + img_labels.img_._16_8_ + 8 +
                   lVar35 * 4) = uVar10;
          local_328 = local_328 & 0xffffffff;
          local_380 = img_labels.accesses_._16_8_;
          local_308 = img_labels.img_._16_8_;
        }
        else {
          lVar41 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar41 * lVar32 + local_380 + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          lVar40 = *(long *)img_labels.img_._72_8_;
          uVar12 = *(undefined4 *)(lVar40 * lVar32 + local_308 + 8 + lVar35 * 4);
          piVar3 = (int *)(lVar41 * lVar18 + local_380 + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar40 * lVar18 + local_308 + 8 + lVar35 * 4) = uVar12;
          local_328 = local_328 & 0xffffffff;
        }
        goto LAB_001456fd;
      }
      local_338 = *(long *)img.accesses_._72_8_;
      local_348 = img.accesses_._16_8_;
      piVar3 = (int *)(local_338 * lVar18 + img.accesses_._16_8_ + 8 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      local_360 = *(ulong *)img.img_._72_8_;
      cVar28 = *(char *)(lVar35 + 2 + local_360 * lVar18 + img.img_._16_8_);
      local_320 = (long *)img.img_._16_8_;
      if (local_2d0 < (int)local_328) {
        if (cVar28 == '\0') {
          piVar3 = (int *)(local_380 + *(long *)img_labels.accesses_._72_8_ * lVar18 + 8 +
                          lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(local_308 + lVar18 * *(long *)img_labels.img_._72_8_ + 8 + lVar35 * 4) = 0
          ;
          goto LAB_001499b8;
        }
        local_338 = local_338 * lVar27;
        lVar27 = local_360 * lVar27;
LAB_001496e8:
        piVar3 = (int *)(local_338 + local_348 + local_328 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(local_328 + lVar27 + (long)local_320) == '\0') {
          uVar10 = UFPC::MemNewLabel();
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                           img_labels.accesses_._16_8_ + local_328 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ +
                   local_328 * 4) = uVar10;
          goto LAB_001499b8;
        }
      }
      else {
        if (cVar28 == '\0') {
          local_328 = local_328 & 0xffffffff;
LAB_0014968f:
          lVar15 = (long)(int)local_328;
          piVar3 = (int *)(local_338 * lVar18 + local_348 + 4 + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar15 + 1 + local_360 * lVar18 + (long)local_320) == '\0') {
            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                             img_labels.accesses_._16_8_ + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)
             (lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + lVar15 * 4) = 0;
            goto LAB_001499b8;
          }
          lVar15 = lVar15 + 1;
          local_328 = local_328 & 0xffffffff;
        }
        else {
          lVar15 = (long)(iVar20 + 3);
        }
        local_338 = local_338 * lVar27;
        piVar3 = (int *)(local_348 + local_338 + lVar15 * 4);
        *piVar3 = *piVar3 + 1;
        lVar27 = local_360 * lVar27;
        local_328 = (ulong)(int)local_328;
        if (*(char *)(lVar15 + (long)local_320 + lVar27) == '\0') goto LAB_001496e8;
      }
      lVar15 = *(long *)img_labels.accesses_._72_8_;
      piVar3 = (int *)(lVar15 * lVar32 + img_labels.accesses_._16_8_ + local_328 * 4);
      *piVar3 = *piVar3 + 1;
      lVar27 = *(long *)img_labels.img_._72_8_;
      uVar12 = *(undefined4 *)(lVar32 * lVar27 + img_labels.img_._16_8_ + local_328 * 4);
      piVar3 = (int *)(lVar15 * lVar18 + img_labels.accesses_._16_8_ + local_328 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(lVar27 * lVar18 + img_labels.img_._16_8_ + local_328 * 4) = uVar12;
    }
    goto LAB_001499b8;
  }
  uVar22 = 0xfffffffffffffffe;
LAB_0013b53f:
  lVar15 = (long)(int)uVar22;
  uVar22 = lVar15 + 2;
  if ((int)uVar22 < local_2d0) {
    piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar15 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(img.img_._16_8_ + 2 + lVar15) == '\0') goto LAB_0013b5a0;
    piVar3 = (int *)(img.accesses_._16_8_ + 0xc + lVar15 * 4);
    *piVar3 = *piVar3 + 1;
    cVar28 = *(char *)(img.img_._16_8_ + 3 + lVar15);
    uVar10 = UFPC::MemNewLabel();
    piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar15 * 4);
    *piVar3 = *piVar3 + 1;
    *(uint *)(img_labels.img_._16_8_ + 8 + lVar15 * 4) = uVar10;
    if (cVar28 != '\0') {
      while( true ) {
        lVar15 = uVar22 << 0x20;
        while( true ) {
          uVar22 = uVar22 + 2;
          lVar18 = lVar15 >> 0x1e;
          if ((long)local_2d0 <= (long)uVar22) {
            if (local_2d0 < (int)uVar22) {
              piVar3 = (int *)(img.accesses_._16_8_ + (lVar15 + 0x200000000 >> 0x1e));
              *piVar3 = *piVar3 + 1;
              lVar32 = lVar15 + 0x200000000 >> 0x20;
              if (*(char *)(img.img_._16_8_ + lVar32) == '\0') {
                piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(img_labels.img_._16_8_ + lVar32 * 4) = 0;
                goto LAB_001499b8;
              }
            }
            else {
              piVar3 = (int *)(img.accesses_._16_8_ + (lVar15 + 0x200000000 >> 0x1e));
              *piVar3 = *piVar3 + 1;
              lVar32 = lVar15 + 0x200000000 >> 0x20;
              if (*(char *)(img.img_._16_8_ + lVar32) == '\0') goto LAB_00148e1c;
              piVar3 = (int *)(img.accesses_._16_8_ + (lVar15 + 0x300000000 >> 0x1e));
              *piVar3 = *piVar3 + 1;
            }
            *(int *)(img_labels.accesses_._16_8_ + lVar18) =
                 *(int *)(img_labels.accesses_._16_8_ + lVar18) + 1;
            uVar12 = *(undefined4 *)(img_labels.img_._16_8_ + lVar18);
            piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + lVar32 * 4) = uVar12;
            goto LAB_001499b8;
          }
          piVar3 = (int *)(img.accesses_._16_8_ + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(img.img_._16_8_ + uVar22) == '\0') break;
          piVar3 = (int *)(img.accesses_._16_8_ + 4 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(img.img_._16_8_ + 1 + uVar22) == '\0') {
            *(int *)(img_labels.accesses_._16_8_ + lVar18) =
                 *(int *)(img_labels.accesses_._16_8_ + lVar18) + 1;
            uVar12 = *(undefined4 *)(img_labels.img_._16_8_ + lVar18);
            piVar3 = (int *)(img_labels.accesses_._16_8_ + uVar22 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + uVar22 * 4) = uVar12;
            goto LAB_0013b53f;
          }
          piVar3 = (int *)(img_labels.accesses_._16_8_ + -8 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          uVar12 = *(undefined4 *)(img_labels.img_._16_8_ + -8 + uVar22 * 4);
          piVar3 = (int *)(img_labels.accesses_._16_8_ + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(img_labels.img_._16_8_ + uVar22 * 4) = uVar12;
          lVar15 = lVar15 + 0x200000000;
        }
LAB_0013b5a0:
        iVar20 = (int)uVar22;
        uVar21 = (ulong)iVar20;
        piVar3 = (int *)(img.accesses_._16_8_ + 4 + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(img.img_._16_8_ + 1 + uVar21) == '\0') break;
        uVar10 = UFPC::MemNewLabel();
        piVar3 = (int *)(img_labels.accesses_._16_8_ + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(img_labels.img_._16_8_ + uVar21 * 4) = uVar10;
        uVar22 = uVar21;
      }
      piVar3 = (int *)(img_labels.accesses_._16_8_ + (long)iVar20 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + (long)iVar20 * 4) = 0;
      uVar22 = uVar22 & 0xffffffff;
    }
    goto LAB_0013b53f;
  }
  piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar15 * 4);
  *piVar3 = *piVar3 + 1;
  cVar28 = *(char *)(img.img_._16_8_ + 2 + lVar15);
  if (local_2d0 < (int)uVar22) {
    if (cVar28 == '\0') {
      piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar15 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + 8 + lVar15 * 4) = 0;
      goto LAB_001499b8;
    }
  }
  else {
    if (cVar28 == '\0') {
LAB_00148e1c:
      lVar35 = (long)(int)uVar22;
      piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(img.img_._16_8_ + 1 + lVar35) == '\0') {
        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        *(undefined4 *)(img_labels.img_._16_8_ + lVar35 * 4) = 0;
      }
      else {
        uVar10 = UFPC::MemNewLabel();
        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        lVar15 = img_labels.img_._16_8_;
LAB_00148e42:
        *(uint *)(lVar15 + lVar35 * 4) = uVar10;
      }
      goto LAB_001499b8;
    }
    piVar3 = (int *)(img.accesses_._16_8_ + 0xc + lVar15 * 4);
    *piVar3 = *piVar3 + 1;
  }
  uVar10 = UFPC::MemNewLabel();
  piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar15 * 4);
  *piVar3 = *piVar3 + 1;
  *(uint *)(img_labels.img_._16_8_ + 8 + lVar15 * 4) = uVar10;
LAB_001499b8:
  uVar10 = UFPC::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  local_398 = (long *)0x1;
  __arg = (void *)0x0;
  do {
    piVar8 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (lVar17 <= (long)__arg) {
      local_100 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,4,&local_100,
                 &local_10d);
      pvVar9 = local_108;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (local_108,&local_f0);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0);
      dVar43 = MemMat<unsigned_char>::GetTotalAccesses(&img);
      *(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start =
           (long)(dVar43 - 9.223372036854776e+18) & (long)dVar43 >> 0x3f | (long)dVar43;
      dVar43 = MemMat<int>::GetTotalAccesses(&img_labels);
      (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[1] =
           (long)dVar43 >> 0x3f & (long)(dVar43 - 9.223372036854776e+18) | (long)dVar43;
      dVar43 = UFPC::MemTotalAccesses();
      __child_stack =
           (void *)((long)dVar43 >> 0x3f & (long)(dVar43 - 9.223372036854776e+18) | (long)dVar43);
      (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[2] = (unsigned_long)__child_stack;
      cv::Mat_<int>::clone
                (&local_f0,(__fn *)&img_labels.img_,__child_stack,
                 (int)(long)(dVar43 - 9.223372036854776e+18),__arg);
      cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,&local_f0.super_Mat);
      cv::Mat::~Mat(&local_f0.super_Mat);
      MemMat<int>::~MemMat(&img_labels);
      MemMat<unsigned_char>::~MemMat(&img);
      return;
    }
    uVar22 = (ulong)__arg | 1;
    for (lVar15 = 0; lVar15 < lVar26; lVar15 = lVar15 + 2) {
      lVar18 = *(long *)img_labels.accesses_._72_8_;
      lVar27 = (long)__arg * lVar18 + img_labels.accesses_._16_8_;
      iVar20 = *(int *)(lVar27 + lVar15 * 4);
      *(int *)(lVar27 + lVar15 * 4) = iVar20 + 1;
      lVar32 = *(long *)img_labels.img_._72_8_;
      lVar35 = (long)__arg * lVar32 + img_labels.img_._16_8_;
      lVar41 = (long)*(int *)(lVar35 + lVar15 * 4);
      if (lVar41 < 1) {
        *(int *)(lVar27 + lVar15 * 4) = iVar20 + 2;
        *(undefined4 *)(lVar35 + lVar15 * 4) = 0;
        if (lVar15 + 1 < lVar26) {
          piVar3 = (int *)(lVar27 + 4 + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar35 + 4 + lVar15 * 4) = 0;
          if ((long)uVar22 < lVar17) {
            lVar27 = lVar18 * (long)local_398 + img_labels.accesses_._16_8_;
            piVar3 = (int *)(lVar27 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = lVar32 * (long)local_398 + img_labels.img_._16_8_;
            *(undefined4 *)(lVar18 + lVar15 * 4) = 0;
            piVar3 = (int *)(lVar27 + 4 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
LAB_00149c18:
            *(undefined4 *)(lVar18 + 4 + lVar15 * 4) = 0;
          }
        }
        else if ((long)uVar22 < lVar17) {
          piVar3 = (int *)(lVar18 * (long)local_398 + img_labels.accesses_._16_8_ + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = lVar32 * (long)local_398 + img_labels.img_._16_8_;
LAB_00149ca2:
          *(undefined4 *)(lVar18 + lVar15 * 4) = 0;
        }
      }
      else {
        piVar8[lVar41] = piVar8[lVar41] + 1;
        uVar10 = puVar7[lVar41];
        lVar41 = *(long *)img.accesses_._72_8_;
        lVar42 = (long)__arg * lVar41 + img.accesses_._16_8_;
        piVar3 = (int *)(lVar42 + lVar15 * 4);
        *piVar3 = *piVar3 + 1;
        lVar40 = *(long *)img.img_._72_8_;
        lVar25 = (long)__arg * lVar40 + img.img_._16_8_;
        uVar14 = uVar10;
        if (*(char *)(lVar15 + lVar25) == '\0') {
          uVar14 = 0;
        }
        piVar3 = (int *)(lVar27 + lVar15 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(lVar35 + lVar15 * 4) = uVar14;
        if (lVar15 + 1 < lVar26) {
          piVar3 = (int *)(lVar42 + 4 + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          uVar14 = uVar10;
          if (*(char *)(lVar15 + 1 + lVar25) == '\0') {
            uVar14 = 0;
          }
          piVar3 = (int *)(lVar27 + 4 + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(lVar35 + 4 + lVar15 * 4) = uVar14;
          if ((long)uVar22 < lVar17) {
            lVar35 = lVar41 * (long)local_398 + img.accesses_._16_8_;
            piVar3 = (int *)(lVar35 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = lVar40 * (long)local_398 + img.img_._16_8_;
            lVar27 = lVar18 * (long)local_398 + img_labels.accesses_._16_8_;
            uVar14 = uVar10;
            if (*(char *)(lVar15 + lVar41) == '\0') {
              uVar14 = 0;
            }
            piVar3 = (int *)(lVar27 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = lVar32 * (long)local_398 + img_labels.img_._16_8_;
            *(uint *)(lVar18 + lVar15 * 4) = uVar14;
            piVar3 = (int *)(lVar35 + 4 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            cVar28 = *(char *)(lVar15 + 1 + lVar41);
            piVar3 = (int *)(lVar27 + 4 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            if (cVar28 == '\0') goto LAB_00149c18;
            *(uint *)(lVar18 + 4 + lVar15 * 4) = uVar10;
          }
        }
        else if ((long)uVar22 < lVar17) {
          piVar3 = (int *)(lVar41 * (long)local_398 + img.accesses_._16_8_ + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          cVar28 = *(char *)(lVar15 + lVar40 * (long)local_398 + img.img_._16_8_);
          piVar3 = (int *)(lVar18 * (long)local_398 + img_labels.accesses_._16_8_ + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = lVar32 * (long)local_398 + img_labels.img_._16_8_;
          if (cVar28 == '\0') goto LAB_00149ca2;
          *(uint *)(lVar18 + lVar15 * 4) = uVar10;
        }
      }
    }
    __arg = (void *)((long)__arg + 2);
    local_398 = (long *)((long)local_398 + 2);
  } while( true );
LAB_00146b24:
  lVar35 = lVar40 * lVar18 + local_308;
  *(uint *)(lVar35 + uVar22 * 4) = uVar14;
  lVar25 = (long)(int)uVar10;
  uVar22 = lVar25 + 2;
  local_320 = (long *)img.img_._16_8_;
  if (local_2d0 <= (int)uVar22) {
    local_398 = (long *)img.img_._72_8_;
    if (local_2d0 < (int)uVar22) goto LAB_0014866e;
    lVar41 = *(long *)img.accesses_._72_8_;
    piVar3 = (int *)(lVar41 * lVar18 + img.accesses_._16_8_ + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar21 = *(ulong *)img.img_._72_8_;
    lVar15 = uVar21 * lVar18;
    if (*(char *)(lVar25 + 2 + img.img_._16_8_ + lVar15) == '\0') goto LAB_00148d28;
    piVar3 = (int *)(img.accesses_._16_8_ + lVar41 * lVar27 + 0xc + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar25 + 3 + img.img_._16_8_ + uVar21 * lVar27) != '\0') {
      piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      uVar14 = *(uint *)(local_308 + lVar40 * lVar32 + 8 + lVar25 * 4);
      piVar3 = (int *)(local_3b8 * lVar18 + local_368 + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      uVar10 = *(uint *)(lVar35 + lVar25 * 4);
      goto LAB_00149977;
    }
    lVar15 = local_368 + local_3b8 * lVar18;
    piVar3 = (int *)(lVar15 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar12 = *(undefined4 *)(lVar35 + lVar25 * 4);
    piVar3 = (int *)(lVar15 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
LAB_00149840:
    *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = uVar12;
    goto LAB_001499b8;
  }
  local_338 = *(long *)img.accesses_._72_8_;
  lVar41 = local_338 * lVar18 + img.accesses_._16_8_;
  piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  local_360 = *(ulong *)img.img_._72_8_;
  lVar42 = local_360 * lVar18 + img.img_._16_8_;
  if (*(char *)(lVar25 + 2 + lVar42) == '\0') {
    local_398 = (long *)img.img_._72_8_;
    local_340 = local_368;
    local_380 = local_368;
    local_390 = local_368;
    local_378 = local_368;
    local_328 = uVar22 & 0xffffffff;
    local_348 = img.accesses_._16_8_;
    local_3a0 = local_308;
    local_388 = local_308;
    local_370 = local_308;
LAB_00146dd0:
    uVar10 = (uint)local_328;
    uVar22 = (ulong)(int)uVar10;
    piVar3 = (int *)(local_338 * lVar18 + local_348 + 4 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    plVar34 = local_320;
    lVar41 = local_348;
    if (*(char *)(uVar22 + 1 + local_360 * lVar18 + (long)local_320) == '\0') {
      local_3b8 = *local_3c8;
      uVar22 = (ulong)(int)uVar10;
      piVar3 = (int *)(local_3b8 * lVar18 + local_318 + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      local_3a0 = local_330;
      local_368 = local_318;
      goto LAB_001466a5;
    }
    lVar40 = local_338 * lVar27 + local_348;
    piVar3 = (int *)(lVar40 + 4 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar35 = local_360 * lVar27 + (long)local_320;
    if (*(char *)(uVar22 + 1 + lVar35) == '\0') {
      uVar22 = (ulong)(int)uVar10;
      piVar3 = (int *)(lVar40 + 8 + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar35 + 2 + uVar22) != '\0') {
        local_3b8 = *local_3c8;
        piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + uVar22 * 4);
        *piVar3 = *piVar3 + 1;
        lVar40 = *local_350;
        uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + 8 + uVar22 * 4);
        piVar3 = (int *)(local_3b8 * lVar18 + local_368 + uVar22 * 4);
        *piVar3 = *piVar3 + 1;
        local_340 = local_340;
        local_308 = local_308;
        local_310 = local_318;
        goto LAB_00145e3e;
      }
      uVar14 = UFPC::MemNewLabel();
      local_3b8 = *(long *)img_labels.accesses_._72_8_;
      uVar22 = (ulong)(int)uVar10;
      piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
LAB_00147006:
      local_330 = img_labels.img_._16_8_;
      local_350 = (long *)img_labels.img_._72_8_;
      lVar40 = *(long *)img_labels.img_._72_8_;
      local_308 = img_labels.img_._16_8_;
      local_3c8 = (long *)img_labels.accesses_._72_8_;
      local_368 = img_labels.accesses_._16_8_;
      local_318 = img_labels.accesses_._16_8_;
      goto LAB_00146b24;
    }
    local_3b8 = *local_3c8;
    piVar3 = (int *)(local_3b8 * lVar32 + local_368 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar40 = *local_350;
    lVar37 = local_368;
LAB_00146e87:
    while( true ) {
      uVar12 = *(undefined4 *)(lVar40 * lVar32 + local_308 + uVar22 * 4);
      piVar3 = (int *)(local_3b8 * lVar18 + lVar37 + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(lVar40 * lVar18 + local_308 + uVar22 * 4) = uVar12;
      lVar35 = (long)(int)local_328;
      uVar10 = (int)local_328 + 2;
      local_328 = (ulong)uVar10;
      if (local_2d0 <= (int)uVar10) break;
      piVar3 = (int *)(local_338 * lVar18 + local_348 + 8 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      plVar34 = local_320;
      lVar41 = local_348;
      if (*(char *)(lVar35 + 2 + local_360 * lVar18 + (long)local_320) != '\0') goto LAB_00147c01;
LAB_0014590d:
      while( true ) {
        uVar10 = (uint)local_328;
        uVar22 = (ulong)(int)uVar10;
        piVar3 = (int *)(local_338 * lVar18 + lVar41 + 4 + uVar22 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(uVar22 + 1 + local_360 * lVar18 + (long)plVar34) != '\0') break;
        local_3c8 = (long *)img_labels.accesses_._72_8_;
        local_3b8 = *(long *)img_labels.accesses_._72_8_;
        uVar22 = (ulong)(int)uVar10;
        piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
        *piVar3 = *piVar3 + 1;
        local_330 = img_labels.img_._16_8_;
        local_318 = img_labels.accesses_._16_8_;
        local_368 = img_labels.accesses_._16_8_;
        local_350 = (long *)img_labels.img_._72_8_;
        local_3a0 = img_labels.img_._16_8_;
LAB_001466a5:
        lVar40 = *local_350;
        lVar35 = lVar40 * lVar18 + local_3a0;
        *(undefined4 *)(lVar35 + uVar22 * 4) = 0;
        lVar25 = (long)(int)uVar10;
        uVar22 = lVar25 + 2;
        uVar10 = (uint)uVar22;
        if (local_2d0 <= (int)uVar10) {
          piVar3 = (int *)(local_338 * lVar18 + lVar41 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          cVar28 = *(char *)(lVar25 + 2 + local_360 * lVar18 + (long)plVar34);
          if (local_2d0 < (int)uVar10) {
            if (cVar28 == '\0') {
              piVar3 = (int *)(local_368 + local_3b8 * lVar18 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = 0;
              goto LAB_001499b8;
            }
LAB_001493f9:
            lVar41 = lVar41 + local_338 * lVar27;
            piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar15 = (long)plVar34 + local_360 * lVar27;
            if (*(char *)(lVar25 + 2 + lVar15) != '\0') goto LAB_00149410;
            piVar3 = (int *)(lVar41 + 4 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar15 + 1 + lVar25) == '\0') {
              uVar10 = UFPC::MemNewLabel();
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                               img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + 8 +
                       lVar25 * 4) = uVar10;
              goto LAB_001499b8;
            }
            piVar3 = (int *)(local_3b8 * lVar32 + local_368 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            uVar12 = *(undefined4 *)(local_3a0 + lVar40 * lVar32 + lVar25 * 4);
          }
          else {
            if (cVar28 == '\0') {
              local_328 = uVar22 & 0xffffffff;
              goto LAB_0014968f;
            }
            lVar15 = lVar41 + local_338 * lVar27;
            piVar3 = (int *)(lVar15 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar42 = (long)plVar34 + local_360 * lVar27;
            if (*(char *)(lVar25 + 3 + lVar42) == '\0') goto LAB_001493f9;
            piVar3 = (int *)(lVar15 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar42 + 2 + lVar25) == '\0') {
              piVar3 = (int *)(lVar15 + 4 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar42 + 1 + lVar25) != '\0') goto LAB_00149027;
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(local_3a0 + lVar40 * lVar32 + 8 + lVar25 * 4);
              piVar3 = (int *)(lVar18 * local_3b8 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = uVar12;
              goto LAB_001499b8;
            }
LAB_00149410:
            piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            uVar12 = *(undefined4 *)(local_3a0 + lVar40 * lVar32 + 8 + lVar25 * 4);
          }
          piVar3 = (int *)(lVar18 * local_3b8 + local_368 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          goto LAB_00149840;
        }
        lVar35 = local_338 * lVar18 + lVar41;
        piVar3 = (int *)(lVar35 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar42 = local_360 * lVar18 + (long)plVar34;
        if (*(char *)(lVar25 + 2 + lVar42) != '\0') {
          lVar41 = lVar41 + local_338 * lVar27;
          piVar3 = (int *)(lVar41 + 0xc + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar39 = (long)plVar34 + local_360 * lVar27;
          if (*(char *)(lVar25 + 3 + lVar39) != '\0') {
            piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if ((*(char *)(lVar39 + 2 + lVar25) != '\0') ||
               (piVar3 = (int *)(lVar41 + 4 + lVar25 * 4), *piVar3 = *piVar3 + 1,
               *(char *)(lVar39 + 1 + lVar25) == '\0')) {
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)(lVar40 * lVar32 + local_3a0 + 8 + lVar25 * 4);
              piVar3 = (int *)(local_3b8 * lVar18 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              goto LAB_00146c3a;
            }
            local_328 = uVar22 & 0xffffffff;
            goto LAB_00147e84;
          }
          piVar3 = (int *)(lVar35 + 0xc + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar42 + 3 + lVar25) != '\0') {
            piVar3 = (int *)(lVar41 + 0x10 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            cVar28 = *(char *)(lVar39 + 4 + lVar25);
            piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            cVar5 = *(char *)(lVar39 + 2 + lVar25);
            local_388 = local_3a0;
            local_308 = local_3a0;
            local_370 = local_3a0;
            if (cVar28 != '\0') {
              if (cVar5 != '\0') {
                local_328 = uVar22 & 0xffffffff;
                goto LAB_00145a9b;
              }
              piVar3 = (int *)(lVar41 + 4 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar39 + 1 + lVar25) != '\0') {
                local_328 = uVar22 & 0xffffffff;
                goto LAB_001482a6;
              }
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 0x10 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)(lVar40 * lVar32 + local_3a0 + 0x10 + lVar25 * 4);
              piVar3 = (int *)(local_3b8 * lVar18 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_380 = local_368;
              local_390 = local_368;
              local_378 = local_368;
              local_328 = uVar22 & 0xffffffff;
              local_368 = local_368;
              local_340 = local_368;
              local_310 = local_318;
              goto LAB_00145e3e;
            }
            if (cVar5 != '\0') {
              local_390 = local_368;
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_368 = local_368;
              local_380 = local_390;
              local_378 = local_390;
              local_340 = local_390;
              goto LAB_00145bb7;
            }
            piVar3 = (int *)(lVar41 + 4 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar39 + 1 + lVar25) == '\0') {
              uVar14 = UFPC::MemNewLabel();
              local_3c8 = (long *)img_labels.accesses_._72_8_;
              local_3b8 = *(long *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_350 = (long *)img_labels.img_._72_8_;
              lVar40 = *(long *)img_labels.img_._72_8_;
              local_330 = img_labels.img_._16_8_;
              local_318 = img_labels.accesses_._16_8_;
              local_368 = img_labels.accesses_._16_8_;
              local_308 = img_labels.img_._16_8_;
            }
            else {
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar14 = *(uint *)(lVar40 * lVar32 + local_3a0 + lVar25 * 4);
              piVar3 = (int *)(local_3b8 * lVar18 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
            }
            goto LAB_00146b24;
          }
          local_348 = local_348 + local_338 * lVar27;
          piVar3 = (int *)(local_348 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar35 = (long)local_320 + local_360 * lVar27;
          if (*(char *)(lVar25 + 2 + lVar35) == '\0') {
            piVar3 = (int *)(local_348 + 4 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + 1 + lVar25) == '\0') {
              uVar10 = UFPC::MemNewLabel();
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                               img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * lVar18 + img_labels.img_._16_8_ + 8 +
                       lVar25 * 4) = uVar10;
              local_328 = uVar22 & 0xffffffff;
              local_380 = img_labels.accesses_._16_8_;
              local_308 = img_labels.img_._16_8_;
              goto LAB_001456fd;
            }
            lVar35 = *local_3c8;
            piVar3 = (int *)(lVar35 * lVar32 + local_318 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = *local_350;
            uVar12 = *(undefined4 *)(lVar41 * lVar32 + local_330 + lVar25 * 4);
          }
          else {
            lVar35 = *local_3c8;
            piVar3 = (int *)(lVar35 * lVar32 + local_318 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = *local_350;
            uVar12 = *(undefined4 *)(lVar41 * lVar32 + local_330 + 8 + lVar25 * 4);
          }
          piVar3 = (int *)(lVar35 * lVar18 + local_318 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar41 * lVar18 + local_330 + 8 + lVar25 * 4) = uVar12;
          local_328 = uVar22 & 0xffffffff;
          local_380 = local_318;
          local_308 = local_330;
          goto LAB_001456fd;
        }
        local_328 = uVar22 & 0xffffffff;
      }
      lVar39 = local_338 * lVar27;
      piVar3 = (int *)(lVar41 + lVar39 + 4 + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      lVar42 = local_360 * lVar27;
      if (*(char *)(uVar22 + 1 + (long)plVar34 + lVar42) == '\0') goto LAB_00145a5c;
      local_3c8 = (long *)img_labels.accesses_._72_8_;
      local_3b8 = *(long *)img_labels.accesses_._72_8_;
      piVar3 = (int *)(local_3b8 * lVar32 + img_labels.accesses_._16_8_ + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      local_350 = (long *)img_labels.img_._72_8_;
      lVar40 = *(long *)img_labels.img_._72_8_;
      local_330 = img_labels.img_._16_8_;
      local_318 = img_labels.accesses_._16_8_;
      local_370 = img_labels.img_._16_8_;
      local_340 = img_labels.accesses_._16_8_;
      local_388 = img_labels.img_._16_8_;
      local_380 = img_labels.accesses_._16_8_;
      local_3a0 = img_labels.img_._16_8_;
      local_390 = img_labels.accesses_._16_8_;
      local_378 = img_labels.accesses_._16_8_;
      local_368 = img_labels.accesses_._16_8_;
      lVar37 = img_labels.accesses_._16_8_;
      local_308 = img_labels.img_._16_8_;
    }
    if (local_2d0 < (int)uVar10) {
      uVar22 = (ulong)uVar10;
      goto LAB_0014866e;
    }
    piVar3 = (int *)(lVar41 + local_338 * lVar18 + 8 + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar35 + 2 + (long)plVar34 + local_360 * lVar18) == '\0') goto LAB_0014968f;
LAB_00148b1e:
    lVar35 = (long)(int)uVar10;
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + 4 + lVar35 * 4)
    ;
    *piVar3 = *piVar3 + 1;
    lVar15 = *(long *)img.img_._72_8_ * lVar27 + img.img_._16_8_;
    if (*(char *)(lVar35 + 1 + lVar15) == '\0') {
      lVar15 = local_368 + *local_3c8 * lVar18;
      piVar3 = (int *)(lVar15 + -8 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      local_308 = local_308 + lVar18 * *local_350;
      uVar12 = *(undefined4 *)(local_308 + -8 + lVar35 * 4);
      piVar3 = (int *)(lVar15 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(local_308 + lVar35 * 4) = uVar12;
      goto LAB_001499b8;
    }
    piVar3 = (int *)(lVar27 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar15 + lVar35) != '\0') {
      lVar15 = *local_3c8;
      piVar3 = (int *)(lVar15 * lVar32 + local_368 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      lVar27 = *local_350;
      uVar12 = *(undefined4 *)(lVar32 * lVar27 + local_308 + lVar35 * 4);
      piVar3 = (int *)(lVar15 * lVar18 + local_368 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      goto LAB_00148dbe;
    }
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    cVar28 = *(char *)(lVar35 + *(long *)img.img_._72_8_ * lVar32 + img.img_._16_8_);
    lVar15 = *local_3c8;
    piVar3 = (int *)(lVar15 * lVar32 + local_368 + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    lVar27 = *local_350;
    uVar10 = *(uint *)(lVar32 * lVar27 + local_308 + lVar35 * 4);
    if (cVar28 != '\0') {
      piVar3 = (int *)(local_368 + lVar15 * lVar18 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      *(uint *)(local_308 + lVar27 * lVar18 + lVar35 * 4) = uVar10;
      goto LAB_001499b8;
    }
    piVar3 = (int *)(local_368 + lVar15 * lVar18 + -8 + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    uVar14 = *(uint *)(local_308 + lVar27 * lVar18 + -8 + lVar35 * 4);
    goto LAB_00149866;
  }
  lVar39 = img.accesses_._16_8_ + local_338 * lVar27;
  piVar3 = (int *)(lVar39 + 0xc + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  lVar37 = img.img_._16_8_ + local_360 * lVar27;
  if (*(char *)(lVar25 + 3 + lVar37) != '\0') {
    piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = *(uint *)(local_308 + lVar40 * lVar32 + 8 + lVar25 * 4);
    piVar3 = (int *)(local_3b8 * lVar18 + local_368 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar35 + lVar25 * 4));
    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 + img_labels.accesses_._16_8_ + 8
                    + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    lVar40 = *(long *)img_labels.img_._72_8_;
    local_3a0 = img_labels.img_._16_8_;
LAB_00146c3a:
    local_328 = uVar22 & 0xffffffff;
    local_308 = local_3a0;
    uVar21 = uVar22;
    goto LAB_001479b1;
  }
  piVar3 = (int *)(lVar41 + 0xc + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar42 + 3 + lVar25) == '\0') {
    lVar41 = local_3b8 * lVar18 + local_368;
    piVar3 = (int *)(lVar41 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar12 = *(undefined4 *)(lVar35 + lVar25 * 4);
    piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = uVar12;
    local_328 = uVar22 & 0xffffffff;
    local_380 = local_368;
    goto LAB_001456fd;
  }
  piVar3 = (int *)(lVar39 + 0x10 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar37 + 4 + lVar25) == '\0') {
    lVar41 = local_368 + local_3b8 * lVar18;
    piVar3 = (int *)(lVar41 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar12 = *(undefined4 *)(lVar35 + lVar25 * 4);
    piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = uVar12;
    local_328 = uVar22;
    goto LAB_0014703b;
  }
  piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 0x10 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  uVar10 = *(uint *)(local_308 + lVar40 * lVar32 + 0x10 + lVar25 * 4);
  piVar3 = (int *)(local_3b8 * lVar18 + local_368 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar35 + lVar25 * 4));
  local_3b8 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  lVar40 = *(long *)img_labels.img_._72_8_;
LAB_00146d65:
  local_328 = uVar22 & 0xffffffff;
  local_368 = img_labels.accesses_._16_8_;
  local_340 = img_labels.accesses_._16_8_;
  local_308 = img_labels.img_._16_8_;
  local_310 = img_labels.accesses_._16_8_;
  local_3c8 = (long *)img_labels.accesses_._72_8_;
  local_3a0 = img_labels.img_._16_8_;
  local_390 = img_labels.accesses_._16_8_;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_350 = (long *)img_labels.img_._72_8_;
  local_330 = img_labels.img_._16_8_;
  goto LAB_00145e3e;
LAB_00145a9b:
  uVar22 = (ulong)(int)local_328;
  piVar3 = (int *)(local_338 * lVar32 + local_348 + 4 + uVar22 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar22 + 1 + local_360 * lVar32 + (long)local_320) == '\0') {
    lVar35 = *(long *)img_labels.accesses_._72_8_ * lVar32 + img_labels.accesses_._16_8_;
    uVar22 = (ulong)(int)local_328;
    piVar3 = (int *)(lVar35 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar41 = *(long *)img_labels.img_._72_8_ * lVar32 + img_labels.img_._16_8_;
    uVar10 = *(uint *)(lVar41 + uVar22 * 4);
    piVar3 = (int *)(lVar35 + 8 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    uVar14 = *(uint *)(lVar41 + 8 + uVar22 * 4);
LAB_00145dc0:
    uVar10 = UFPC::MemMerge(uVar10,uVar14);
    local_3b8 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar40 = *(long *)img_labels.img_._72_8_;
    local_368 = img_labels.accesses_._16_8_;
    local_340 = img_labels.accesses_._16_8_;
    local_308 = img_labels.img_._16_8_;
    local_310 = img_labels.accesses_._16_8_;
    local_3c8 = (long *)img_labels.accesses_._72_8_;
    local_3a0 = img_labels.img_._16_8_;
    local_390 = img_labels.accesses_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_350 = (long *)img_labels.img_._72_8_;
    local_330 = img_labels.img_._16_8_;
  }
  else {
LAB_00145ac5:
    local_3b8 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_3b8 * lVar32 + img_labels.accesses_._16_8_ + 8 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar40 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)(lVar40 * lVar32 + img_labels.img_._16_8_ + 8 + uVar22 * 4);
    piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    local_368 = img_labels.accesses_._16_8_;
    local_340 = img_labels.accesses_._16_8_;
    local_308 = img_labels.img_._16_8_;
    local_310 = img_labels.accesses_._16_8_;
    local_3c8 = (long *)img_labels.accesses_._72_8_;
    local_3a0 = img_labels.img_._16_8_;
    local_390 = img_labels.accesses_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_350 = (long *)img_labels.img_._72_8_;
    local_330 = img_labels.img_._16_8_;
  }
  goto LAB_00145e3e;
code_r0x00147b01:
  lVar37 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(lVar37 * lVar32 + lVar40 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  lVar38 = *(long *)img_labels.img_._72_8_;
  uVar12 = *(undefined4 *)(lVar38 * lVar32 + lVar42 + lVar25 * 4);
  piVar3 = (int *)(lVar37 * lVar18 + lVar40 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(lVar38 * lVar18 + lVar42 + lVar25 * 4) = uVar12;
  lVar35 = lVar35 + 0x200000000;
  lVar25 = lVar25 + 2;
  goto LAB_00147a5f;
LAB_0013cd61:
  local_3c0 = local_3c0 + *local_3b0 * uVar22;
  piVar3 = (int *)(lVar39 + local_3c0);
  *piVar3 = *piVar3 + 1;
  lVar18 = (long)local_398 + *local_320 * uVar22;
  uVar12 = *(undefined4 *)(lVar39 + lVar18);
  piVar3 = (int *)(local_3c0 + lVar40 * 4 + 8 + lVar42 * 4);
  *piVar3 = *piVar3 + 1;
  uVar21 = (ulong)(iVar19 + iVar13 + 2);
  *(undefined4 *)(lVar18 + lVar40 * 4 + 8 + lVar42 * 4) = uVar12;
LAB_00140dee:
  lVar41 = uVar22 - 1;
  local_3a0 = img_labels.accesses_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  iVar19 = (int)uVar21;
  lVar40 = (long)iVar19;
  local_360 = lVar40 << 0x20;
  lVar32 = img.accesses_._16_8_ + lVar40 * 4;
  lVar27 = img.img_._16_8_ + lVar40;
  lVar25 = 0;
  do {
    uVar29 = lVar40 + lVar25 + 2;
    lVar42 = (long)local_360 >> 0x1e;
    if (lVar15 <= (long)uVar29) {
      uVar21 = (ulong)(iVar19 + 2) + lVar25;
      uVar10 = (uint)uVar21;
      if (local_2d0 < (int)uVar10) goto LAB_00142001;
      piVar3 = (int *)(((long)(local_360 + 0x200000000) >> 0x1e) +
                      img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22);
      *piVar3 = *piVar3 + 1;
      uVar23 = (long)(local_360 + 0x200000000) >> 0x20;
      lVar18 = *(long *)img.img_._72_8_;
      if (*(char *)(uVar23 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
        piVar3 = (int *)((uVar22 | 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                        uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(uVar23 + img.img_._16_8_ + lVar18 * (uVar22 | 1)) == '\0') goto LAB_00141da9;
        lVar32 = (long)(local_360 + 0x300000000) >> 0x20;
        piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        lVar18 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar32 + lVar18 * uVar22 + img.img_._16_8_) != '\0') goto LAB_00141427;
      }
      else {
        lVar32 = (long)(local_360 + 0x300000000) >> 0x20;
LAB_00141427:
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar41 + img.accesses_._16_8_ + lVar32 * 4)
        ;
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar32 + lVar18 * lVar41 + img.img_._16_8_) != '\0') {
          lVar32 = uVar22 - 2;
          local_338 = *(long *)img.accesses_._72_8_;
          piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          if (*(char *)(uVar23 + lVar18 * lVar32 + img.img_._16_8_) == '\0') {
            lVar18 = *(long *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + uVar23 * 4);
            piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
            *piVar3 = *piVar3 + 1;
            uVar14 = *(uint *)(lVar42 + lVar27 * uVar22 + img_labels.img_._16_8_);
            goto LAB_0013f6e2;
          }
          lVar32 = local_338 * lVar41;
          lVar41 = lVar41 * lVar18;
          uVar21 = uVar21 & 0xffffffff;
          goto LAB_00142bdf;
        }
      }
      lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_;
      piVar3 = (int *)(lVar42 + lVar18);
      *piVar3 = *piVar3 + 1;
      lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
      uVar12 = *(undefined4 *)(lVar42 + lVar32);
      piVar3 = (int *)(lVar18 + uVar23 * 4);
      *piVar3 = *piVar3 + 1;
      goto LAB_001429ac;
    }
    local_338 = *(long *)img.accesses_._72_8_;
    lVar37 = uVar22 * local_338 + lVar32;
    piVar3 = (int *)(lVar37 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    lVar18 = *(long *)img.img_._72_8_;
    lVar35 = uVar22 * lVar18 + lVar27;
    iVar13 = (int)lVar25;
    lVar39 = (long)local_360 >> 0x20;
    local_398 = (long *)img_labels.img_._16_8_;
    local_320 = (long *)img_labels.img_._72_8_;
    local_390 = img_labels.img_._16_8_;
    if (*(char *)(lVar25 + 2 + lVar35) == '\0') {
      piVar3 = (int *)(local_318 * local_338 + lVar32 + 8 + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 2 + local_318 * lVar18 + lVar27) == '\0') {
        local_3c0 = img_labels.accesses_._16_8_;
        uVar21 = (ulong)(iVar19 + iVar13 + 2);
        local_2d8 = img_labels.img_._16_8_;
        local_3b8 = local_3c0;
        local_388 = (long)local_398;
        local_380 = local_3c0;
        local_378 = local_3c0;
        local_370 = (long)local_398;
        local_358 = (long)local_398;
        local_348 = local_3c0;
        goto LAB_00140c32;
      }
      piVar3 = (int *)(lVar37 + 0xc + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 3 + lVar35) == '\0') {
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
        piVar3 = (int *)(lVar42 + lVar18);
        *piVar3 = *piVar3 + 1;
        iVar19 = iVar19 + iVar13;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
        uVar12 = *(undefined4 *)(lVar42 + lVar32);
        piVar3 = (int *)(lVar18 + lVar40 * 4 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        *(undefined4 *)(lVar32 + lVar40 * 4 + 8 + lVar25 * 4) = uVar12;
        local_388 = img_labels.img_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        goto LAB_00141616;
      }
      piVar3 = (int *)((long)local_350 * local_338 + lVar32 + 0xc + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 3 + (long)local_350 * lVar18 + lVar27) != '\0') {
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * local_308 + img.accesses_._16_8_ +
                         lVar40 * 4 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        uVar21 = (ulong)(iVar19 + 2) + lVar25;
        lVar18 = *(long *)img.img_._72_8_;
        uVar23 = lVar40 + 2 + lVar25;
        local_368 = uVar21;
        if (*(char *)(lVar40 + lVar25 + 2 + lVar18 * local_308 + img.img_._16_8_) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                          lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 8 +
                            lVar25 * 4);
          piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
          *piVar3 = *piVar3 + 1;
          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar42 + lVar32 * uVar22 + img_labels.img_._16_8_
                                                  ));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar40 * 4 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img_labels.img_._72_8_;
          uVar21 = uVar23;
          local_358 = img_labels.img_._16_8_;
        }
        else {
          piVar3 = (int *)(lVar42 + lVar41 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar39 + img.img_._16_8_ + lVar18 * lVar41) != '\0') goto LAB_001416de;
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                          lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 8 +
                            lVar25 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                  lVar39 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar40 * 4 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img_labels.img_._72_8_;
          uVar21 = uVar23;
          local_358 = img_labels.img_._16_8_;
        }
        goto LAB_00141f07;
      }
    }
    else {
      piVar3 = (int *)((long)local_350 * local_338 + lVar32 + 0xc + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 3 + (long)local_350 * lVar18 + lVar27) != '\0') {
        uVar21 = (ulong)(iVar19 + 2) + lVar25;
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * local_308 + img.accesses_._16_8_ +
                         lVar40 * 4 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar40 + lVar25 + 2 + lVar18 * local_308 + img.img_._16_8_) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                          lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 8 +
                            lVar25 * 4);
          piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
          *piVar3 = *piVar3 + 1;
          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar42 + lVar32 * uVar22 + img_labels.img_._16_8_
                                                  ));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar40 * 4 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          local_2d8 = img_labels.img_._16_8_;
          goto LAB_00144027;
        }
        piVar3 = (int *)(lVar42 + lVar41 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar39 + img.img_._16_8_ + lVar18 * lVar41) != '\0') goto LAB_001412a0;
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 8 + lVar25 * 4
                          );
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                lVar39 * 4));
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                         + lVar40 * 4 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        goto LAB_00144008;
      }
      piVar3 = (int *)(lVar37 + 0xc + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 3 + lVar35) == '\0') goto LAB_001412e0;
    }
    piVar3 = (int *)(local_338 * lVar41 + lVar32 + 0x10 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar25 + 4 + lVar18 * lVar41 + lVar27) != '\0') {
      piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                      *(long *)img.accesses_._72_8_ * (uVar22 - 2) + img.accesses_._16_8_);
      *piVar3 = *piVar3 + 1;
      uVar21 = (ulong)(iVar19 + 2) + lVar25;
      lVar35 = lVar18 * (uVar22 - 2);
      uVar23 = lVar40 + 2 + lVar25;
      if (*(char *)(((long)(local_360 + 0x300000000) >> 0x20) + img.img_._16_8_ + lVar35) == '\0') {
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 0x10 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 0x10 +
                          lVar25 * 4);
        piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar42 + lVar32 * uVar22 + img_labels.img_._16_8_))
        ;
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        lVar32 = img_labels.accesses_._16_8_;
        local_1f0 = local_1f8;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
        goto LAB_0013c935;
      }
      piVar3 = (int *)(*(long *)img.accesses_._72_8_ * local_308 + img.accesses_._16_8_ + lVar40 * 4
                       + 8 + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 2 + lVar27 + lVar18 * local_308) == '\0') {
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 0x10 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 0x10 +
                          lVar25 * 4);
        piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        uVar14 = *(uint *)(lVar42 + lVar32 * uVar22 + img_labels.img_._16_8_);
      }
      else {
        piVar3 = (int *)(lVar42 + lVar41 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar18 * lVar41 + img.img_._16_8_ + lVar39) != '\0') break;
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 0x10 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 0x10 +
                          lVar25 * 4);
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4);
        *piVar3 = *piVar3 + 1;
        uVar14 = *(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ + lVar39 * 4);
      }
      uVar10 = UFPC::MemMerge(uVar10,uVar14);
      local_328 = *(ulong *)img_labels.accesses_._72_8_;
      piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                      lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      local_1f8 = *(long *)img_labels.img_._72_8_;
      lVar32 = img_labels.accesses_._16_8_;
      local_1f0 = local_1f8;
      local_320 = (long *)img_labels.img_._72_8_;
      local_1e8 = img_labels.img_._16_8_;
      local_2d8 = img_labels.img_._16_8_;
      local_3c0 = img_labels.accesses_._16_8_;
      local_3b8 = img_labels.accesses_._16_8_;
      local_3b0 = (long *)img_labels.accesses_._72_8_;
      local_3a0 = img_labels.accesses_._16_8_;
      local_398 = (long *)img_labels.img_._16_8_;
      local_390 = img_labels.img_._16_8_;
      local_388 = img_labels.img_._16_8_;
      local_380 = img_labels.accesses_._16_8_;
      local_378 = img_labels.accesses_._16_8_;
      local_370 = img_labels.img_._16_8_;
      local_358 = img_labels.img_._16_8_;
      goto LAB_0013c935;
    }
    lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
             img_labels.accesses_._16_8_ + lVar40 * 4 + 8;
    piVar3 = (int *)(lVar18 + -8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    lVar35 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + lVar40 * 4 + 8;
    uVar12 = *(undefined4 *)(lVar35 + -8 + lVar25 * 4);
    piVar3 = (int *)(lVar18 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    *(undefined4 *)(lVar35 + lVar25 * 4) = uVar12;
    local_360 = local_360 + 0x200000000;
    lVar25 = lVar25 + 2;
  } while( true );
LAB_00141130:
  lVar18 = uVar22 - 2;
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_ + -4 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  cVar28 = *(char *)((uVar23 - 1) + lVar35 + img.img_._16_8_);
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * lVar18 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)(lVar18 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
  if (cVar28 != '\0') {
    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_398 = (long *)img_labels.img_._16_8_;
    local_3c0 = img_labels.accesses_._16_8_;
    local_358 = img_labels.img_._16_8_;
    local_3b8 = img_labels.accesses_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    lVar32 = img_labels.accesses_._16_8_;
    local_1f0 = local_1f8;
    local_320 = (long *)img_labels.img_._72_8_;
    local_1e8 = img_labels.img_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_0013c935;
  }
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(img_labels.accesses_._16_8_ + local_328 * uVar22 + -8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
LAB_001432e4:
  uVar14 = *(uint *)(img_labels.img_._16_8_ + local_1f8 * uVar22 + -8 + uVar23 * 4);
LAB_001432f8:
  uVar10 = UFPC::MemMerge(uVar10,uVar14);
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  lVar32 = img_labels.accesses_._16_8_;
  local_1f0 = local_1f8;
  local_320 = (long *)img_labels.img_._72_8_;
  local_1e8 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_3a0 = img_labels.accesses_._16_8_;
  local_398 = (long *)img_labels.img_._16_8_;
  local_390 = img_labels.img_._16_8_;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_358 = img_labels.img_._16_8_;
  goto LAB_0013c935;
LAB_001412e0:
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
  piVar3 = (int *)(lVar42 + lVar18);
  *piVar3 = *piVar3 + 1;
  uVar21 = (ulong)(iVar19 + iVar13 + 2);
  local_1f8 = *(long *)img_labels.img_._72_8_;
  lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
  uVar12 = *(undefined4 *)(lVar42 + lVar32);
  piVar3 = (int *)(lVar18 + lVar40 * 4 + 8 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(lVar32 + lVar40 * 4 + 8 + lVar25 * 4) = uVar12;
  local_388 = img_labels.img_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_358 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_2e8 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_2f8 = img_labels.accesses_._16_8_;
  local_348 = img_labels.accesses_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_2f0 = local_328;
  local_2e0 = local_1f8;
LAB_001426ab:
  lVar27 = (long)(int)uVar21;
  uVar21 = lVar27 + 2;
  uVar23 = uVar21;
  local_3c8 = (long *)img.img_._16_8_;
  if ((int)uVar21 < local_2d0) {
    local_338 = *(long *)img.accesses_._72_8_;
    lVar32 = local_338 * uVar22 + img.accesses_._16_8_;
    piVar3 = (int *)(lVar32 + 8 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar18 = *(long *)img.img_._72_8_;
    lVar35 = lVar18 * uVar22 + img.img_._16_8_;
    uVar29 = uVar22 | 1;
    uVar16 = uVar21;
    if (*(char *)(lVar27 + 2 + lVar35) == '\0') {
      local_338 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(local_338 * uVar29 + img.accesses_._16_8_ + 8 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar41 = lVar18 * uVar29 + img.img_._16_8_;
      lVar32 = img.accesses_._16_8_;
      if (*(char *)(lVar27 + 2 + lVar41) == '\0') goto LAB_0013c441;
      local_338 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 0xc + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar35 + 3 + lVar27) == '\0') {
        local_340 = local_2f0;
        local_300 = local_2f8;
        local_1f0 = local_2e0;
        local_1e8 = local_2e8;
LAB_0013e9ee:
        lVar32 = (long)(int)uVar21;
        piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + -4 + lVar32 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar32 + -1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0') {
          uVar10 = UFPC::MemNewLabel();
          local_3b0 = (long *)img_labels.accesses_._72_8_;
          local_328 = *(ulong *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f8 = *(long *)img_labels.img_._72_8_;
          *(uint *)(local_1f8 * uVar22 + img_labels.img_._16_8_ + lVar32 * 4) = uVar10;
          local_3a0 = img_labels.accesses_._16_8_;
          local_388 = img_labels.img_._16_8_;
          local_370 = img_labels.img_._16_8_;
          local_378 = img_labels.accesses_._16_8_;
          local_398 = (long *)img_labels.img_._16_8_;
          local_3c0 = img_labels.accesses_._16_8_;
          local_358 = img_labels.img_._16_8_;
          local_3b8 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
          local_348 = img_labels.accesses_._16_8_;
          local_2e8 = img_labels.img_._16_8_;
          local_2f8 = img_labels.accesses_._16_8_;
          local_390 = img_labels.img_._16_8_;
          local_380 = img_labels.accesses_._16_8_;
          local_300 = img_labels.accesses_._16_8_;
          local_1f0 = local_1f8;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1e8 = img_labels.img_._16_8_;
          local_340 = local_328;
          local_2f0 = local_328;
          local_2e0 = local_1f8;
        }
        else {
          lVar18 = local_340 * uVar22 + local_300;
          piVar3 = (int *)(lVar18 + -8 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          lVar27 = local_1f0 * uVar22 + local_1e8;
          uVar12 = *(undefined4 *)(lVar27 + -8 + lVar32 * 4);
          piVar3 = (int *)(lVar18 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar27 + lVar32 * 4) = uVar12;
        }
        goto LAB_0013eb15;
      }
      local_338 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(uVar29 * local_338 + img.accesses_._16_8_ + 4 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar41 + 1 + lVar27) == '\0') goto LAB_0013c469;
      lVar32 = uVar22 - 1;
      piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 0xc +
                      lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar25 = lVar18 * lVar32;
      if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar25) != '\0') {
        piVar3 = (int *)(lVar32 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar27 * 4)
        ;
        *piVar3 = *piVar3 + 1;
        if (*(char *)(img.img_._16_8_ + lVar25 + lVar27) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                  lVar27 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
        }
        else {
LAB_00142af1:
          uVar21 = uVar23 & 0xffffffff;
          lVar32 = uVar22 - 2;
          uVar23 = (ulong)(int)uVar23;
          piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + -4 +
                          uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)((uVar23 - 1) + lVar18 * lVar32 + img.img_._16_8_) != '\0') {
            lVar32 = lVar18 * (uVar22 - 1);
            goto LAB_0014449f;
          }
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          lVar27 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + uVar23 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar27 * uVar22 + img_labels.img_._16_8_ + -8 +
                                                  uVar23 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
        }
        lVar18 = *(long *)img_labels.img_._72_8_;
        local_368 = uVar21;
        uVar21 = uVar23;
        local_358 = img_labels.img_._16_8_;
        goto LAB_00141f07;
      }
    }
    else {
      piVar3 = (int *)(local_338 * uVar29 + img.accesses_._16_8_ + 4 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar27 + 1 + uVar29 * lVar18 + img.img_._16_8_) == '\0') goto LAB_0013bf40;
      lVar40 = local_338 * (uVar22 - 1) + img.accesses_._16_8_;
      piVar3 = (int *)(lVar40 + 0xc + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar25 = lVar18 * (uVar22 - 1);
      lVar41 = img.img_._16_8_ + lVar25;
      if (*(char *)(lVar27 + 3 + lVar41) != '\0') {
        piVar3 = (int *)(lVar40 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar41 + lVar27) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                  lVar27 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          uVar29 = uVar21;
          goto LAB_00144008;
        }
LAB_001427a7:
        lVar32 = uVar22 - 2;
        uVar29 = (ulong)(int)uVar21;
        piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + -4 + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)((uVar29 - 1) + lVar18 * lVar32 + img.img_._16_8_) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          lVar27 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + uVar29 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + -8 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          uVar14 = *(uint *)(lVar27 * uVar22 + img_labels.img_._16_8_ + -8 + uVar29 * 4);
          goto LAB_001446cb;
        }
        lVar35 = local_338 * (uVar22 - 1);
        lVar32 = (uVar22 - 1) * lVar18;
        goto LAB_0014238c;
      }
      piVar3 = (int *)(lVar32 + 0xc + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar35 + 3 + lVar27) == '\0') {
        piVar3 = (int *)(lVar40 + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar41 + 2 + lVar27) != '\0') {
          piVar3 = (int *)(lVar40 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar41 + lVar27) != '\0') goto LAB_00143453;
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                  lVar27 * 4));
          local_3c0 = img_labels.accesses_._16_8_;
          local_3b0 = (long *)img_labels.accesses_._72_8_;
          local_328 = *(ulong *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          local_398 = (long *)img_labels.img_._16_8_;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          local_300 = img_labels.accesses_._16_8_;
          uVar21 = uVar21 & 0xffffffff;
          local_1e8 = img_labels.img_._16_8_;
          local_3b8 = local_3c0;
          local_3a0 = local_3c0;
          local_390 = (long)local_398;
          local_388 = (long)local_398;
          local_380 = local_3c0;
          local_378 = local_3c0;
          local_370 = (long)local_398;
          local_358 = (long)local_398;
          local_348 = local_3c0;
          local_340 = local_328;
          local_2f8 = local_3c0;
          local_2f0 = local_328;
          local_2e8 = (long)local_398;
          local_2e0 = local_1f0;
          local_2d8 = (long)local_398;
          local_1f8 = local_1f0;
          goto LAB_0013ff7f;
        }
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
        piVar3 = (int *)(lVar18 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
        uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
        piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
        uVar21 = uVar21 & 0xffffffff;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
        local_348 = img_labels.accesses_._16_8_;
        local_320 = (long *)img_labels.img_._72_8_;
        local_2f8 = img_labels.accesses_._16_8_;
        local_2f0 = local_328;
        local_2d8 = img_labels.img_._16_8_;
        local_1f0 = local_1f8;
        local_1e8 = img_labels.img_._16_8_;
        goto LAB_00143c11;
      }
    }
    lVar32 = uVar22 - 1;
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 0x10 +
                    lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar25 = lVar25 + img.img_._16_8_;
    if (*(char *)(lVar27 + 4 + lVar25) == '\0') {
      piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 8 +
                      lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 2 + lVar27) == '\0') {
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
        piVar3 = (int *)(lVar18 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        local_2e0 = *(long *)img_labels.img_._72_8_;
        lVar32 = local_2e0 * uVar22 + img_labels.img_._16_8_;
        uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
        piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
        local_3a0 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_358 = img_labels.img_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_348 = img_labels.accesses_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_2e8 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_2f8 = img_labels.accesses_._16_8_;
        local_320 = (long *)img_labels.img_._72_8_;
        local_390 = img_labels.img_._16_8_;
        local_2f0 = local_328;
        local_1f8 = local_2e0;
LAB_00140595:
        do {
          iVar19 = (int)uVar21;
          lVar32 = (long)iVar19;
          uVar21 = lVar32 + 2;
          uVar10 = (uint)uVar21;
          local_360 = uVar21;
          if (local_2d0 <= (int)uVar10) {
            if (local_2d0 < (int)uVar10) goto LAB_001406d2;
            lVar18 = *(long *)img.accesses_._72_8_;
            lVar35 = lVar18 * uVar22 + img.accesses_._16_8_;
            piVar3 = (int *)(lVar35 + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = *(long *)img.img_._72_8_;
            lVar41 = lVar27 * uVar22 + img.img_._16_8_;
            if (*(char *)(lVar32 + 2 + lVar41) == '\0') {
              piVar3 = (int *)(lVar18 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar32 + 2 + (uVar22 | 1) * lVar27 + img.img_._16_8_) == '\0')
              goto LAB_00141da9;
              piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar41 + 3 + lVar32) == '\0') {
                lVar27 = local_2f0 * uVar22 + local_2f8;
                piVar3 = (int *)(lVar27 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = local_2e0 * uVar22 + local_2e8;
                uVar12 = *(undefined4 *)(lVar18 + lVar32 * 4);
                piVar3 = (int *)(lVar27 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar18 + 8 + lVar32 * 4) = uVar12;
                local_380 = local_2f8;
                local_2d8 = local_2e8;
                goto LAB_0014434a;
              }
              lVar35 = lVar32 + 3;
            }
            else {
              lVar35 = (long)(iVar19 + 3);
            }
            piVar3 = (int *)(img.accesses_._16_8_ + lVar18 * (uVar22 - 1) + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + img.img_._16_8_ + lVar27 * (uVar22 - 1)) == '\0') {
              lVar27 = local_2f0 * uVar22 + local_2f8;
              piVar3 = (int *)(lVar27 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar18 = local_2e0 * uVar22 + local_2e8;
              uVar12 = *(undefined4 *)(lVar18 + lVar32 * 4);
              piVar3 = (int *)(lVar27 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar18 + 8 + lVar32 * 4) = uVar12;
              local_380 = local_2f8;
              local_2d8 = local_2e8;
            }
            else {
              piVar3 = (int *)(local_2f0 * (uVar22 - 2) + local_2f8 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)((uVar22 - 2) * local_2e0 + local_2e8 + 8 + lVar32 * 4);
              piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 + lVar32 * 4))
              ;
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                               img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + 8 +
                       lVar32 * 4) = uVar10;
              local_380 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
            }
            goto LAB_0014434a;
          }
          local_338 = *(long *)img.accesses_._72_8_;
          lVar35 = local_338 * uVar22 + img.accesses_._16_8_;
          piVar3 = (int *)(lVar35 + 8 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          lVar27 = lVar18 * uVar22 + img.img_._16_8_;
          if (*(char *)(lVar32 + 2 + lVar27) != '\0') goto code_r0x001405fb;
          piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar32 + 2 + (uVar22 | 1) * lVar18 + img.img_._16_8_) != '\0') {
            piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar27 + 3 + lVar32) == '\0') {
              piVar3 = (int *)(local_2f8 + local_2f0 * uVar22 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(local_2e8 + local_2e0 * uVar22 + lVar32 * 4);
              local_340 = local_328;
              local_2f8 = local_348;
              piVar3 = (int *)(local_328 * uVar22 + local_348 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              local_2e0 = local_1f8;
              *(undefined4 *)(local_1f8 * uVar22 + local_2d8 + 8 + lVar32 * 4) = uVar12;
              local_300 = local_348;
              local_1f0 = local_1f8;
              local_1e8 = local_2d8;
              local_2f0 = local_340;
              local_2e8 = local_2d8;
              goto LAB_0013eb15;
            }
            local_338 = local_338 * (uVar22 - 1);
            piVar3 = (int *)(local_338 + img.accesses_._16_8_ + 0xc + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = lVar18 * (uVar22 - 1);
            if (*(char *)(lVar32 + 3 + img.img_._16_8_ + lVar18) == '\0') goto LAB_001408ef;
            piVar3 = (int *)(local_2f0 * (uVar22 - 2) + local_2f8 + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            uVar10 = *(uint *)((uVar22 - 2) * local_2e0 + local_2e8 + 8 + lVar32 * 4);
            piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 + lVar32 * 4));
            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = *(long *)img_labels.img_._72_8_;
            local_368 = uVar21 & 0xffffffff;
            local_358 = img_labels.img_._16_8_;
            goto LAB_00141f07;
          }
LAB_00140c32:
          iVar19 = (int)uVar21;
          uVar23 = (ulong)iVar19;
          piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(uVar23 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
            uVar23 = uVar21 & 0xffffffff;
            local_3c8 = (long *)img.img_._16_8_;
            lVar32 = img.accesses_._16_8_;
LAB_0013da0f:
            uVar29 = uVar22 | 1;
            iVar19 = (int)uVar23;
            lVar35 = (long)iVar19;
            piVar3 = (int *)(local_338 * uVar29 + lVar32 + 4 + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = lVar18 * uVar29;
            if (*(char *)(lVar35 + 1 + (long)local_3c8 + lVar27) != '\0') {
              uVar10 = UFPC::MemNewLabel();
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              lVar27 = local_328 * uVar22 + img_labels.accesses_._16_8_;
              piVar3 = (int *)(lVar27 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f8 = *(long *)img_labels.img_._72_8_;
              lVar41 = local_1f8 * uVar22 + img_labels.img_._16_8_;
              *(uint *)(lVar41 + lVar35 * 4) = uVar10;
              uVar21 = lVar35 + 2;
              iVar13 = (int)uVar21;
              local_300 = img_labels.accesses_._16_8_;
              local_1e8 = img_labels.img_._16_8_;
              local_340 = local_328;
              local_1f0 = local_1f8;
              local_3c8 = (long *)img.img_._16_8_;
              if (iVar13 < local_2d0) {
                local_320 = (long *)img_labels.img_._72_8_;
                local_338 = *(long *)img.accesses_._72_8_;
                lVar40 = local_338 * uVar22 + img.accesses_._16_8_;
                piVar3 = (int *)(lVar40 + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                lVar25 = lVar18 * uVar22 + img.img_._16_8_;
                local_2f0 = local_328;
                local_2e0 = local_1f8;
                if (*(char *)(lVar35 + 2 + lVar25) != '\0') {
                  local_390 = img_labels.img_._16_8_;
                  local_3a0 = img_labels.accesses_._16_8_;
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_398 = (long *)img_labels.img_._16_8_;
                  local_3c0 = img_labels.accesses_._16_8_;
                  local_358 = img_labels.img_._16_8_;
                  local_3b8 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  local_348 = img_labels.accesses_._16_8_;
                  local_2e8 = img_labels.img_._16_8_;
                  local_2f8 = img_labels.accesses_._16_8_;
                  goto LAB_0013ebdd;
                }
                piVar3 = (int *)(local_338 * uVar29 + img.accesses_._16_8_ + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                lVar32 = img.accesses_._16_8_;
                if (*(char *)(lVar35 + 2 + uVar29 * lVar18 + img.img_._16_8_) == '\0')
                goto LAB_0013c441;
                piVar3 = (int *)(lVar40 + 0xc + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar25 + 3 + lVar35) != '\0') {
                  lVar40 = (long)(iVar19 + 3);
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_398 = (long *)img_labels.img_._16_8_;
                  local_3c0 = img_labels.accesses_._16_8_;
                  local_358 = img_labels.img_._16_8_;
                  local_3b8 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  local_348 = img_labels.accesses_._16_8_;
                  local_2e8 = img_labels.img_._16_8_;
                  local_2f8 = img_labels.accesses_._16_8_;
                  local_3a0 = img_labels.accesses_._16_8_;
                  local_390 = img_labels.img_._16_8_;
                  local_368 = uVar21;
                  goto LAB_0013e8da;
                }
                piVar3 = (int *)(lVar27 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                uVar12 = *(undefined4 *)(lVar41 + lVar35 * 4);
                piVar3 = (int *)(lVar27 + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar41 + 8 + lVar35 * 4) = uVar12;
                local_390 = img_labels.img_._16_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                goto LAB_0013eb15;
              }
              local_338 = *(long *)img.accesses_._72_8_;
              lVar32 = local_338 * uVar22 + img.accesses_._16_8_;
              piVar3 = (int *)(lVar32 + 8 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              lVar18 = *(long *)img.img_._72_8_;
              lVar40 = lVar18 * uVar22 + img.img_._16_8_;
              cVar28 = *(char *)(lVar35 + 2 + lVar40);
              if (local_2d0 < iVar13) {
                if (cVar28 == '\0') goto LAB_00142094;
                goto LAB_0013f30c;
              }
              if (cVar28 != '\0') goto LAB_0013edd5;
              piVar3 = (int *)(local_338 * uVar29 + img.accesses_._16_8_ + 8 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar35 + 2 + uVar29 * lVar18 + img.img_._16_8_) == '\0') {
                uVar23 = uVar21 & 0xffffffff;
                goto LAB_0013c08b;
              }
              piVar3 = (int *)(lVar32 + 0xc + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar40 + 3 + lVar35) != '\0') goto LAB_0013f20e;
              piVar3 = (int *)(lVar27 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(lVar41 + lVar35 * 4);
              piVar3 = (int *)(lVar27 + 8 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar41 + 8 + lVar35 * 4) = uVar12;
              local_380 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              goto LAB_0014434a;
            }
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_328 = *(ulong *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            local_320 = (long *)img_labels.img_._72_8_;
            local_1f0 = *(long *)img_labels.img_._72_8_;
            *(undefined4 *)(local_1f0 * uVar22 + img_labels.img_._16_8_ + lVar35 * 4) = 0;
            uVar21 = lVar35 + 2;
            uVar10 = (uint)uVar21;
            local_3a0 = img_labels.accesses_._16_8_;
            local_1e8 = img_labels.img_._16_8_;
            local_1f8 = local_1f0;
            if (local_2d0 <= (int)uVar10) {
              piVar3 = (int *)(local_338 * uVar22 + lVar32 + 8 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              cVar28 = *(char *)(lVar35 + 2 + lVar18 * uVar22 + (long)local_3c8);
              if ((int)uVar10 <= local_2d0) {
                if (cVar28 == '\0') goto LAB_0013bec9;
                goto LAB_0013ef72;
              }
              uVar23 = uVar21;
              if (cVar28 == '\0') goto LAB_0013bfd9;
              goto LAB_0013f6f7;
            }
            piVar3 = (int *)(local_338 * uVar22 + lVar32 + 8 + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            local_388 = img_labels.img_._16_8_;
            local_380 = img_labels.accesses_._16_8_;
            local_370 = img_labels.img_._16_8_;
            local_378 = img_labels.accesses_._16_8_;
            local_398 = (long *)img_labels.img_._16_8_;
            local_3c0 = img_labels.accesses_._16_8_;
            local_358 = img_labels.img_._16_8_;
            local_3b8 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
            local_348 = img_labels.accesses_._16_8_;
            local_2e8 = img_labels.img_._16_8_;
            local_2f8 = img_labels.accesses_._16_8_;
            local_390 = img_labels.img_._16_8_;
            local_300 = img_labels.accesses_._16_8_;
            local_340 = local_328;
            local_2f0 = local_328;
            local_2e0 = local_1f0;
            if (*(char *)(lVar35 + 2 + lVar18 * uVar22 + (long)local_3c8) != '\0') {
LAB_0013e02e:
              iVar19 = (int)uVar21;
              uVar29 = (ulong)iVar19;
              lVar27 = local_338 * (uVar22 - 1) + lVar32;
              piVar3 = (int *)(lVar27 + 4 + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = (uVar22 - 1) * lVar18 + (long)local_3c8;
              if (*(char *)(uVar29 + 1 + lVar35) != '\0') {
                piVar3 = (int *)(lVar27 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                local_2d8 = local_1e8;
                if (*(char *)(lVar35 + uVar29) != '\0') {
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar29 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar29 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar29 * 4);
                  *piVar3 = *piVar3 + 1;
                  goto LAB_00144027;
                }
                piVar3 = (int *)(lVar27 + -4 + (long)iVar19 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + -1 + (long)iVar19) != '\0') goto LAB_0014461f;
                piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar29 * 4);
                piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                goto LAB_00144027;
              }
              piVar3 = (int *)(lVar32 + local_338 * uVar22 + 4 + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(uVar29 + 1 + lVar18 * uVar22 + (long)local_3c8) != '\0') {
                uVar16 = (ulong)iVar19;
                piVar3 = (int *)(lVar27 + 8 + uVar16 * 4);
                *piVar3 = *piVar3 + 1;
                cVar28 = *(char *)(lVar35 + 2 + uVar16);
                piVar3 = (int *)(lVar27 + uVar16 * 4);
                *piVar3 = *piVar3 + 1;
                if (cVar28 != '\0') {
                  if (*(char *)(lVar35 + uVar16) != '\0') goto LAB_0013c513;
                  piVar3 = (int *)(lVar27 + -4 + (long)iVar19 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = uVar29 + 1;
                  if (*(char *)(lVar35 + -1 + (long)iVar19) != '\0') goto LAB_00144e11;
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + 8 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + 8 + uVar16 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = local_348;
                  uVar23 = uVar16;
                  local_320 = local_320;
                  local_2d8 = local_2d8;
                  goto LAB_0013c935;
                }
                if (*(char *)(lVar35 + uVar16) != '\0') {
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar16 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_320 = local_320;
                  goto LAB_0013c62f;
                }
                lVar18 = (long)iVar19;
                piVar3 = (int *)(lVar27 + -4 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + -1 + lVar18) == '\0') {
                  uVar10 = UFPC::MemNewLabel();
                  local_3b0 = (long *)img_labels.accesses_._72_8_;
                  local_328 = *(ulong *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_2e0 = *(long *)img_labels.img_._72_8_;
                  *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + uVar16 * 4) = uVar10;
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_398 = (long *)img_labels.img_._16_8_;
                  local_3c0 = img_labels.accesses_._16_8_;
                  local_358 = img_labels.img_._16_8_;
                  local_3b8 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  local_348 = img_labels.accesses_._16_8_;
                  local_2e8 = img_labels.img_._16_8_;
                  local_3a0 = img_labels.accesses_._16_8_;
                  local_2f8 = img_labels.accesses_._16_8_;
                  local_320 = (long *)img_labels.img_._72_8_;
                  local_390 = img_labels.img_._16_8_;
                  local_2f0 = local_328;
                  local_1f8 = local_2e0;
                }
                else {
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)((uVar22 - 2) * local_1f0 + local_1e8 + -8 + lVar18 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_1f0 * uVar22 + local_1e8 + uVar16 * 4) = uVar12;
                }
                goto LAB_00140595;
              }
              uVar16 = (ulong)iVar19;
              piVar3 = (int *)(lVar27 + uVar16 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar35 + uVar16) == '\0') {
                lVar18 = (long)iVar19;
                piVar3 = (int *)(lVar27 + -4 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + -1 + lVar18) != '\0') {
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)((uVar22 - 2) * local_1f0 + local_1e8 + -8 + lVar18 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_1f0 * uVar22 + local_1e8 + uVar16 * 4) = uVar12;
                  goto LAB_0013e51e;
                }
                uVar10 = UFPC::MemNewLabel();
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                *piVar3 = *piVar3 + 1;
                local_320 = (long *)img_labels.img_._72_8_;
                local_2e0 = *(long *)img_labels.img_._72_8_;
                *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + uVar16 * 4) = uVar10;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_1e8 = img_labels.img_._16_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_300 = img_labels.accesses_._16_8_;
                local_340 = local_328;
                local_2f0 = local_328;
                local_1f8 = local_2e0;
                local_1f0 = local_2e0;
                goto LAB_0013e51e;
              }
              piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar16 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar16 * 4);
              piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
              *piVar3 = *piVar3 + 1;
LAB_0013ff7f:
              while( true ) {
                lVar32 = local_1f0 * uVar22 + local_1e8;
                *(uint *)(lVar32 + uVar16 * 4) = uVar10;
                lVar27 = (long)(int)uVar21;
                uVar23 = lVar27 + 2;
                uVar10 = (uint)uVar23;
                local_3c8 = (long *)img.img_._16_8_;
                if (local_2d0 <= (int)uVar10) {
                  local_338 = *(long *)img.accesses_._72_8_;
                  lVar35 = local_338 * uVar22 + img.accesses_._16_8_;
                  piVar3 = (int *)(lVar35 + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img.img_._72_8_;
                  lVar25 = lVar18 * uVar22 + img.img_._16_8_;
                  cVar28 = *(char *)(lVar27 + 2 + lVar25);
                  uVar21 = uVar23;
                  if (local_2d0 < (int)uVar10) {
                    if (cVar28 == '\0') goto LAB_00142d63;
                    piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                    lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                    goto LAB_0014301c;
                    lVar41 = local_338 * (uVar22 - 1);
                    lVar35 = (uVar22 - 1) * lVar18;
                  }
                  else {
                    uVar29 = uVar22 | 1;
                    lVar41 = local_338 * uVar29;
                    if (cVar28 == '\0') {
                      piVar3 = (int *)(img.accesses_._16_8_ + lVar41 + 8 + lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar40 = uVar29 * lVar18;
                      if (*(char *)(lVar27 + 2 + img.img_._16_8_ + lVar40) == '\0')
                      goto LAB_0013c08b;
                      piVar3 = (int *)(lVar35 + 0xc + lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar25 + 3 + lVar27) == '\0') goto LAB_00142e1c;
                    }
                    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 4 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar27 + 1 + uVar29 * lVar18 + img.img_._16_8_) == '\0')
                    goto LAB_0013c0c0;
                    lVar41 = local_338 * (uVar22 - 1);
                    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 0xc + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar35 = (uVar22 - 1) * lVar18;
                    if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar35) != '\0') goto LAB_001428f8;
                  }
                  piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar27 + 2 + lVar35 + img.img_._16_8_) != '\0') goto LAB_00142bf7;
                  lVar18 = local_340 * uVar22 + local_300;
                  piVar3 = (int *)(lVar18 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                  piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
                  local_380 = local_300;
                  local_2d8 = local_1e8;
                  goto LAB_0014434a;
                }
                local_338 = *(long *)img.accesses_._72_8_;
                lVar35 = local_338 * uVar22 + img.accesses_._16_8_;
                piVar3 = (int *)(lVar35 + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                lVar41 = lVar18 * uVar22 + img.img_._16_8_;
                uVar21 = uVar22 | 1;
                if (*(char *)(lVar27 + 2 + lVar41) == '\0') break;
                piVar3 = (int *)(local_338 * uVar21 + img.accesses_._16_8_ + 4 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar27 + 1 + uVar21 * lVar18 + img.img_._16_8_) == '\0') {
                  uVar23 = uVar23 & 0xffffffff;
                  goto LAB_0013bf40;
                }
                lVar25 = local_338 * (uVar22 - 1);
                piVar3 = (int *)(lVar25 + img.accesses_._16_8_ + 0xc + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar40 = (uVar22 - 1) * lVar18;
                if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar40) != '\0') {
                  uVar21 = uVar23 & 0xffffffff;
                  goto LAB_001427a7;
                }
                piVar3 = (int *)(lVar35 + 0xc + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar41 + 3 + lVar27) != '\0') goto LAB_001402ea;
                piVar3 = (int *)(lVar25 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(img.img_._16_8_ + lVar40 + 2 + lVar27) == '\0') {
                  piVar3 = (int *)(local_300 + local_340 * uVar22 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                  piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_2e0 * uVar22 + local_2e8 + 8 + lVar27 * 4) = uVar12;
                  local_1f0 = local_2e0;
                  local_1e8 = local_2e8;
                  uVar21 = uVar23 & 0xffffffff;
LAB_00143c11:
                  while( true ) {
                    iVar19 = (int)uVar21;
                    local_300 = local_2f8;
                    local_340 = local_2f0;
                    local_2e8 = local_1e8;
                    local_2e0 = local_1f0;
LAB_0013e51e:
                    lVar32 = (long)iVar19;
                    uVar23 = lVar32 + 2;
                    iVar13 = (int)uVar23;
                    uVar21 = uVar23;
                    if (local_2d0 <= iVar13) {
                      local_338 = *(long *)img.accesses_._72_8_;
                      piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 8 + lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar18 = *(long *)img.img_._72_8_;
                      cVar28 = *(char *)(lVar32 + 2 + lVar18 * uVar22 + img.img_._16_8_);
                      if (iVar13 <= local_2d0) {
                        if (cVar28 == '\0') goto LAB_0013f189;
                        lVar41 = local_338 * (uVar22 | 1);
                        lVar40 = (uVar22 | 1) * lVar18;
                        goto LAB_0013f1e0;
                      }
                      if (cVar28 == '\0') goto LAB_00142d63;
                      piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                      lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_3c8 = (long *)img.img_._16_8_;
                      if (*(char *)(lVar32 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                      goto LAB_0014301c;
                      local_338 = local_338 * (uVar22 - 1);
                      lVar18 = lVar18 * (uVar22 - 1);
                      goto LAB_0013f3b3;
                    }
                    local_338 = *(long *)img.accesses_._72_8_;
                    lVar40 = local_338 * uVar22 + img.accesses_._16_8_;
                    piVar3 = (int *)(lVar40 + 8 + lVar32 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img.img_._72_8_;
                    lVar27 = lVar18 * uVar22 + img.img_._16_8_;
                    if (*(char *)(lVar32 + 2 + lVar27) == '\0') goto LAB_0013e837;
                    piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                    lVar32 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar32 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                    goto LAB_0013bf40;
                    lVar41 = local_338 * (uVar22 - 1);
                    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 0xc + lVar32 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar35 = (uVar22 - 1) * lVar18;
                    if (*(char *)(lVar32 + 3 + lVar35 + img.img_._16_8_) != '\0') {
                      piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + 8 + lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + 8 + lVar32 * 4);
                      piVar3 = (int *)(local_340 * uVar22 + local_300 + lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 +
                                                              lVar32 * 4));
                      piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                       img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_360 = uVar23;
                      goto LAB_00140691;
                    }
                    piVar3 = (int *)(lVar40 + 0xc + lVar32 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar21 = uVar23 & 0xffffffff;
                    uVar16 = uVar23;
                    if (*(char *)(lVar27 + 3 + lVar32) != '\0') goto LAB_0013f072;
LAB_0013fa87:
                    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = (long)(int)uVar21;
                    if (*(char *)(uVar16 + lVar35 + img.img_._16_8_) != '\0') break;
                    local_328 = *(ulong *)img_labels.accesses_._72_8_;
                    lVar32 = local_328 * uVar22 + img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar32 + -8 + lVar18 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_1f8 = *(long *)img_labels.img_._72_8_;
                    lVar27 = local_1f8 * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar27 + -8 + lVar18 * 4);
                    piVar3 = (int *)(lVar32 + uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar27 + uVar16 * 4) = uVar12;
                    local_3c0 = img_labels.accesses_._16_8_;
                    local_3b8 = img_labels.accesses_._16_8_;
                    local_3b0 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.accesses_._16_8_;
                    local_398 = (long *)img_labels.img_._16_8_;
                    local_390 = img_labels.img_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_358 = img_labels.img_._16_8_;
                    local_348 = img_labels.accesses_._16_8_;
                    local_320 = (long *)img_labels.img_._72_8_;
                    local_2f8 = img_labels.accesses_._16_8_;
                    local_2f0 = local_328;
                    local_2d8 = img_labels.img_._16_8_;
                    local_1f0 = local_1f8;
                    local_1e8 = img_labels.img_._16_8_;
                  }
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar16 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 + -8 +
                                                          lVar18 * 4));
                  local_328 = *(ulong *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_1f0 = *(long *)img_labels.img_._72_8_;
                  uVar23 = uVar21;
LAB_0013fb30:
                  local_390 = img_labels.img_._16_8_;
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_398 = (long *)img_labels.img_._16_8_;
                  local_3c0 = img_labels.accesses_._16_8_;
                  local_358 = img_labels.img_._16_8_;
                  local_3b8 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  local_348 = img_labels.accesses_._16_8_;
                  local_2e8 = img_labels.img_._16_8_;
                  local_2f8 = img_labels.accesses_._16_8_;
                  local_3a0 = img_labels.accesses_._16_8_;
                  local_300 = img_labels.accesses_._16_8_;
                  uVar21 = uVar23;
                  local_1e8 = img_labels.img_._16_8_;
                  local_3b0 = (long *)img_labels.accesses_._72_8_;
                  local_340 = local_328;
                  local_320 = (long *)img_labels.img_._72_8_;
                  local_2f0 = local_328;
                  local_2e0 = local_1f0;
                  local_1f8 = local_1f0;
                }
                else {
LAB_00143453:
                  uVar21 = uVar23 & 0xffffffff;
                  lVar32 = uVar22 - 2;
                  uVar16 = (ulong)(int)uVar23;
                  piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + -4 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  cVar28 = *(char *)((uVar16 - 1) + lVar18 * lVar32 + img.img_._16_8_);
                  local_328 = *(ulong *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_328 * lVar32 + img_labels.accesses_._16_8_ + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_1f0 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(uint *)(lVar32 * local_1f0 + img_labels.img_._16_8_ + uVar16 * 4);
                  if (cVar28 == '\0') {
                    piVar3 = (int *)(img_labels.accesses_._16_8_ + local_328 * uVar22 + -8 +
                                    uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = UFPC::MemMerge(uVar10,*(uint *)(img_labels.img_._16_8_ +
                                                             local_1f0 * uVar22 + -8 + uVar16 * 4));
                    local_328 = *(ulong *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_1f0 = *(long *)img_labels.img_._72_8_;
                    local_1e8 = img_labels.img_._16_8_;
                    local_3c0 = img_labels.accesses_._16_8_;
                    local_3b8 = img_labels.accesses_._16_8_;
                    local_3b0 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.accesses_._16_8_;
                    local_398 = (long *)img_labels.img_._16_8_;
                    local_390 = img_labels.img_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_358 = img_labels.img_._16_8_;
                    local_348 = img_labels.accesses_._16_8_;
                    local_340 = local_328;
                    local_320 = (long *)img_labels.img_._72_8_;
                    local_300 = img_labels.accesses_._16_8_;
                    local_2f8 = img_labels.accesses_._16_8_;
                    local_2f0 = local_328;
                    local_2e8 = img_labels.img_._16_8_;
                    local_2e0 = local_1f0;
                    local_2d8 = img_labels.img_._16_8_;
                    local_1f8 = local_1f0;
                  }
                  else {
                    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_1e8 = img_labels.img_._16_8_;
                    local_3c0 = img_labels.accesses_._16_8_;
                    local_3b8 = img_labels.accesses_._16_8_;
                    local_3b0 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.accesses_._16_8_;
                    local_398 = (long *)img_labels.img_._16_8_;
                    local_390 = img_labels.img_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_358 = img_labels.img_._16_8_;
                    local_348 = img_labels.accesses_._16_8_;
                    local_340 = local_328;
                    local_320 = (long *)img_labels.img_._72_8_;
                    local_300 = img_labels.accesses_._16_8_;
                    local_2f8 = img_labels.accesses_._16_8_;
                    local_2f0 = local_328;
                    local_2e8 = img_labels.img_._16_8_;
                    local_2e0 = local_1f0;
                    local_2d8 = img_labels.img_._16_8_;
                    local_1f8 = local_1f0;
                  }
                }
              }
              lVar25 = local_338 * uVar21 + img.accesses_._16_8_;
              piVar3 = (int *)(lVar25 + 8 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = uVar21 * lVar18 + img.img_._16_8_;
              lVar32 = img.accesses_._16_8_;
              if (*(char *)(lVar27 + 2 + lVar40) == '\0') {
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_0013c441;
              }
              piVar3 = (int *)(lVar35 + 0xc + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar41 + 3 + lVar27) == '\0') {
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_0013e9ee;
              }
              piVar3 = (int *)(lVar25 + 4 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar40 + 1 + lVar27) == '\0') {
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_0013c469;
              }
              lVar25 = local_338 * (uVar22 - 1);
              piVar3 = (int *)(img.accesses_._16_8_ + lVar25 + 0xc + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = (uVar22 - 1) * lVar18;
              if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar40) != '\0') goto LAB_00142af1;
LAB_001402ea:
              lVar25 = lVar25 + img.accesses_._16_8_;
              piVar3 = (int *)(lVar25 + 0x10 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = lVar40 + img.img_._16_8_;
              if (*(char *)(lVar27 + 4 + lVar40) == '\0') {
                piVar3 = (int *)(lVar25 + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar40 + 2 + lVar27) != '\0') goto LAB_0014361f;
                lVar18 = local_2f0 * uVar22 + local_2f8;
                piVar3 = (int *)(lVar18 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar32 = local_2e0 * uVar22 + local_2e8;
                uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_00140595;
              }
              lVar32 = uVar22 - 2;
              piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 + 0xc + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              lVar41 = lVar18 * lVar32;
              if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar41) != '\0') {
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_00142f88;
              }
              piVar3 = (int *)(lVar25 + 8 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar40 + 2 + lVar27) == '\0') {
                piVar3 = (int *)(local_2f0 * lVar32 + local_2f8 + 0x10 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)(lVar32 * local_2e0 + local_2e8 + 0x10 + lVar27 * 4);
                piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 + lVar27 * 4
                                                        ));
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *(long *)img_labels.img_._72_8_;
                uVar21 = uVar23 & 0xffffffff;
                lVar32 = img_labels.accesses_._16_8_;
                local_1f0 = local_1f8;
                local_320 = (long *)img_labels.img_._72_8_;
                local_1e8 = img_labels.img_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_358 = img_labels.img_._16_8_;
                goto LAB_0013c935;
              }
              uVar21 = uVar23 & 0xffffffff;
              goto LAB_00143812;
            }
LAB_0013c2fe:
            lVar27 = (long)(int)uVar21;
            piVar3 = (int *)(local_338 * (uVar22 | 1) + lVar32 + lVar27 * 4);
            *piVar3 = *piVar3 + 1;
            local_3c8 = local_3c8;
            if (*(char *)(lVar27 + (uVar22 | 1) * lVar18 + (long)local_3c8) == '\0')
            goto LAB_0013c441;
            piVar3 = (int *)(local_338 * uVar22 + lVar32 + 4 + lVar27 * 4);
            *piVar3 = *piVar3 + 1;
            local_3c8 = local_3c8;
            if (*(char *)(lVar27 + 1 + lVar18 * uVar22 + (long)local_3c8) == '\0') {
              uVar10 = UFPC::MemNewLabel();
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f8 = *(long *)img_labels.img_._72_8_;
              *(uint *)(local_1f8 * uVar22 + img_labels.img_._16_8_ + lVar27 * 4) = uVar10;
              local_300 = img_labels.accesses_._16_8_;
              local_1f0 = local_1f8;
              local_320 = (long *)img_labels.img_._72_8_;
              local_1e8 = img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_3a0 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_390 = img_labels.img_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_340 = local_328;
              local_2f8 = img_labels.accesses_._16_8_;
              local_2f0 = local_328;
              local_2e8 = img_labels.img_._16_8_;
              local_2e0 = local_1f8;
              local_2d8 = img_labels.img_._16_8_;
              goto LAB_0013eb15;
            }
            goto LAB_0013c469;
          }
          lVar32 = img.accesses_._16_8_ + local_338 * (uVar22 - 1);
          piVar3 = (int *)(lVar32 + 4 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = img.img_._16_8_ + lVar18 * (uVar22 - 1);
          if (*(char *)(uVar23 + 1 + lVar18) != '\0') {
            lVar32 = *local_3b0;
            piVar3 = (int *)(lVar32 * (uVar22 - 2) + local_348 + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = *local_320;
            uVar10 = *(uint *)((uVar22 - 2) * lVar18 + local_2d8 + uVar23 * 4);
            piVar3 = (int *)(lVar32 * uVar22 + local_348 + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            local_368 = uVar21;
            uVar21 = uVar23;
            local_358 = local_2d8;
            goto LAB_00141f07;
          }
          uVar23 = (ulong)iVar19;
          piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar18 + 2 + uVar23) != '\0') {
            local_328 = *local_3b0;
            piVar3 = (int *)(local_328 * (uVar22 - 2) + local_348 + 8 + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            local_1f8 = *local_320;
            uVar10 = *(uint *)((uVar22 - 2) * local_1f8 + local_2d8 + 8 + uVar23 * 4);
            piVar3 = (int *)(local_328 * uVar22 + local_348 + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = local_348;
            local_1f0 = local_1f8;
            local_1e8 = local_2d8;
            goto LAB_0013c935;
          }
          uVar10 = UFPC::MemNewLabel();
          local_3c0 = img_labels.accesses_._16_8_;
          local_3b0 = (long *)img_labels.accesses_._72_8_;
          local_328 = *(ulong *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + (long)iVar19 * 4);
          *piVar3 = *piVar3 + 1;
          local_398 = (long *)img_labels.img_._16_8_;
          local_2e0 = *(long *)img_labels.img_._72_8_;
          *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + (long)iVar19 * 4) = uVar10;
          local_320 = (long *)img_labels.img_._72_8_;
          local_390 = img_labels.img_._16_8_;
          local_3b8 = local_3c0;
          local_3a0 = local_3c0;
          local_388 = (long)local_398;
          local_380 = local_3c0;
          local_378 = local_3c0;
          local_370 = (long)local_398;
          local_358 = (long)local_398;
          local_348 = local_3c0;
          local_2f8 = local_3c0;
          local_2f0 = local_328;
          local_2e8 = (long)local_398;
          local_2d8 = (long)local_398;
          local_1f8 = local_2e0;
        } while( true );
      }
      piVar3 = (int *)(lVar32 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + lVar27) == '\0') {
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                lVar27 * 4));
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                         + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f0 = *(long *)img_labels.img_._72_8_;
        local_390 = img_labels.img_._16_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_358 = img_labels.img_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_348 = img_labels.accesses_._16_8_;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
      }
      else {
LAB_0014361f:
        uVar21 = uVar23 & 0xffffffff;
        lVar32 = uVar22 - 2;
        uVar16 = (ulong)(int)uVar23;
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + -4 +
                        uVar16 * 4);
        *piVar3 = *piVar3 + 1;
        cVar28 = *(char *)((uVar16 - 1) + lVar18 * lVar32 + img.img_._16_8_);
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar16 * 4);
        *piVar3 = *piVar3 + 1;
        local_398 = (long *)img_labels.img_._16_8_;
        local_1f0 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_1f0 + img_labels.img_._16_8_ + uVar16 * 4);
        if (cVar28 == '\0') {
          piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * uVar22 + -8 + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = UFPC::MemMerge(uVar10,*(uint *)(img_labels.img_._16_8_ + local_1f0 * uVar22 + -8
                                                  + uVar16 * 4));
          local_3b0 = (long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          local_3a0 = img_labels.accesses_._16_8_;
          local_388 = img_labels.img_._16_8_;
          local_370 = img_labels.img_._16_8_;
          local_378 = img_labels.accesses_._16_8_;
          local_398 = (long *)img_labels.img_._16_8_;
          local_3c0 = img_labels.accesses_._16_8_;
          local_358 = img_labels.img_._16_8_;
          local_3b8 = img_labels.accesses_._16_8_;
          local_390 = img_labels.img_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
          local_380 = img_labels.accesses_._16_8_;
          local_348 = img_labels.accesses_._16_8_;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1e8 = img_labels.img_._16_8_;
        }
        else {
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1e8 = img_labels.img_._16_8_;
          local_3b8 = local_3c0;
          local_3a0 = local_3c0;
          local_390 = (long)local_398;
          local_388 = (long)local_398;
          local_380 = local_3c0;
          local_378 = local_3c0;
          local_370 = (long)local_398;
          local_358 = (long)local_398;
          local_348 = local_3c0;
          local_2d8 = (long)local_398;
        }
      }
      goto LAB_0013c62f;
    }
    lVar35 = uVar22 - 2;
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_ + 0xc +
                    lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar41 = lVar18 * lVar35;
    lVar40 = *(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_;
    if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar41) == '\0') {
      piVar3 = (int *)(lVar40 + 8 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 2 + lVar27) == '\0') goto LAB_0014390c;
      piVar3 = (int *)(lVar32 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + lVar27) != '\0') {
LAB_00143812:
        lVar18 = uVar22 - 2;
        uVar23 = (ulong)(int)uVar21;
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_ + -4 +
                        uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)((uVar23 - 1) + lVar41 + img.img_._16_8_) != '\0') goto LAB_0014383e;
        lVar32 = *(long *)img_labels.accesses_._72_8_ * lVar18 + img_labels.accesses_._16_8_;
        uVar23 = (ulong)(int)uVar21;
        piVar3 = (int *)(lVar32 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
        uVar10 = *(uint *)(lVar18 + uVar23 * 4);
        piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar18 + 8 + uVar23 * 4));
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                         + -8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + -8 +
                          uVar23 * 4);
        goto LAB_00143894;
      }
      lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar35 + img_labels.accesses_._16_8_;
      piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar32 = lVar35 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
      uVar10 = *(uint *)(lVar32 + 8 + lVar27 * 4);
      piVar3 = (int *)(lVar18 + 0x10 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 + 0x10 + lVar27 * 4));
      piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_ +
                      lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ +
                        lVar27 * 4);
    }
    else {
      piVar3 = (int *)(lVar40 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + lVar27) != '\0') {
LAB_00142f88:
        uVar23 = (ulong)(int)uVar21;
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 2) + img.accesses_._16_8_ + -4 +
                        uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)((uVar23 - 1) + lVar41 + img.img_._16_8_) != '\0') goto LAB_00142480;
LAB_0014383e:
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar14 = *(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ + -8 + uVar23 * 4);
LAB_00143894:
        uVar10 = UFPC::MemMerge(uVar10,uVar14);
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        lVar32 = img_labels.accesses_._16_8_;
        local_1f0 = local_1f8;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
        goto LAB_0013c935;
      }
LAB_0014390c:
      lVar18 = *(long *)img_labels.accesses_._72_8_;
      piVar3 = (int *)(lVar18 * lVar35 + img_labels.accesses_._16_8_ + 0x10 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar32 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(uint *)(lVar35 * lVar32 + img_labels.img_._16_8_ + 0x10 + lVar27 * 4);
      piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      uVar14 = *(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ + lVar27 * 4);
    }
    uVar10 = UFPC::MemMerge(uVar10,uVar14);
    local_328 = *(ulong *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f8 = *(long *)img_labels.img_._72_8_;
    lVar32 = img_labels.accesses_._16_8_;
    local_1f0 = local_1f8;
    local_320 = (long *)img_labels.img_._72_8_;
    local_1e8 = img_labels.img_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    local_3c0 = img_labels.accesses_._16_8_;
    local_3b8 = img_labels.accesses_._16_8_;
    local_3b0 = (long *)img_labels.accesses_._72_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_398 = (long *)img_labels.img_._16_8_;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_358 = img_labels.img_._16_8_;
    goto LAB_0013c935;
  }
  local_338 = *(long *)img.accesses_._72_8_;
  lVar32 = local_338 * uVar22 + img.accesses_._16_8_;
  piVar3 = (int *)(lVar32 + 8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  lVar18 = *(long *)img.img_._72_8_;
  lVar35 = lVar18 * uVar22 + img.img_._16_8_;
  cVar28 = *(char *)(lVar27 + 2 + lVar35);
  if (local_2d0 < (int)uVar21) {
    if (cVar28 == '\0') goto LAB_00142d63;
    piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0') goto LAB_0014301c;
    lVar32 = local_338 * (uVar22 - 1);
    lVar41 = (uVar22 - 1) * lVar18;
  }
  else {
    uVar29 = uVar22 | 1;
    lVar41 = local_338 * uVar29;
    if (cVar28 == '\0') {
      piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 8 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar40 = uVar29 * lVar18;
      if (*(char *)(lVar27 + 2 + img.img_._16_8_ + lVar40) == '\0') goto LAB_0013c08b;
      piVar3 = (int *)(lVar32 + 0xc + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar35 + 3 + lVar27) == '\0') {
LAB_00142e1c:
        iVar19 = (int)uVar23;
        goto LAB_00142d8d;
      }
    }
    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 4 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar27 + 1 + uVar29 * lVar18 + img.img_._16_8_) == '\0') goto LAB_0013c0c0;
    lVar32 = local_338 * (uVar22 - 1);
    piVar3 = (int *)(lVar32 + img.accesses_._16_8_ + 0xc + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar41 = (uVar22 - 1) * lVar18;
    if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar41) != '\0') {
      piVar3 = (int *)(lVar32 + img.accesses_._16_8_ + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(img.img_._16_8_ + lVar41 + lVar27) == '\0') {
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                lVar27 * 4));
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                         + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + 8 + lVar27 * 4
                 ) = uVar10;
        local_380 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        goto LAB_0014434a;
      }
LAB_001428f8:
      lVar32 = uVar22 - 2;
      uVar10 = (uint)uVar23;
      lVar27 = (long)(int)uVar10;
      piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + -4 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar27 + -1 + lVar18 * lVar32 + img.img_._16_8_) == '\0') {
        lVar35 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar35 * lVar32 + img_labels.accesses_._16_8_ + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * lVar18 + img_labels.img_._16_8_ + lVar27 * 4);
        lVar32 = lVar35 * uVar22 + img_labels.accesses_._16_8_;
        goto LAB_00143136;
      }
      lVar32 = lVar18 * (uVar22 - 1);
      goto LAB_00142931;
    }
  }
  piVar3 = (int *)(lVar32 + img.accesses_._16_8_ + 8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar27 + 2 + img.img_._16_8_ + lVar41) != '\0') goto LAB_00142bdf;
  lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_;
  piVar3 = (int *)(lVar18 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
  uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
  piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
  local_380 = img_labels.accesses_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  goto LAB_0014434a;
LAB_00142bdf:
  uVar10 = (uint)uVar21;
  lVar27 = (long)(int)uVar10;
  piVar3 = (int *)(lVar32 + img.accesses_._16_8_ + -8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar27 + -2 + lVar41 + img.img_._16_8_) != '\0') goto LAB_00142bf7;
  lVar32 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(lVar32 * (uVar22 - 2) + img_labels.accesses_._16_8_ + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  lVar18 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)((uVar22 - 2) * lVar18 + img_labels.img_._16_8_ + lVar27 * 4);
  lVar32 = lVar32 * uVar22 + img_labels.accesses_._16_8_;
LAB_00143136:
  piVar3 = (int *)(lVar32 + -8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  uVar14 = *(uint *)(lVar18 * uVar22 + img_labels.img_._16_8_ + -8 + lVar27 * 4);
  goto LAB_00143146;
code_r0x001405fb:
  local_338 = local_338 * (uVar22 - 1);
  piVar3 = (int *)(img.accesses_._16_8_ + local_338 + 0xc + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  lVar18 = lVar18 * (uVar22 - 1);
  if (*(char *)(lVar32 + 3 + lVar18 + img.img_._16_8_) != '\0') {
    piVar3 = (int *)(local_2f0 * (uVar22 - 2) + local_2f8 + 8 + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = *(uint *)((uVar22 - 2) * local_2e0 + local_2e8 + 8 + lVar32 * 4);
    piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 + lVar32 * 4));
    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_ + 8
                    + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
LAB_00140691:
    local_1f0 = *(long *)img_labels.img_._72_8_;
    uVar29 = local_360;
    goto LAB_001406a9;
  }
  piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar27 + 3 + lVar32) != '\0') goto LAB_001408ef;
  piVar3 = (int *)(local_2f8 + local_2f0 * uVar22 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  uVar12 = *(undefined4 *)(local_2e8 + local_2e0 * uVar22 + lVar32 * 4);
  piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + 8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(local_2e0 * uVar22 + local_2e8 + 8 + lVar32 * 4) = uVar12;
  local_398 = local_398;
  local_348 = local_348;
  local_3b8 = local_3b8;
  goto LAB_001426ab;
LAB_001408ef:
  piVar3 = (int *)(img.accesses_._16_8_ + local_338 + 0x10 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar32 + 4 + img.img_._16_8_ + lVar18) != '\0') goto code_r0x00140905;
  local_2f8 = local_2f8 + local_2f0 * uVar22;
  piVar3 = (int *)(local_2f8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  local_2e8 = local_2e8 + local_2e0 * uVar22;
  uVar12 = *(undefined4 *)(local_2e8 + lVar32 * 4);
  piVar3 = (int *)(local_2f8 + 8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(local_2e8 + 8 + lVar32 * 4) = uVar12;
  goto LAB_00140dee;
code_r0x00140905:
  piVar3 = (int *)(local_2f0 * (uVar22 - 2) + local_2f8 + 0x10 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  uVar10 = *(uint *)((uVar22 - 2) * local_2e0 + local_2e8 + 0x10 + lVar32 * 4);
  piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 + lVar32 * 4));
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  lVar32 = img_labels.accesses_._16_8_;
  uVar23 = uVar21;
  local_1f0 = local_1f8;
  local_320 = (long *)img_labels.img_._72_8_;
  local_1e8 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_3a0 = img_labels.accesses_._16_8_;
  local_398 = (long *)img_labels.img_._16_8_;
  local_390 = img_labels.img_._16_8_;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_358 = img_labels.img_._16_8_;
  goto LAB_0013c935;
LAB_0013e837:
  lVar35 = local_338 * (uVar22 | 1) + img.accesses_._16_8_;
  lVar40 = (long)(int)uVar21;
  piVar3 = (int *)(lVar35 + lVar40 * 4);
  *piVar3 = *piVar3 + 1;
  lVar27 = (uVar22 | 1) * lVar18 + img.img_._16_8_;
  local_3c8 = (long *)img.img_._16_8_;
  lVar32 = img.accesses_._16_8_;
  if (*(char *)(lVar40 + lVar27) != '\0') {
    piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 + lVar40 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar40 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0') goto LAB_0013e9ee;
    piVar3 = (int *)(lVar35 + -4 + lVar40 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar27 + -1 + lVar40) != '\0') {
      lVar40 = lVar40 + 1;
      local_368 = uVar21;
LAB_0013e8da:
      lVar41 = local_338 * (uVar22 - 1);
      piVar3 = (int *)(img.accesses_._16_8_ + lVar41 + lVar40 * 4);
      *piVar3 = *piVar3 + 1;
      lVar35 = (uVar22 - 1) * lVar18;
      if (*(char *)(lVar40 + img.img_._16_8_ + lVar35) != '\0') {
        uVar21 = (ulong)(int)local_368;
        piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar21 * 4);
        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + uVar21 * 4));
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                        + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = *(long *)img_labels.img_._72_8_;
        local_358 = img_labels.img_._16_8_;
        goto LAB_00141f07;
      }
      uVar23 = local_368 & 0xffffffff;
LAB_0013f072:
      uVar21 = uVar23;
      uVar23 = (ulong)(int)uVar21;
      piVar3 = (int *)(img.accesses_._16_8_ + lVar41 + 8 + uVar23 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(uVar23 + 2 + img.img_._16_8_ + lVar35) == '\0') goto LAB_0013f449;
      lVar32 = uVar22 - 2;
      piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 + 4 + uVar23 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(uVar23 + 1 + img.img_._16_8_ + lVar18 * lVar32) == '\0') {
        uVar29 = (ulong)(int)uVar21;
        piVar3 = (int *)(img.accesses_._16_8_ + lVar41 + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = local_340 * lVar32 + local_300;
        lVar32 = lVar32 * local_1f0 + local_1e8;
        if (*(char *)(img.img_._16_8_ + lVar35 + uVar29) == '\0') {
          piVar3 = (int *)(lVar18 + 8 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          uVar14 = *(uint *)(lVar32 + 8 + uVar23 * 4);
          piVar3 = (int *)(local_300 + local_340 * uVar22 + -8 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = *(uint *)(local_1e8 + local_1f0 * uVar22 + -8 + uVar29 * 4);
        }
        else {
          piVar3 = (int *)(lVar18 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = *(uint *)(lVar32 + uVar29 * 4);
          piVar3 = (int *)(lVar18 + 8 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          uVar14 = UFPC::MemMerge(uVar10,*(uint *)(lVar32 + 8 + uVar23 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + -8 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + -8
                            + uVar29 * 4);
        }
        uVar10 = UFPC::MemMerge(uVar14,uVar10);
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        uVar21 = uVar21 & 0xffffffff;
        lVar32 = img_labels.accesses_._16_8_;
        uVar23 = uVar29;
        local_1f0 = local_1f8;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
      }
      else {
        piVar3 = (int *)(local_340 * lVar32 + local_300 + 8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = *(uint *)(lVar32 * local_1f0 + local_1e8 + 8 + uVar23 * 4);
        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + uVar23 * 4));
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        uVar21 = uVar21 & 0xffffffff;
        lVar32 = img_labels.accesses_._16_8_;
        local_1f0 = local_1f8;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
      }
      goto LAB_0013c935;
    }
    goto LAB_0013c469;
  }
LAB_0013c441:
  piVar3 = (int *)(local_338 * uVar22 + lVar32 + 4 + (long)(int)uVar21 * 4);
  *piVar3 = *piVar3 + 1;
  uVar23 = uVar21 & 0xffffffff;
  if (*(char *)((long)(int)uVar21 + 1 + lVar18 * uVar22 + (long)local_3c8) != '\0')
  goto LAB_0013c469;
  goto LAB_0013da0f;
LAB_00142480:
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + uVar23 * 4)
  ;
  *piVar3 = *piVar3 + 1;
  lVar27 = uVar22 - 2;
  local_398 = (long *)img_labels.img_._16_8_;
  local_320 = (long *)img_labels.img_._72_8_;
  lVar32 = img_labels.accesses_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_1e8 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  if (*(char *)(uVar23 + lVar18 * (uVar22 - 1) + img.img_._16_8_) != '\0') {
    local_328 = *(ulong *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_328 * lVar27 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f8 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)(lVar27 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f0 = local_1f8;
    local_3b8 = img_labels.accesses_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_358 = img_labels.img_._16_8_;
    goto LAB_0013c935;
  }
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  cVar28 = *(char *)(uVar23 + img.img_._16_8_ + lVar18 * lVar27);
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * lVar27 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)(lVar27 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
  if (cVar28 != '\0') {
    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_380 = img_labels.accesses_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_1f0 = local_1f8;
    local_3b8 = local_3c0;
    local_390 = (long)local_398;
    local_388 = (long)local_398;
    local_378 = local_3c0;
    local_370 = (long)local_398;
    local_358 = (long)local_398;
    goto LAB_0013c935;
  }
  piVar3 = (int *)(img_labels.accesses_._16_8_ + local_328 * uVar22 + -8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  goto LAB_001432e4;
LAB_00144e11:
  lVar27 = uVar22 - 2;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  lVar18 = lVar18 * lVar27 + (long)local_3c8;
  iVar19 = (int)uVar21;
  if (*(char *)(lVar32 + lVar18) == '\0') {
    lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar27 + img_labels.accesses_._16_8_;
    lVar32 = (long)iVar19;
    piVar3 = (int *)(lVar18 + -8 + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
    lVar27 = lVar27 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
    uVar10 = *(uint *)(lVar27 + -8 + lVar32 * 4);
    piVar3 = (int *)(lVar18 + 8 + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
  }
  else {
    uVar23 = (ulong)iVar19;
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_328 = *(ulong *)img_labels.accesses_._72_8_;
    lVar32 = local_328 * lVar27 + img_labels.accesses_._16_8_;
    if (*(char *)(lVar18 + uVar23) != '\0') {
      piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
      *piVar3 = *piVar3 + 1;
      local_1f8 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(uint *)(lVar27 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
      goto LAB_0013c872;
    }
    piVar3 = (int *)(lVar32 + -8 + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar27 = lVar27 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
    uVar10 = *(uint *)(lVar27 + -8 + uVar23 * 4);
    piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
  }
  uVar23 = (ulong)iVar19;
  uVar14 = *(uint *)(lVar27 + 8 + uVar23 * 4);
  goto LAB_0013c8bd;
LAB_0013f449:
  uVar16 = (ulong)(int)uVar21;
  piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + uVar16 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar16 + lVar35 + img.img_._16_8_) != '\0') {
    piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar16 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar16 * 4);
    piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar16 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = UFPC::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + uVar16 * 4));
    local_3b0 = (long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_ +
                    uVar16 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f0 = *(long *)img_labels.img_._72_8_;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_398 = (long *)img_labels.img_._16_8_;
    local_3c0 = img_labels.accesses_._16_8_;
    local_358 = img_labels.img_._16_8_;
    local_3b8 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_348 = img_labels.accesses_._16_8_;
    local_320 = (long *)img_labels.img_._72_8_;
    local_1e8 = img_labels.img_._16_8_;
    goto LAB_0013c62f;
  }
  local_300 = local_300 + local_340 * uVar22;
  piVar3 = (int *)(local_300 + -8 + uVar16 * 4);
  *piVar3 = *piVar3 + 1;
  local_1e8 = local_1e8 + local_1f0 * uVar22;
  uVar12 = *(undefined4 *)(local_1e8 + -8 + uVar16 * 4);
  piVar3 = (int *)(local_300 + uVar16 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(local_1e8 + uVar16 * 4) = uVar12;
  goto LAB_00140595;
LAB_0013c469:
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(local_338 * (uVar22 - 1) + lVar32 + 4 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar23 + 1 + (uVar22 - 1) * lVar18 + (long)local_3c8) != '\0') {
    lVar32 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(lVar32 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar18 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)((uVar22 - 2) * lVar18 + img_labels.img_._16_8_ + uVar23 * 4);
    piVar3 = (int *)(lVar32 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_368 = uVar21;
    uVar21 = uVar23;
    local_358 = img_labels.img_._16_8_;
    goto LAB_00141f07;
  }
LAB_0013c4de:
  uVar23 = (ulong)(int)uVar21;
  lVar32 = local_338 * (uVar22 - 1) + lVar32;
  piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  lVar27 = (uVar22 - 1) * lVar18 + (long)local_3c8;
  cVar28 = *(char *)(uVar23 + 2 + lVar27);
  piVar3 = (int *)(lVar32 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  cVar5 = *(char *)(uVar23 + lVar27);
  if (cVar28 != '\0') {
    if (cVar5 != '\0') goto LAB_0013c513;
    local_328 = *(ulong *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_328 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f8 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)((uVar22 - 2) * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
    goto LAB_0013c872;
  }
  if (cVar5 != '\0') {
    local_3b0 = (long *)img_labels.accesses_._72_8_;
    lVar18 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f0 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + img_labels.img_._16_8_ + uVar23 * 4);
    piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_398 = (long *)img_labels.img_._16_8_;
    local_3c0 = img_labels.accesses_._16_8_;
    local_358 = img_labels.img_._16_8_;
    local_3b8 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_348 = img_labels.accesses_._16_8_;
    uVar16 = uVar23;
    local_320 = (long *)img_labels.img_._72_8_;
    local_1e8 = img_labels.img_._16_8_;
    goto LAB_0013c62f;
  }
  uVar10 = UFPC::MemNewLabel();
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_2e0 = *(long *)img_labels.img_._72_8_;
  *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = uVar10;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_398 = (long *)img_labels.img_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_358 = img_labels.img_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_348 = img_labels.accesses_._16_8_;
  local_2e8 = img_labels.img_._16_8_;
  local_3a0 = img_labels.accesses_._16_8_;
  local_2f8 = img_labels.accesses_._16_8_;
  local_320 = (long *)img_labels.img_._72_8_;
  local_390 = img_labels.img_._16_8_;
  local_2f0 = local_328;
  local_1f8 = local_2e0;
  goto LAB_00140595;
LAB_0013c513:
  lVar32 = uVar22 - 2;
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 4 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar23 + 1 + lVar18 * lVar32 + (long)local_3c8) == '\0') goto LAB_0013c881;
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * lVar32 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)(lVar32 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
LAB_0013c872:
  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = img_labels.accesses_._16_8_;
  local_1f0 = local_1f8;
  local_320 = (long *)img_labels.img_._72_8_;
  local_1e8 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_3a0 = img_labels.accesses_._16_8_;
  local_398 = (long *)img_labels.img_._16_8_;
  local_390 = img_labels.img_._16_8_;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_358 = img_labels.img_._16_8_;
  goto LAB_0013c935;
LAB_0013c881:
  lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar32 + img_labels.accesses_._16_8_;
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(lVar18 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = lVar32 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
  uVar10 = *(uint *)(lVar32 + uVar23 * 4);
  piVar3 = (int *)(lVar18 + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  uVar14 = *(uint *)(lVar32 + 8 + uVar23 * 4);
  goto LAB_0013c8bd;
code_r0x0014418a:
  lVar18 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_308 * lVar18 + lVar40 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  lVar37 = *(long *)img_labels.img_._72_8_;
  uVar12 = *(undefined4 *)(local_308 * lVar37 + lVar42 + lVar25 * 4);
  piVar3 = (int *)(lVar18 * uVar22 + lVar40 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(lVar37 * uVar22 + lVar42 + lVar25 * 4) = uVar12;
  local_360 = local_360 + 0x200000000;
  lVar25 = lVar25 + 2;
  goto LAB_001440cd;
LAB_0013efd3:
  lVar32 = uVar22 - 2;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar23 + lVar18 * lVar32 + img.img_._16_8_) != '\0') {
LAB_001451cf:
    lVar18 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = *(long *)img_labels.img_._72_8_;
    uVar12 = *(undefined4 *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
    piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = lVar32 * uVar22 + img_labels.img_._16_8_;
LAB_00144341:
    *(undefined4 *)(lVar32 + uVar23 * 4) = uVar12;
    local_380 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_0014434a;
  }
  lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar32 + img_labels.accesses_._16_8_;
  piVar3 = (int *)(lVar18 + -8 + (long)(int)uVar10 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = lVar32 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
  uVar10 = *(uint *)(lVar32 + -8 + (long)(int)uVar10 * 4);
  piVar3 = (int *)(lVar18 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  uVar14 = *(uint *)(lVar32 + uVar23 * 4);
  goto LAB_0013f6e2;
LAB_0014212a:
  lVar27 = (long)(int)uVar10;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 1) + img.accesses_._16_8_ + 4 +
                  lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = lVar18 * (uVar22 - 1);
  if (*(char *)(lVar27 + 1 + img.img_._16_8_ + lVar32) == '\0') {
    lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_;
    piVar3 = (int *)(lVar18 + -8 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
    uVar12 = *(undefined4 *)(lVar32 + -8 + lVar27 * 4);
    piVar3 = (int *)(lVar18 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    *(undefined4 *)(lVar32 + lVar27 * 4) = uVar12;
    local_380 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_0014434a;
  }
LAB_00142931:
  uVar23 = (ulong)(int)uVar10;
  piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + uVar23 * 4)
  ;
  *piVar3 = *piVar3 + 1;
  lVar27 = uVar22 - 2;
  if (*(char *)(uVar23 + lVar32 + img.img_._16_8_) != '\0') {
    lVar18 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(lVar18 * lVar27 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = *(long *)img_labels.img_._72_8_;
    uVar12 = *(undefined4 *)(lVar27 * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
    piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = lVar32 * uVar22 + img_labels.img_._16_8_;
LAB_001429ac:
    *(undefined4 *)(lVar32 + uVar23 * 4) = uVar12;
    local_380 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_0014434a;
  }
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  cVar28 = *(char *)(uVar23 + img.img_._16_8_ + lVar18 * lVar27);
  lVar18 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(lVar18 * lVar27 + img_labels.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)(lVar27 * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
  lVar18 = lVar18 * uVar22;
  if (cVar28 != '\0') {
    piVar3 = (int *)(lVar18 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    *(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = uVar10;
    local_380 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_0014434a;
  }
  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + -8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1e8 = img_labels.img_._16_8_ + lVar32 * uVar22;
LAB_0013f403:
  uVar14 = *(uint *)(local_1e8 + -8 + uVar23 * 4);
LAB_0013f6e2:
  uVar10 = UFPC::MemMerge(uVar10,uVar14);
  goto LAB_001430a8;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
	{
		const int h = img_.rows;
		const int w = img_.cols;

		LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
		LabelsSolver::MemSetup();

		//Data structure for memory test
		MemMat<unsigned char> img(img_);
		MemMat<int> img_labels(img_.size(), 0);

		// We work with 2x2 blocks
		// +-+-+-+
		// |P|Q|R|
		// +-+-+-+
		// |S|X|
		// +-+-+

		// The pixels are named as follows
		// +---+---+---+
		// |a b|c d|e f|
		// |g h|i j|k l|
		// +---+---+---+
		// |m n|o p|
		// |q r|s t|
		// +---+---+

		// Pixels a, f, l, q are not needed, since we need to understand the
		// the connectivity between these blocks and those pixels only metter
		// when considering the outer connectivities

		// A bunch of defines used to check if the pixels are foreground,
		// without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

				// Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
				// Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
				//Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
				// Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
				// Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
				// Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
				// Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
				//Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
				// Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
				// Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
				// Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
				// Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
				// Action 13: not used
#define ACTION_13 
				// Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
				//Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
				//Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


		if (h == 1) {
			// Single line
			int r = 0;
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				int r = 0;
				int c = -2;
#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < h - (h % 2); r += 2) {
				int c = -2;
				goto tree_0;
#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case that the rows are odd)
			if ((h % 2) == 1)
			{
				int r = h - 1;
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}

		n_labels_ = LabelsSolver::MemFlatten();

		// Second scan
		for (int r = 0; r < h; r += 2) {
			for (int c = 0; c < w; c += 2) {
				int iLabel = img_labels(r, c);
				if (iLabel > 0) {
					iLabel = LabelsSolver::MemGetLabel(iLabel);
					if (img(r, c) > 0)
						img_labels(r, c) = iLabel;
					else
						img_labels(r, c) = 0;
					if (c + 1 < w) {
						if (img(r, c + 1) > 0)
							img_labels(r, c + 1) = iLabel;
						else
							img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							if (img(r + 1, c) > 0)
								img_labels(r + 1, c) = iLabel;
							else
								img_labels(r + 1, c) = 0;
							if (img(r + 1, c + 1) > 0)
								img_labels(r + 1, c + 1) = iLabel;
							else
								img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						if (img(r + 1, c) > 0)
							img_labels(r + 1, c) = iLabel;
						else
							img_labels(r + 1, c) = 0;
					}
				}
				else {
					img_labels(r, c) = 0;
					if (c + 1 < w) {
						img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							img_labels(r + 1, c) = 0;
							img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						img_labels(r + 1, c) = 0;
					}
				}
			}
		}

		// Store total accesses in the output vector 'accesses'
		accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

		accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
		accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
		accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

		img_labels_ = img_labels.GetImage();

		LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
	}